

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx::CurveNvIntersector1<4>::
     intersect_t<embree::avx::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  undefined4 uVar1;
  undefined8 uVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  uint uVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  bool bVar66;
  bool bVar67;
  bool bVar68;
  bool bVar69;
  bool bVar70;
  bool bVar71;
  bool bVar72;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  long lVar80;
  ulong uVar81;
  uint uVar82;
  ulong uVar83;
  uint uVar84;
  ulong uVar85;
  bool bVar86;
  float fVar87;
  float fVar112;
  float fVar114;
  vint4 bi_2;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar113;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar121;
  float fVar153;
  float fVar154;
  vint4 bi_1;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar155;
  undefined1 auVar124 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar156;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  vint4 ai;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar176;
  float fVar188;
  float fVar189;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [28];
  float fVar190;
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar191;
  float fVar208;
  float fVar209;
  vint4 bi;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar210;
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar207 [32];
  float fVar214;
  float fVar231;
  float fVar232;
  vint4 ai_2;
  undefined1 auVar215 [16];
  float fVar233;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar234;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  float fVar238;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar230 [64];
  float fVar239;
  float fVar240;
  float fVar251;
  float fVar255;
  undefined1 auVar241 [16];
  float fVar260;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar266;
  float fVar267;
  float fVar270;
  float fVar271;
  float fVar274;
  float fVar275;
  float fVar277;
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  float fVar259;
  float fVar264;
  float fVar268;
  float fVar272;
  float fVar276;
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  float fVar265;
  float fVar269;
  float fVar273;
  undefined1 auVar250 [64];
  float fVar278;
  float fVar285;
  float fVar286;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  float fVar287;
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  float fVar288;
  float fVar289;
  float fVar290;
  undefined1 auVar284 [64];
  float fVar291;
  float fVar301;
  float fVar303;
  vint4 ai_1;
  undefined1 auVar293 [16];
  float fVar292;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  float fVar302;
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  float fVar321;
  float fVar322;
  undefined1 auVar318 [32];
  float fVar320;
  undefined1 auVar319 [64];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  float fVar327;
  undefined1 auVar325 [32];
  undefined1 auVar326 [64];
  float fVar328;
  undefined1 auVar329 [16];
  float fVar334;
  float fVar338;
  undefined1 auVar330 [32];
  float fVar332;
  float fVar333;
  float fVar335;
  float fVar336;
  float fVar337;
  undefined1 auVar331 [64];
  float fVar339;
  float fVar347;
  float fVar349;
  undefined1 auVar341 [16];
  float fVar340;
  undefined1 auVar342 [16];
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  undefined1 auVar343 [32];
  float fVar348;
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  float fVar355;
  float fVar360;
  float fVar362;
  undefined1 auVar357 [16];
  float fVar356;
  float fVar361;
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar370;
  float fVar371;
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_acc;
  ulong local_ac8;
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  RTCFilterFunctionNArguments local_a30;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  undefined1 local_990 [8];
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined1 local_970 [8];
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [32];
  undefined1 local_930 [16];
  undefined8 local_920;
  float local_918;
  float local_914;
  undefined4 local_910;
  uint local_90c;
  uint local_908;
  uint local_904;
  uint local_900;
  Primitive *local_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  undefined1 auStack_8b0 [16];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [16];
  Primitive *local_7f0;
  ulong local_7e8;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined4 uStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [32];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0 [4];
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float local_4c0 [4];
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_490 [16];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined4 uStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar346 [64];
  
  PVar6 = prim[1];
  uVar83 = (ulong)(byte)PVar6;
  lVar80 = uVar83 * 0x19;
  fVar214 = *(float *)(prim + lVar80 + 0x12);
  auVar129 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar80 + 6));
  auVar279._0_4_ = fVar214 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar279._4_4_ = fVar214 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar279._8_4_ = fVar214 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar279._12_4_ = fVar214 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar157._0_4_ = fVar214 * auVar129._0_4_;
  auVar157._4_4_ = fVar214 * auVar129._4_4_;
  auVar157._8_4_ = fVar214 * auVar129._8_4_;
  auVar157._12_4_ = fVar214 * auVar129._12_4_;
  auVar129 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 4 + 6)));
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 5 + 6)));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar161 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 6 + 6)));
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar125 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xb + 6)));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar128 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar6 * 0xc + uVar83 + 6)));
  auVar128 = vcvtdq2ps_avx(auVar128);
  uVar81 = (ulong)(uint)((int)(uVar83 * 9) * 2);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 + uVar83 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  uVar81 = (ulong)(uint)((int)(uVar83 * 5) << 2);
  auVar123 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 + 6)));
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar326 = ZEXT1664(auVar123);
  auVar88 = vshufps_avx(auVar279,auVar279,0);
  auVar122 = vshufps_avx(auVar279,auVar279,0x55);
  auVar158 = vshufps_avx(auVar279,auVar279,0xaa);
  fVar214 = auVar158._0_4_;
  fVar176 = auVar158._4_4_;
  fVar231 = auVar158._8_4_;
  fVar188 = auVar158._12_4_;
  fVar239 = auVar122._0_4_;
  fVar251 = auVar122._4_4_;
  fVar255 = auVar122._8_4_;
  fVar260 = auVar122._12_4_;
  fVar232 = auVar88._0_4_;
  fVar189 = auVar88._4_4_;
  fVar233 = auVar88._8_4_;
  fVar190 = auVar88._12_4_;
  auVar341._0_4_ = fVar232 * auVar129._0_4_ + fVar239 * auVar94._0_4_ + fVar214 * auVar161._0_4_;
  auVar341._4_4_ = fVar189 * auVar129._4_4_ + fVar251 * auVar94._4_4_ + fVar176 * auVar161._4_4_;
  auVar341._8_4_ = fVar233 * auVar129._8_4_ + fVar255 * auVar94._8_4_ + fVar231 * auVar161._8_4_;
  auVar341._12_4_ = fVar190 * auVar129._12_4_ + fVar260 * auVar94._12_4_ + fVar188 * auVar161._12_4_
  ;
  auVar346 = ZEXT1664(auVar341);
  auVar357._0_4_ = fVar232 * auVar125._0_4_ + fVar239 * auVar93._0_4_ + auVar128._0_4_ * fVar214;
  auVar357._4_4_ = fVar189 * auVar125._4_4_ + fVar251 * auVar93._4_4_ + auVar128._4_4_ * fVar176;
  auVar357._8_4_ = fVar233 * auVar125._8_4_ + fVar255 * auVar93._8_4_ + auVar128._8_4_ * fVar231;
  auVar357._12_4_ = fVar190 * auVar125._12_4_ + fVar260 * auVar93._12_4_ + auVar128._12_4_ * fVar188
  ;
  auVar280._0_4_ = fVar232 * auVar89._0_4_ + fVar239 * auVar90._0_4_ + auVar123._0_4_ * fVar214;
  auVar280._4_4_ = fVar189 * auVar89._4_4_ + fVar251 * auVar90._4_4_ + auVar123._4_4_ * fVar176;
  auVar280._8_4_ = fVar233 * auVar89._8_4_ + fVar255 * auVar90._8_4_ + auVar123._8_4_ * fVar231;
  auVar280._12_4_ = fVar190 * auVar89._12_4_ + fVar260 * auVar90._12_4_ + auVar123._12_4_ * fVar188;
  auVar88 = vshufps_avx(auVar157,auVar157,0);
  auVar331 = ZEXT1664(auVar88);
  auVar122 = vshufps_avx(auVar157,auVar157,0x55);
  auVar158 = vshufps_avx(auVar157,auVar157,0xaa);
  fVar214 = auVar158._0_4_;
  fVar176 = auVar158._4_4_;
  fVar231 = auVar158._8_4_;
  fVar188 = auVar158._12_4_;
  fVar239 = auVar122._0_4_;
  fVar251 = auVar122._4_4_;
  fVar255 = auVar122._8_4_;
  fVar260 = auVar122._12_4_;
  fVar232 = auVar88._0_4_;
  fVar189 = auVar88._4_4_;
  fVar233 = auVar88._8_4_;
  fVar190 = auVar88._12_4_;
  auVar192._0_4_ = fVar232 * auVar129._0_4_ + fVar239 * auVar94._0_4_ + fVar214 * auVar161._0_4_;
  auVar192._4_4_ = fVar189 * auVar129._4_4_ + fVar251 * auVar94._4_4_ + fVar176 * auVar161._4_4_;
  auVar192._8_4_ = fVar233 * auVar129._8_4_ + fVar255 * auVar94._8_4_ + fVar231 * auVar161._8_4_;
  auVar192._12_4_ = fVar190 * auVar129._12_4_ + fVar260 * auVar94._12_4_ + fVar188 * auVar161._12_4_
  ;
  auVar122._0_4_ = fVar232 * auVar125._0_4_ + auVar128._0_4_ * fVar214 + fVar239 * auVar93._0_4_;
  auVar122._4_4_ = fVar189 * auVar125._4_4_ + auVar128._4_4_ * fVar176 + fVar251 * auVar93._4_4_;
  auVar122._8_4_ = fVar233 * auVar125._8_4_ + auVar128._8_4_ * fVar231 + fVar255 * auVar93._8_4_;
  auVar122._12_4_ = fVar190 * auVar125._12_4_ + auVar128._12_4_ * fVar188 + fVar260 * auVar93._12_4_
  ;
  auVar88._0_4_ = fVar232 * auVar89._0_4_ + fVar239 * auVar90._0_4_ + auVar123._0_4_ * fVar214;
  auVar88._4_4_ = fVar189 * auVar89._4_4_ + fVar251 * auVar90._4_4_ + auVar123._4_4_ * fVar176;
  auVar88._8_4_ = fVar233 * auVar89._8_4_ + fVar255 * auVar90._8_4_ + auVar123._8_4_ * fVar231;
  auVar88._12_4_ = fVar190 * auVar89._12_4_ + fVar260 * auVar90._12_4_ + auVar123._12_4_ * fVar188;
  auVar241._8_4_ = 0x7fffffff;
  auVar241._0_8_ = 0x7fffffff7fffffff;
  auVar241._12_4_ = 0x7fffffff;
  auVar129 = vandps_avx(auVar341,auVar241);
  auVar177._8_4_ = 0x219392ef;
  auVar177._0_8_ = 0x219392ef219392ef;
  auVar177._12_4_ = 0x219392ef;
  auVar129 = vcmpps_avx(auVar129,auVar177,1);
  auVar94 = vblendvps_avx(auVar341,auVar177,auVar129);
  auVar129 = vandps_avx(auVar357,auVar241);
  auVar129 = vcmpps_avx(auVar129,auVar177,1);
  auVar161 = vblendvps_avx(auVar357,auVar177,auVar129);
  auVar129 = vandps_avx(auVar280,auVar241);
  auVar129 = vcmpps_avx(auVar129,auVar177,1);
  auVar129 = vblendvps_avx(auVar280,auVar177,auVar129);
  auVar125 = vrcpps_avx(auVar94);
  fVar239 = auVar125._0_4_;
  auVar158._0_4_ = fVar239 * auVar94._0_4_;
  fVar251 = auVar125._4_4_;
  auVar158._4_4_ = fVar251 * auVar94._4_4_;
  fVar255 = auVar125._8_4_;
  auVar158._8_4_ = fVar255 * auVar94._8_4_;
  fVar260 = auVar125._12_4_;
  auVar158._12_4_ = fVar260 * auVar94._12_4_;
  auVar281._8_4_ = 0x3f800000;
  auVar281._0_8_ = &DAT_3f8000003f800000;
  auVar281._12_4_ = 0x3f800000;
  auVar94 = vsubps_avx(auVar281,auVar158);
  fVar239 = fVar239 + fVar239 * auVar94._0_4_;
  fVar251 = fVar251 + fVar251 * auVar94._4_4_;
  fVar255 = fVar255 + fVar255 * auVar94._8_4_;
  fVar260 = fVar260 + fVar260 * auVar94._12_4_;
  auVar94 = vrcpps_avx(auVar161);
  fVar214 = auVar94._0_4_;
  auVar215._0_4_ = fVar214 * auVar161._0_4_;
  fVar231 = auVar94._4_4_;
  auVar215._4_4_ = fVar231 * auVar161._4_4_;
  fVar232 = auVar94._8_4_;
  auVar215._8_4_ = fVar232 * auVar161._8_4_;
  fVar233 = auVar94._12_4_;
  auVar215._12_4_ = fVar233 * auVar161._12_4_;
  auVar94 = vsubps_avx(auVar281,auVar215);
  fVar214 = fVar214 + fVar214 * auVar94._0_4_;
  fVar231 = fVar231 + fVar231 * auVar94._4_4_;
  fVar232 = fVar232 + fVar232 * auVar94._8_4_;
  fVar233 = fVar233 + fVar233 * auVar94._12_4_;
  auVar94 = vrcpps_avx(auVar129);
  fVar176 = auVar94._0_4_;
  auVar178._0_4_ = fVar176 * auVar129._0_4_;
  fVar188 = auVar94._4_4_;
  auVar178._4_4_ = fVar188 * auVar129._4_4_;
  fVar189 = auVar94._8_4_;
  auVar178._8_4_ = fVar189 * auVar129._8_4_;
  fVar190 = auVar94._12_4_;
  auVar178._12_4_ = fVar190 * auVar129._12_4_;
  auVar129 = vsubps_avx(auVar281,auVar178);
  fVar176 = fVar176 + fVar176 * auVar129._0_4_;
  fVar188 = fVar188 + fVar188 * auVar129._4_4_;
  fVar189 = fVar189 + fVar189 * auVar129._8_4_;
  fVar190 = fVar190 + fVar190 * auVar129._12_4_;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = *(ulong *)(prim + uVar83 * 7 + 6);
  auVar129 = vpmovsxwd_avx(auVar129);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar129 = vsubps_avx(auVar129,auVar192);
  auVar159._0_4_ = fVar239 * auVar129._0_4_;
  auVar159._4_4_ = fVar251 * auVar129._4_4_;
  auVar159._8_4_ = fVar255 * auVar129._8_4_;
  auVar159._12_4_ = fVar260 * auVar129._12_4_;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar83 * 9 + 6);
  auVar129 = vpmovsxwd_avx(auVar94);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar129 = vsubps_avx(auVar129,auVar192);
  auVar193._0_4_ = fVar239 * auVar129._0_4_;
  auVar193._4_4_ = fVar251 * auVar129._4_4_;
  auVar193._8_4_ = fVar255 * auVar129._8_4_;
  auVar193._12_4_ = fVar260 * auVar129._12_4_;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar94 = vpmovsxwd_avx(auVar161);
  auVar125._8_8_ = 0;
  auVar125._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar83 * -2 + 6);
  auVar129 = vpmovsxwd_avx(auVar125);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar129 = vsubps_avx(auVar129,auVar122);
  auVar293._0_4_ = auVar129._0_4_ * fVar214;
  auVar293._4_4_ = auVar129._4_4_ * fVar231;
  auVar293._8_4_ = auVar129._8_4_ * fVar232;
  auVar293._12_4_ = auVar129._12_4_ * fVar233;
  auVar129 = vcvtdq2ps_avx(auVar94);
  auVar129 = vsubps_avx(auVar129,auVar122);
  auVar123._0_4_ = fVar214 * auVar129._0_4_;
  auVar123._4_4_ = fVar231 * auVar129._4_4_;
  auVar123._8_4_ = fVar232 * auVar129._8_4_;
  auVar123._12_4_ = fVar233 * auVar129._12_4_;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar81 + uVar83 + 6);
  auVar129 = vpmovsxwd_avx(auVar93);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar129 = vsubps_avx(auVar129,auVar88);
  auVar216._0_4_ = auVar129._0_4_ * fVar176;
  auVar216._4_4_ = auVar129._4_4_ * fVar188;
  auVar216._8_4_ = auVar129._8_4_ * fVar189;
  auVar216._12_4_ = auVar129._12_4_ * fVar190;
  local_8e8 = prim;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = *(ulong *)(prim + uVar83 * 0x17 + 6);
  auVar129 = vpmovsxwd_avx(auVar128);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar129 = vsubps_avx(auVar129,auVar88);
  auVar89._0_4_ = auVar129._0_4_ * fVar176;
  auVar89._4_4_ = auVar129._4_4_ * fVar188;
  auVar89._8_4_ = auVar129._8_4_ * fVar189;
  auVar89._12_4_ = auVar129._12_4_ * fVar190;
  auVar129 = vpminsd_avx(auVar159,auVar193);
  auVar94 = vpminsd_avx(auVar293,auVar123);
  auVar129 = vmaxps_avx(auVar129,auVar94);
  auVar94 = vpminsd_avx(auVar216,auVar89);
  uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar315._4_4_ = uVar1;
  auVar315._0_4_ = uVar1;
  auVar315._8_4_ = uVar1;
  auVar315._12_4_ = uVar1;
  auVar94 = vmaxps_avx(auVar94,auVar315);
  auVar129 = vmaxps_avx(auVar129,auVar94);
  local_490._0_4_ = auVar129._0_4_ * 0.99999964;
  local_490._4_4_ = auVar129._4_4_ * 0.99999964;
  local_490._8_4_ = auVar129._8_4_ * 0.99999964;
  local_490._12_4_ = auVar129._12_4_ * 0.99999964;
  auVar129 = vpmaxsd_avx(auVar159,auVar193);
  auVar94 = vpmaxsd_avx(auVar293,auVar123);
  auVar129 = vminps_avx(auVar129,auVar94);
  auVar94 = vpmaxsd_avx(auVar216,auVar89);
  fVar214 = (ray->super_RayK<1>).tfar;
  auVar160._4_4_ = fVar214;
  auVar160._0_4_ = fVar214;
  auVar160._8_4_ = fVar214;
  auVar160._12_4_ = fVar214;
  auVar94 = vminps_avx(auVar94,auVar160);
  auVar129 = vminps_avx(auVar129,auVar94);
  auVar90._0_4_ = auVar129._0_4_ * 1.0000004;
  auVar90._4_4_ = auVar129._4_4_ * 1.0000004;
  auVar90._8_4_ = auVar129._8_4_ * 1.0000004;
  auVar90._12_4_ = auVar129._12_4_ * 1.0000004;
  auVar129 = vpshufd_avx(ZEXT116((byte)PVar6),0);
  auVar94 = vpcmpgtd_avx(auVar129,_DAT_01ff0cf0);
  auVar129 = vcmpps_avx(local_490,auVar90,2);
  auVar129 = vandps_avx(auVar129,auVar94);
  uVar82 = vmovmskps_avx(auVar129);
  if (uVar82 == 0) {
    return;
  }
  uVar82 = uVar82 & 0xff;
  auVar103._16_16_ = mm_lookupmask_ps._240_16_;
  auVar103._0_16_ = mm_lookupmask_ps._240_16_;
  local_3c0 = vblendps_avx(auVar103,ZEXT832(0) << 0x20,0x80);
  local_7f0 = prim + lVar80 + 0x16;
LAB_00ee93bb:
  local_7e8 = (ulong)uVar82;
  lVar80 = 0;
  if (local_7e8 != 0) {
    for (; (uVar82 >> lVar80 & 1) == 0; lVar80 = lVar80 + 1) {
    }
  }
  local_7e8 = local_7e8 - 1 & local_7e8;
  uVar82 = *(uint *)(local_8e8 + lVar80 * 4 + 6);
  lVar80 = lVar80 * 0x40;
  lVar10 = 0;
  if (local_7e8 != 0) {
    for (; (local_7e8 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
    }
  }
  local_ac8 = (ulong)*(uint *)(local_8e8 + 2);
  auVar129 = *(undefined1 (*) [16])(local_7f0 + lVar80);
  if (((local_7e8 != 0) && (uVar83 = local_7e8 - 1 & local_7e8, uVar83 != 0)) &&
     (lVar10 = 0, uVar83 != 0)) {
    for (; (uVar83 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
    }
  }
  auVar94 = *(undefined1 (*) [16])(local_7f0 + lVar80 + 0x10);
  auVar161 = *(undefined1 (*) [16])(local_7f0 + lVar80 + 0x20);
  auVar125 = *(undefined1 (*) [16])(local_7f0 + lVar80 + 0x30);
  auVar91._0_4_ = (auVar129._0_4_ + auVar94._0_4_ + auVar161._0_4_ + auVar125._0_4_) * 0.25;
  auVar91._4_4_ = (auVar129._4_4_ + auVar94._4_4_ + auVar161._4_4_ + auVar125._4_4_) * 0.25;
  auVar91._8_4_ = (auVar129._8_4_ + auVar94._8_4_ + auVar161._8_4_ + auVar125._8_4_) * 0.25;
  auVar91._12_4_ = (auVar129._12_4_ + auVar94._12_4_ + auVar161._12_4_ + auVar125._12_4_) * 0.25;
  aVar3 = (ray->super_RayK<1>).org.field_0.field_1;
  aVar4 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar93 = vsubps_avx(auVar91,(undefined1  [16])aVar3);
  auVar93 = vdpps_avx(auVar93,(undefined1  [16])aVar4,0x7f);
  auVar128 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
  auVar89 = vrcpss_avx(auVar128,auVar128);
  auVar319 = ZEXT464(0x40000000);
  fVar214 = auVar93._0_4_ * auVar89._0_4_ * (2.0 - auVar89._0_4_ * auVar128._0_4_);
  local_800 = ZEXT416((uint)fVar214);
  auVar128 = vshufps_avx(ZEXT416((uint)fVar214),ZEXT416((uint)fVar214),0);
  fVar214 = aVar4.x;
  fVar176 = aVar4.y;
  fVar231 = aVar4.z;
  aVar155 = aVar4.field_3;
  auVar242._0_4_ = aVar3.x + fVar214 * auVar128._0_4_;
  auVar242._4_4_ = aVar3.y + fVar176 * auVar128._4_4_;
  auVar242._8_4_ = aVar3.z + fVar231 * auVar128._8_4_;
  auVar242._12_4_ = aVar3.field_3.w + aVar155.w * auVar128._12_4_;
  auVar93 = vblendps_avx(auVar242,_DAT_01feba10,8);
  _local_970 = vsubps_avx(auVar129,auVar93);
  _local_980 = vsubps_avx(auVar161,auVar93);
  _local_990 = vsubps_avx(auVar94,auVar93);
  _local_9a0 = vsubps_avx(auVar125,auVar93);
  auVar230 = ZEXT1664(_local_9a0);
  auVar129 = vshufps_avx(_local_970,_local_970,0);
  register0x00001290 = auVar129;
  _local_1a0 = auVar129;
  auVar129 = vshufps_avx(_local_970,_local_970,0x55);
  register0x00001290 = auVar129;
  _local_1c0 = auVar129;
  auVar129 = vshufps_avx(_local_970,_local_970,0xaa);
  register0x00001290 = auVar129;
  _local_1e0 = auVar129;
  auVar129 = vshufps_avx(_local_970,_local_970,0xff);
  register0x00001290 = auVar129;
  _local_280 = auVar129;
  auVar129 = vshufps_avx(_local_990,_local_990,0);
  register0x00001290 = auVar129;
  _local_200 = auVar129;
  auVar129 = vshufps_avx(_local_990,_local_990,0x55);
  register0x00001290 = auVar129;
  _local_220 = auVar129;
  auVar129 = vshufps_avx(_local_990,_local_990,0xaa);
  register0x00001290 = auVar129;
  _local_240 = auVar129;
  auVar124._0_4_ = fVar214 * fVar214;
  auVar124._4_4_ = fVar176 * fVar176;
  auVar124._8_4_ = fVar231 * fVar231;
  auVar124._12_4_ = aVar155.w * aVar155.w;
  auVar129 = vshufps_avx(auVar124,auVar124,0xaa);
  auVar94 = vshufps_avx(auVar124,auVar124,0x55);
  auVar161 = vshufps_avx(_local_990,_local_990,0xff);
  register0x000012d0 = auVar161;
  _local_2a0 = auVar161;
  auVar161 = vshufps_avx(auVar124,auVar124,0);
  local_260._0_4_ = auVar161._0_4_ + auVar94._0_4_ + auVar129._0_4_;
  local_260._4_4_ = auVar161._4_4_ + auVar94._4_4_ + auVar129._4_4_;
  local_260._8_4_ = auVar161._8_4_ + auVar94._8_4_ + auVar129._8_4_;
  local_260._12_4_ = auVar161._12_4_ + auVar94._12_4_ + auVar129._12_4_;
  local_260._16_4_ = auVar161._0_4_ + auVar94._0_4_ + auVar129._0_4_;
  local_260._20_4_ = auVar161._4_4_ + auVar94._4_4_ + auVar129._4_4_;
  local_260._24_4_ = auVar161._8_4_ + auVar94._8_4_ + auVar129._8_4_;
  local_260._28_4_ = auVar161._12_4_ + auVar94._12_4_ + auVar129._12_4_;
  auVar129 = vshufps_avx(_local_980,_local_980,0);
  register0x00001250 = auVar129;
  _local_2c0 = auVar129;
  auVar129 = vshufps_avx(_local_980,_local_980,0x55);
  register0x00001250 = auVar129;
  _local_2e0 = auVar129;
  auVar129 = vshufps_avx(_local_980,_local_980,0xaa);
  register0x00001250 = auVar129;
  _local_300 = auVar129;
  auVar129 = vshufps_avx(_local_980,_local_980,0xff);
  register0x00001250 = auVar129;
  _local_320 = auVar129;
  auVar129 = vshufps_avx(_local_9a0,_local_9a0,0);
  register0x00001250 = auVar129;
  _local_340 = auVar129;
  auVar129 = vshufps_avx(_local_9a0,_local_9a0,0x55);
  register0x00001250 = auVar129;
  _local_360 = auVar129;
  auVar129 = vshufps_avx(_local_9a0,_local_9a0,0xaa);
  register0x00001250 = auVar129;
  _local_380 = auVar129;
  auVar129 = vshufps_avx(_local_9a0,_local_9a0,0xff);
  register0x00001250 = auVar129;
  _local_3a0 = auVar129;
  register0x00001390 = auVar128;
  _local_820 = auVar128;
  auVar250 = ZEXT3264(_local_820);
  uVar83 = 1;
  uVar81 = 0;
  local_500 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fStack_4fc = local_500;
  fStack_4f8 = local_500;
  fStack_4f4 = local_500;
  fStack_4f0 = local_500;
  fStack_4ec = local_500;
  fStack_4e8 = local_500;
  fStack_4e4 = local_500;
  local_520 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fStack_51c = local_520;
  fStack_518 = local_520;
  fStack_514 = local_520;
  fStack_510 = local_520;
  fStack_50c = local_520;
  fStack_508 = local_520;
  fStack_504 = local_520;
  local_640 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_63c = local_640;
  fStack_638 = local_640;
  fStack_634 = local_640;
  fStack_630 = local_640;
  fStack_62c = local_640;
  fStack_628 = local_640;
  fStack_624 = local_640;
  auVar104._8_4_ = 0x7fffffff;
  auVar104._0_8_ = 0x7fffffff7fffffff;
  auVar104._12_4_ = 0x7fffffff;
  auVar104._16_4_ = 0x7fffffff;
  auVar104._20_4_ = 0x7fffffff;
  auVar104._24_4_ = 0x7fffffff;
  auVar104._28_4_ = 0x7fffffff;
  local_3e0 = vandps_avx(local_260,auVar104);
  auVar284 = ZEXT1664(ZEXT816(0x3f80000000000000));
  do {
    auVar202._8_4_ = 0x3f800000;
    auVar202._0_8_ = &DAT_3f8000003f800000;
    auVar202._12_4_ = 0x3f800000;
    auVar202._16_4_ = 0x3f800000;
    auVar202._20_4_ = 0x3f800000;
    auVar202._24_4_ = 0x3f800000;
    auVar202._28_4_ = 0x3f800000;
    local_930 = auVar284._0_16_;
    auVar129 = vmovshdup_avx(local_930);
    fVar190 = auVar129._0_4_ - auVar284._0_4_;
    auVar129 = vshufps_avx(local_930,local_930,0);
    local_700._16_16_ = auVar129;
    local_700._0_16_ = auVar129;
    auVar94 = vshufps_avx(ZEXT416((uint)fVar190),ZEXT416((uint)fVar190),0);
    local_720._16_16_ = auVar94;
    local_720._0_16_ = auVar94;
    fVar121 = auVar94._0_4_;
    fVar153 = auVar94._4_4_;
    fVar154 = auVar94._8_4_;
    fVar156 = auVar94._12_4_;
    fVar87 = auVar129._0_4_;
    auVar184._0_4_ = fVar87 + fVar121 * 0.0;
    fVar112 = auVar129._4_4_;
    auVar184._4_4_ = fVar112 + fVar153 * 0.14285715;
    fVar114 = auVar129._8_4_;
    auVar184._8_4_ = fVar114 + fVar154 * 0.2857143;
    fVar116 = auVar129._12_4_;
    auVar184._12_4_ = fVar116 + fVar156 * 0.42857146;
    auVar184._16_4_ = fVar87 + fVar121 * 0.5714286;
    auVar184._20_4_ = fVar112 + fVar153 * 0.71428573;
    auVar184._24_4_ = fVar114 + fVar154 * 0.8571429;
    auVar184._28_4_ = fVar116 + fVar156;
    auVar103 = vsubps_avx(auVar202,auVar184);
    fVar214 = auVar103._0_4_;
    fVar176 = auVar103._4_4_;
    fVar231 = auVar103._8_4_;
    fVar188 = auVar103._12_4_;
    fVar232 = auVar103._16_4_;
    fVar189 = auVar103._20_4_;
    fVar233 = auVar103._24_4_;
    fVar251 = fVar214 * fVar214 * fVar214;
    fVar252 = fVar176 * fVar176 * fVar176;
    fVar256 = fVar231 * fVar231 * fVar231;
    fVar261 = fVar188 * fVar188 * fVar188;
    fVar265 = fVar232 * fVar232 * fVar232;
    fVar269 = fVar189 * fVar189 * fVar189;
    fVar273 = fVar233 * fVar233 * fVar233;
    fVar278 = auVar184._0_4_ * auVar184._0_4_ * auVar184._0_4_;
    fVar285 = auVar184._4_4_ * auVar184._4_4_ * auVar184._4_4_;
    fVar286 = auVar184._8_4_ * auVar184._8_4_ * auVar184._8_4_;
    fVar287 = auVar184._12_4_ * auVar184._12_4_ * auVar184._12_4_;
    fVar288 = auVar184._16_4_ * auVar184._16_4_ * auVar184._16_4_;
    fVar289 = auVar184._20_4_ * auVar184._20_4_ * auVar184._20_4_;
    fVar290 = auVar184._24_4_ * auVar184._24_4_ * auVar184._24_4_;
    fVar239 = auVar184._0_4_ * fVar214;
    fVar255 = auVar184._4_4_ * fVar176;
    fVar260 = auVar184._8_4_ * fVar231;
    fVar234 = auVar184._12_4_ * fVar188;
    fVar235 = auVar184._16_4_ * fVar232;
    fVar236 = auVar184._20_4_ * fVar189;
    fVar237 = auVar184._24_4_ * fVar233;
    fVar327 = auVar326._28_4_ + auVar346._28_4_;
    fVar313 = auVar284._28_4_ + auVar230._28_4_ + fVar327;
    fVar321 = fVar327 + auVar250._28_4_ + auVar331._28_4_ + auVar319._28_4_;
    fVar327 = fVar251 * 0.16666667;
    fVar253 = fVar252 * 0.16666667;
    fVar257 = fVar256 * 0.16666667;
    fVar262 = fVar261 * 0.16666667;
    fVar266 = fVar265 * 0.16666667;
    fVar270 = fVar269 * 0.16666667;
    fVar274 = fVar273 * 0.16666667;
    fVar291 = (fVar278 + fVar251 * 4.0 + fVar214 * fVar239 * 12.0 + auVar184._0_4_ * fVar239 * 6.0)
              * 0.16666667;
    fVar301 = (fVar285 + fVar252 * 4.0 + fVar176 * fVar255 * 12.0 + auVar184._4_4_ * fVar255 * 6.0)
              * 0.16666667;
    fVar303 = (fVar286 + fVar256 * 4.0 + fVar231 * fVar260 * 12.0 + auVar184._8_4_ * fVar260 * 6.0)
              * 0.16666667;
    fVar305 = (fVar287 + fVar261 * 4.0 + fVar188 * fVar234 * 12.0 + auVar184._12_4_ * fVar234 * 6.0)
              * 0.16666667;
    fVar307 = (fVar288 + fVar265 * 4.0 + fVar232 * fVar235 * 12.0 + auVar184._16_4_ * fVar235 * 6.0)
              * 0.16666667;
    fVar309 = (fVar289 + fVar269 * 4.0 + fVar189 * fVar236 * 12.0 + auVar184._20_4_ * fVar236 * 6.0)
              * 0.16666667;
    fVar311 = (fVar290 + fVar273 * 4.0 + fVar233 * fVar237 * 12.0 + auVar184._24_4_ * fVar237 * 6.0)
              * 0.16666667;
    fVar251 = (fVar278 * 4.0 + fVar251 + auVar184._0_4_ * fVar239 * 12.0 + fVar214 * fVar239 * 6.0)
              * 0.16666667;
    fVar252 = (fVar285 * 4.0 + fVar252 + auVar184._4_4_ * fVar255 * 12.0 + fVar176 * fVar255 * 6.0)
              * 0.16666667;
    fVar256 = (fVar286 * 4.0 + fVar256 + auVar184._8_4_ * fVar260 * 12.0 + fVar231 * fVar260 * 6.0)
              * 0.16666667;
    fVar261 = (fVar287 * 4.0 + fVar261 + auVar184._12_4_ * fVar234 * 12.0 + fVar188 * fVar234 * 6.0)
              * 0.16666667;
    fVar265 = (fVar288 * 4.0 + fVar265 + auVar184._16_4_ * fVar235 * 12.0 + fVar232 * fVar235 * 6.0)
              * 0.16666667;
    fVar269 = (fVar289 * 4.0 + fVar269 + auVar184._20_4_ * fVar236 * 12.0 + fVar189 * fVar236 * 6.0)
              * 0.16666667;
    fVar273 = (fVar290 * 4.0 + fVar273 + auVar184._24_4_ * fVar237 * 12.0 + fVar233 * fVar237 * 6.0)
              * 0.16666667;
    fVar278 = fVar278 * 0.16666667;
    fVar285 = fVar285 * 0.16666667;
    fVar286 = fVar286 * 0.16666667;
    fVar287 = fVar287 * 0.16666667;
    fVar288 = fVar288 * 0.16666667;
    fVar289 = fVar289 * 0.16666667;
    fVar290 = fVar290 * 0.16666667;
    fVar338 = auVar331._28_4_ + 12.0;
    fVar322 = fVar321 + 12.166667;
    local_a80 = (float)local_1a0._0_4_ * fVar327 +
                (float)local_200._0_4_ * fVar291 +
                fVar278 * (float)local_340._0_4_ + fVar251 * (float)local_2c0._0_4_;
    fStack_a7c = (float)local_1a0._4_4_ * fVar253 +
                 (float)local_200._4_4_ * fVar301 +
                 fVar285 * (float)local_340._4_4_ + fVar252 * (float)local_2c0._4_4_;
    fStack_a78 = fStack_198 * fVar257 +
                 fStack_1f8 * fVar303 + fVar286 * fStack_338 + fVar256 * fStack_2b8;
    fStack_a74 = fStack_194 * fVar262 +
                 fStack_1f4 * fVar305 + fVar287 * fStack_334 + fVar261 * fStack_2b4;
    fStack_a70 = fStack_190 * fVar266 +
                 fStack_1f0 * fVar307 + fVar288 * fStack_330 + fVar265 * fStack_2b0;
    fStack_a6c = fStack_18c * fVar270 +
                 fStack_1ec * fVar309 + fVar289 * fStack_32c + fVar269 * fStack_2ac;
    fStack_a68 = fStack_188 * fVar274 +
                 fStack_1e8 * fVar311 + fVar290 * fStack_328 + fVar273 * fStack_2a8;
    fStack_a64 = fVar313 + fVar322;
    local_ac0 = (float)local_1c0._0_4_ * fVar327 +
                (float)local_220._0_4_ * fVar291 +
                fVar278 * (float)local_360._0_4_ + fVar251 * (float)local_2e0._0_4_;
    fStack_abc = (float)local_1c0._4_4_ * fVar253 +
                 (float)local_220._4_4_ * fVar301 +
                 fVar285 * (float)local_360._4_4_ + fVar252 * (float)local_2e0._4_4_;
    fStack_ab8 = fStack_1b8 * fVar257 +
                 fStack_218 * fVar303 + fVar286 * fStack_358 + fVar256 * fStack_2d8;
    fStack_ab4 = fStack_1b4 * fVar262 +
                 fStack_214 * fVar305 + fVar287 * fStack_354 + fVar261 * fStack_2d4;
    fStack_ab0 = fStack_1b0 * fVar266 +
                 fStack_210 * fVar307 + fVar288 * fStack_350 + fVar265 * fStack_2d0;
    fStack_aac = fStack_1ac * fVar270 +
                 fStack_20c * fVar309 + fVar289 * fStack_34c + fVar269 * fStack_2cc;
    fStack_aa8 = fStack_1a8 * fVar274 +
                 fStack_208 * fVar311 + fVar290 * fStack_348 + fVar273 * fStack_2c8;
    fStack_aa4 = fStack_a64 + fVar338 + 12.166667;
    local_aa0 = (float)local_1e0._0_4_ * fVar327 +
                fVar291 * (float)local_240._0_4_ +
                fVar278 * (float)local_380._0_4_ + fVar251 * (float)local_300._0_4_;
    fStack_a9c = (float)local_1e0._4_4_ * fVar253 +
                 fVar301 * (float)local_240._4_4_ +
                 fVar285 * (float)local_380._4_4_ + fVar252 * (float)local_300._4_4_;
    fStack_a98 = fStack_1d8 * fVar257 +
                 fVar303 * fStack_238 + fVar286 * fStack_378 + fVar256 * fStack_2f8;
    fStack_a94 = fStack_1d4 * fVar262 +
                 fVar305 * fStack_234 + fVar287 * fStack_374 + fVar261 * fStack_2f4;
    fStack_a90 = fStack_1d0 * fVar266 +
                 fVar307 * fStack_230 + fVar288 * fStack_370 + fVar265 * fStack_2f0;
    fStack_a8c = fStack_1cc * fVar270 +
                 fVar309 * fStack_22c + fVar289 * fStack_36c + fVar269 * fStack_2ec;
    fStack_a88 = fStack_1c8 * fVar274 +
                 fVar311 * fStack_228 + fVar290 * fStack_368 + fVar273 * fStack_2e8;
    fStack_a84 = fStack_aa4 + fVar338 + auVar346._28_4_ + 12.0;
    local_740._0_4_ =
         fVar327 * (float)local_280._0_4_ +
         fVar291 * (float)local_2a0._0_4_ +
         fVar251 * (float)local_320._0_4_ + fVar278 * (float)local_3a0._0_4_;
    local_740._4_4_ =
         fVar253 * (float)local_280._4_4_ +
         fVar301 * (float)local_2a0._4_4_ +
         fVar252 * (float)local_320._4_4_ + fVar285 * (float)local_3a0._4_4_;
    local_740._8_4_ =
         fVar257 * fStack_278 + fVar303 * fStack_298 + fVar256 * fStack_318 + fVar286 * fStack_398;
    local_740._12_4_ =
         fVar262 * fStack_274 + fVar305 * fStack_294 + fVar261 * fStack_314 + fVar287 * fStack_394;
    local_740._16_4_ =
         fVar266 * fStack_270 + fVar307 * fStack_290 + fVar265 * fStack_310 + fVar288 * fStack_390;
    local_740._20_4_ =
         fVar270 * fStack_26c + fVar309 * fStack_28c + fVar269 * fStack_30c + fVar289 * fStack_38c;
    local_740._24_4_ =
         fVar274 * fStack_268 + fVar311 * fStack_288 + fVar273 * fStack_308 + fVar290 * fStack_388;
    local_740._28_4_ = auVar250._28_4_ + fVar313 + fVar321 + auVar284._28_4_;
    auVar19._4_4_ = auVar184._4_4_ * -auVar184._4_4_;
    auVar19._0_4_ = auVar184._0_4_ * -auVar184._0_4_;
    auVar19._8_4_ = auVar184._8_4_ * -auVar184._8_4_;
    auVar19._12_4_ = auVar184._12_4_ * -auVar184._12_4_;
    auVar19._16_4_ = auVar184._16_4_ * -auVar184._16_4_;
    auVar19._20_4_ = auVar184._20_4_ * -auVar184._20_4_;
    auVar19._24_4_ = auVar184._24_4_ * -auVar184._24_4_;
    auVar19._28_4_ = auVar184._28_4_;
    auVar20._4_4_ = fVar255 * 4.0;
    auVar20._0_4_ = fVar239 * 4.0;
    auVar20._8_4_ = fVar260 * 4.0;
    auVar20._12_4_ = fVar234 * 4.0;
    auVar20._16_4_ = fVar235 * 4.0;
    auVar20._20_4_ = fVar236 * 4.0;
    auVar20._24_4_ = fVar237 * 4.0;
    auVar20._28_4_ = auVar230._28_4_;
    auVar103 = vsubps_avx(auVar19,auVar20);
    fVar262 = fVar214 * -fVar214 * 0.5;
    fVar266 = fVar176 * -fVar176 * 0.5;
    fVar274 = fVar231 * -fVar231 * 0.5;
    fVar278 = fVar188 * -fVar188 * 0.5;
    fVar285 = fVar232 * -fVar232 * 0.5;
    fVar286 = fVar189 * -fVar189 * 0.5;
    fVar287 = fVar233 * -fVar233 * 0.5;
    fVar327 = auVar103._0_4_ * 0.5;
    fVar256 = auVar103._4_4_ * 0.5;
    fVar257 = auVar103._8_4_ * 0.5;
    fVar261 = auVar103._12_4_ * 0.5;
    fVar269 = auVar103._16_4_ * 0.5;
    fVar270 = auVar103._20_4_ * 0.5;
    fVar273 = auVar103._24_4_ * 0.5;
    fVar251 = (fVar214 * fVar214 + fVar239 * 4.0) * 0.5;
    fVar255 = (fVar176 * fVar176 + fVar255 * 4.0) * 0.5;
    fVar260 = (fVar231 * fVar231 + fVar260 * 4.0) * 0.5;
    fVar234 = (fVar188 * fVar188 + fVar234 * 4.0) * 0.5;
    fVar235 = (fVar232 * fVar232 + fVar235 * 4.0) * 0.5;
    fVar252 = (fVar189 * fVar189 + fVar236 * 4.0) * 0.5;
    fVar253 = (fVar233 * fVar233 + fVar237 * 4.0) * 0.5;
    fVar214 = auVar184._0_4_ * auVar184._0_4_ * 0.5;
    fVar176 = auVar184._4_4_ * auVar184._4_4_ * 0.5;
    fVar231 = auVar184._8_4_ * auVar184._8_4_ * 0.5;
    fVar188 = auVar184._12_4_ * auVar184._12_4_ * 0.5;
    fVar232 = auVar184._16_4_ * auVar184._16_4_ * 0.5;
    fVar189 = auVar184._20_4_ * auVar184._20_4_ * 0.5;
    fVar239 = auVar184._24_4_ * auVar184._24_4_ * 0.5;
    fVar277 = fStack_a84 + fVar322 + fVar322 + 4.0;
    auVar129 = vpermilps_avx(ZEXT416((uint)(fVar190 * 0.04761905)),0);
    fVar233 = auVar129._0_4_;
    fVar240 = fVar233 * ((float)local_1a0._0_4_ * fVar262 +
                        (float)local_200._0_4_ * fVar327 +
                        fVar251 * (float)local_2c0._0_4_ + fVar214 * (float)local_340._0_4_);
    fVar236 = auVar129._4_4_;
    fVar254 = fVar236 * ((float)local_1a0._4_4_ * fVar266 +
                        (float)local_200._4_4_ * fVar256 +
                        fVar255 * (float)local_2c0._4_4_ + fVar176 * (float)local_340._4_4_);
    local_a00._4_4_ = fVar254;
    local_a00._0_4_ = fVar240;
    fVar237 = auVar129._8_4_;
    fVar258 = fVar237 * (fStack_198 * fVar274 +
                        fStack_1f8 * fVar257 + fVar260 * fStack_2b8 + fVar231 * fStack_338);
    local_a00._8_4_ = fVar258;
    fVar265 = auVar129._12_4_;
    fVar263 = fVar265 * (fStack_194 * fVar278 +
                        fStack_1f4 * fVar261 + fVar234 * fStack_2b4 + fVar188 * fStack_334);
    local_a00._12_4_ = fVar263;
    fVar267 = fVar233 * (fStack_190 * fVar285 +
                        fStack_1f0 * fVar269 + fVar235 * fStack_2b0 + fVar232 * fStack_330);
    local_a00._16_4_ = fVar267;
    fVar271 = fVar236 * (fStack_18c * fVar286 +
                        fStack_1ec * fVar270 + fVar252 * fStack_2ac + fVar189 * fStack_32c);
    local_a00._20_4_ = fVar271;
    fVar275 = fVar237 * (fStack_188 * fVar287 +
                        fStack_1e8 * fVar273 + fVar253 * fStack_2a8 + fVar239 * fStack_328);
    local_a00._24_4_ = fVar275;
    local_a00._28_4_ = fVar277;
    fVar339 = fVar233 * ((float)local_1c0._0_4_ * fVar262 +
                        (float)local_220._0_4_ * fVar327 +
                        fVar251 * (float)local_2e0._0_4_ + fVar214 * (float)local_360._0_4_);
    fVar347 = fVar236 * ((float)local_1c0._4_4_ * fVar266 +
                        (float)local_220._4_4_ * fVar256 +
                        fVar255 * (float)local_2e0._4_4_ + fVar176 * (float)local_360._4_4_);
    local_840._4_4_ = fVar347;
    local_840._0_4_ = fVar339;
    fVar349 = fVar237 * (fStack_1b8 * fVar274 +
                        fStack_218 * fVar257 + fVar260 * fStack_2d8 + fVar231 * fStack_358);
    local_840._8_4_ = fVar349;
    fVar350 = fVar265 * (fStack_1b4 * fVar278 +
                        fStack_214 * fVar261 + fVar234 * fStack_2d4 + fVar188 * fStack_354);
    local_840._12_4_ = fVar350;
    fVar351 = fVar233 * (fStack_1b0 * fVar285 +
                        fStack_210 * fVar269 + fVar235 * fStack_2d0 + fVar232 * fStack_350);
    local_840._16_4_ = fVar351;
    fVar352 = fVar236 * (fStack_1ac * fVar286 +
                        fStack_20c * fVar270 + fVar252 * fStack_2cc + fVar189 * fStack_34c);
    local_840._20_4_ = fVar352;
    fVar353 = fVar237 * (fStack_1a8 * fVar287 +
                        fStack_208 * fVar273 + fVar253 * fStack_2c8 + fVar239 * fStack_348);
    local_840._24_4_ = fVar353;
    local_840._28_4_ = fStack_184;
    fVar355 = fVar233 * ((float)local_1e0._0_4_ * fVar262 +
                        fVar214 * (float)local_380._0_4_ + fVar251 * (float)local_300._0_4_ +
                        (float)local_240._0_4_ * fVar327);
    fVar360 = fVar236 * ((float)local_1e0._4_4_ * fVar266 +
                        fVar176 * (float)local_380._4_4_ + fVar255 * (float)local_300._4_4_ +
                        (float)local_240._4_4_ * fVar256);
    local_9c0._4_4_ = fVar360;
    local_9c0._0_4_ = fVar355;
    fVar362 = fVar237 * (fStack_1d8 * fVar274 +
                        fVar231 * fStack_378 + fVar260 * fStack_2f8 + fStack_238 * fVar257);
    local_9c0._8_4_ = fVar362;
    fVar364 = fVar265 * (fStack_1d4 * fVar278 +
                        fVar188 * fStack_374 + fVar234 * fStack_2f4 + fStack_234 * fVar261);
    local_9c0._12_4_ = fVar364;
    fVar366 = fVar233 * (fStack_1d0 * fVar285 +
                        fVar232 * fStack_370 + fVar235 * fStack_2f0 + fStack_230 * fVar269);
    local_9c0._16_4_ = fVar366;
    fVar368 = fVar236 * (fStack_1cc * fVar286 +
                        fVar189 * fStack_36c + fVar252 * fStack_2ec + fStack_22c * fVar270);
    local_9c0._20_4_ = fVar368;
    fVar370 = fVar237 * (fStack_1c8 * fVar287 +
                        fVar239 * fStack_368 + fVar253 * fStack_2e8 + fStack_228 * fVar273);
    local_9c0._24_4_ = fVar370;
    local_9c0._28_4_ = uStack_1a4;
    fVar190 = fVar233 * (fVar262 * (float)local_280._0_4_ +
                        fVar327 * (float)local_2a0._0_4_ +
                        fVar214 * (float)local_3a0._0_4_ + fVar251 * (float)local_320._0_4_);
    fVar327 = fVar236 * (fVar266 * (float)local_280._4_4_ +
                        fVar256 * (float)local_2a0._4_4_ +
                        fVar176 * (float)local_3a0._4_4_ + fVar255 * (float)local_320._4_4_);
    auVar137._4_4_ = fVar327;
    auVar137._0_4_ = fVar190;
    fVar262 = fVar237 * (fVar274 * fStack_278 +
                        fVar257 * fStack_298 + fVar231 * fStack_398 + fVar260 * fStack_318);
    auVar137._8_4_ = fVar262;
    fVar266 = fVar265 * (fVar278 * fStack_274 +
                        fVar261 * fStack_294 + fVar188 * fStack_394 + fVar234 * fStack_314);
    auVar137._12_4_ = fVar266;
    fVar233 = fVar233 * (fVar285 * fStack_270 +
                        fVar269 * fStack_290 + fVar232 * fStack_390 + fVar235 * fStack_310);
    auVar137._16_4_ = fVar233;
    fVar236 = fVar236 * (fVar286 * fStack_26c +
                        fVar270 * fStack_28c + fVar189 * fStack_38c + fVar252 * fStack_30c);
    auVar137._20_4_ = fVar236;
    fVar237 = fVar237 * (fVar287 * fStack_268 +
                        fVar273 * fStack_288 + fVar239 * fStack_388 + fVar253 * fStack_308);
    auVar137._24_4_ = fVar237;
    auVar137._28_4_ = fVar265;
    auVar73._4_4_ = fStack_abc;
    auVar73._0_4_ = local_ac0;
    auVar73._8_4_ = fStack_ab8;
    auVar73._12_4_ = fStack_ab4;
    auVar73._16_4_ = fStack_ab0;
    auVar73._20_4_ = fStack_aac;
    auVar73._24_4_ = fStack_aa8;
    auVar73._28_4_ = fStack_aa4;
    auVar103 = vperm2f128_avx(auVar73,auVar73,1);
    auVar103 = vshufps_avx(auVar103,auVar73,0x30);
    _local_8c0 = vshufps_avx(auVar73,auVar103,0x29);
    auVar75._4_4_ = fStack_a9c;
    auVar75._0_4_ = local_aa0;
    auVar75._8_4_ = fStack_a98;
    auVar75._12_4_ = fStack_a94;
    auVar75._16_4_ = fStack_a90;
    auVar75._20_4_ = fStack_a8c;
    auVar75._24_4_ = fStack_a88;
    auVar75._28_4_ = fStack_a84;
    auVar103 = vperm2f128_avx(auVar75,auVar75,1);
    auVar103 = vshufps_avx(auVar103,auVar75,0x30);
    local_8e0 = vshufps_avx(auVar75,auVar103,0x29);
    auVar104 = vsubps_avx(local_740,auVar137);
    auVar103 = vperm2f128_avx(auVar104,auVar104,1);
    auVar103 = vshufps_avx(auVar103,auVar104,0x30);
    local_760 = vshufps_avx(auVar104,auVar103,0x29);
    _local_6a0 = vsubps_avx(_local_8c0,auVar73);
    _local_680 = vsubps_avx(local_8e0,auVar75);
    fVar176 = local_6a0._0_4_;
    fVar251 = local_6a0._4_4_;
    auVar21._4_4_ = fVar360 * fVar251;
    auVar21._0_4_ = fVar355 * fVar176;
    fVar252 = local_6a0._8_4_;
    auVar21._8_4_ = fVar362 * fVar252;
    fVar269 = local_6a0._12_4_;
    auVar21._12_4_ = fVar364 * fVar269;
    fVar288 = local_6a0._16_4_;
    auVar21._16_4_ = fVar366 * fVar288;
    fVar309 = local_6a0._20_4_;
    auVar21._20_4_ = fVar368 * fVar309;
    fVar12 = local_6a0._24_4_;
    auVar21._24_4_ = fVar370 * fVar12;
    auVar21._28_4_ = auVar104._28_4_;
    fVar231 = local_680._0_4_;
    fVar255 = local_680._4_4_;
    auVar139._4_4_ = fVar347 * fVar255;
    auVar139._0_4_ = fVar339 * fVar231;
    fVar253 = local_680._8_4_;
    auVar139._8_4_ = fVar349 * fVar253;
    fVar270 = local_680._12_4_;
    auVar139._12_4_ = fVar350 * fVar270;
    fVar289 = local_680._16_4_;
    auVar139._16_4_ = fVar351 * fVar289;
    fVar311 = local_680._20_4_;
    auVar139._20_4_ = fVar352 * fVar311;
    fVar13 = local_680._24_4_;
    auVar139._24_4_ = fVar353 * fVar13;
    auVar139._28_4_ = auVar103._28_4_;
    auVar19 = vsubps_avx(auVar139,auVar21);
    auVar77._4_4_ = fStack_a7c;
    auVar77._0_4_ = local_a80;
    auVar77._8_4_ = fStack_a78;
    auVar77._12_4_ = fStack_a74;
    auVar77._16_4_ = fStack_a70;
    auVar77._20_4_ = fStack_a6c;
    auVar77._24_4_ = fStack_a68;
    auVar77._28_4_ = fStack_a64;
    auVar103 = vperm2f128_avx(auVar77,auVar77,1);
    auVar103 = vshufps_avx(auVar103,auVar77,0x30);
    local_960 = vshufps_avx(auVar77,auVar103,0x29);
    local_560 = vsubps_avx(local_960,auVar77);
    auVar359._4_4_ = fVar255 * fVar254;
    auVar359._0_4_ = fVar231 * fVar240;
    auVar359._8_4_ = fVar253 * fVar258;
    auVar359._12_4_ = fVar270 * fVar263;
    auVar359._16_4_ = fVar289 * fVar267;
    auVar359._20_4_ = fVar311 * fVar271;
    auVar359._24_4_ = fVar13 * fVar275;
    auVar359._28_4_ = auVar103._28_4_;
    fVar188 = local_560._0_4_;
    fVar260 = local_560._4_4_;
    auVar22._4_4_ = fVar360 * fVar260;
    auVar22._0_4_ = fVar355 * fVar188;
    fVar256 = local_560._8_4_;
    auVar22._8_4_ = fVar362 * fVar256;
    fVar273 = local_560._12_4_;
    auVar22._12_4_ = fVar364 * fVar273;
    fVar290 = local_560._16_4_;
    auVar22._16_4_ = fVar366 * fVar290;
    fVar313 = local_560._20_4_;
    auVar22._20_4_ = fVar368 * fVar313;
    fVar14 = local_560._24_4_;
    auVar22._24_4_ = fVar370 * fVar14;
    auVar22._28_4_ = local_8e0._28_4_;
    auVar20 = vsubps_avx(auVar22,auVar359);
    auVar318._4_4_ = fVar347 * fVar260;
    auVar318._0_4_ = fVar339 * fVar188;
    auVar318._8_4_ = fVar349 * fVar256;
    auVar318._12_4_ = fVar350 * fVar273;
    auVar318._16_4_ = fVar351 * fVar290;
    auVar318._20_4_ = fVar352 * fVar313;
    auVar318._24_4_ = fVar353 * fVar14;
    auVar318._28_4_ = local_8e0._28_4_;
    auVar23._4_4_ = fVar251 * fVar254;
    auVar23._0_4_ = fVar176 * fVar240;
    auVar23._8_4_ = fVar252 * fVar258;
    auVar23._12_4_ = fVar269 * fVar263;
    auVar23._16_4_ = fVar288 * fVar267;
    auVar23._20_4_ = fVar309 * fVar271;
    auVar23._24_4_ = fVar12 * fVar275;
    auVar23._28_4_ = uStack_1c4;
    auVar137 = vsubps_avx(auVar23,auVar318);
    fVar214 = auVar137._28_4_;
    auVar136._0_4_ = fVar188 * fVar188 + fVar176 * fVar176 + fVar231 * fVar231;
    auVar136._4_4_ = fVar260 * fVar260 + fVar251 * fVar251 + fVar255 * fVar255;
    auVar136._8_4_ = fVar256 * fVar256 + fVar252 * fVar252 + fVar253 * fVar253;
    auVar136._12_4_ = fVar273 * fVar273 + fVar269 * fVar269 + fVar270 * fVar270;
    auVar136._16_4_ = fVar290 * fVar290 + fVar288 * fVar288 + fVar289 * fVar289;
    auVar136._20_4_ = fVar313 * fVar313 + fVar309 * fVar309 + fVar311 * fVar311;
    auVar136._24_4_ = fVar14 * fVar14 + fVar12 * fVar12 + fVar13 * fVar13;
    auVar136._28_4_ = fVar214 + fVar214 + auVar19._28_4_;
    auVar103 = vrcpps_avx(auVar136);
    fVar285 = auVar103._0_4_;
    fVar286 = auVar103._4_4_;
    auVar24._4_4_ = fVar286 * auVar136._4_4_;
    auVar24._0_4_ = fVar285 * auVar136._0_4_;
    fVar287 = auVar103._8_4_;
    auVar24._8_4_ = fVar287 * auVar136._8_4_;
    fVar303 = auVar103._12_4_;
    auVar24._12_4_ = fVar303 * auVar136._12_4_;
    fVar305 = auVar103._16_4_;
    auVar24._16_4_ = fVar305 * auVar136._16_4_;
    fVar307 = auVar103._20_4_;
    auVar24._20_4_ = fVar307 * auVar136._20_4_;
    fVar338 = auVar103._24_4_;
    auVar24._24_4_ = fVar338 * auVar136._24_4_;
    auVar24._28_4_ = uStack_1c4;
    auVar170._8_4_ = 0x3f800000;
    auVar170._0_8_ = &DAT_3f8000003f800000;
    auVar170._12_4_ = 0x3f800000;
    auVar170._16_4_ = 0x3f800000;
    auVar170._20_4_ = 0x3f800000;
    auVar170._24_4_ = 0x3f800000;
    auVar170._28_4_ = 0x3f800000;
    auVar21 = vsubps_avx(auVar170,auVar24);
    fVar285 = auVar21._0_4_ * fVar285 + fVar285;
    fVar286 = auVar21._4_4_ * fVar286 + fVar286;
    fVar287 = auVar21._8_4_ * fVar287 + fVar287;
    fVar303 = auVar21._12_4_ * fVar303 + fVar303;
    fVar305 = auVar21._16_4_ * fVar305 + fVar305;
    fVar307 = auVar21._20_4_ * fVar307 + fVar307;
    fVar338 = auVar21._24_4_ * fVar338 + fVar338;
    auVar104 = vperm2f128_avx(local_840,local_840,1);
    auVar104 = vshufps_avx(auVar104,local_840,0x30);
    local_860 = vshufps_avx(local_840,auVar104,0x29);
    auVar104 = vperm2f128_avx(local_9c0,local_9c0,1);
    auVar104 = vshufps_avx(auVar104,local_9c0,0x30);
    local_880 = vshufps_avx(local_9c0,auVar104,0x29);
    fVar356 = local_880._0_4_;
    fVar361 = local_880._4_4_;
    auVar25._4_4_ = fVar361 * fVar251;
    auVar25._0_4_ = fVar356 * fVar176;
    fVar363 = local_880._8_4_;
    auVar25._8_4_ = fVar363 * fVar252;
    fVar365 = local_880._12_4_;
    auVar25._12_4_ = fVar365 * fVar269;
    fVar367 = local_880._16_4_;
    auVar25._16_4_ = fVar367 * fVar288;
    fVar369 = local_880._20_4_;
    auVar25._20_4_ = fVar369 * fVar309;
    fVar371 = local_880._24_4_;
    auVar25._24_4_ = fVar371 * fVar12;
    auVar25._28_4_ = auVar104._28_4_;
    fVar232 = local_860._0_4_;
    fVar234 = local_860._4_4_;
    auVar26._4_4_ = fVar255 * fVar234;
    auVar26._0_4_ = fVar231 * fVar232;
    fVar257 = local_860._8_4_;
    auVar26._8_4_ = fVar253 * fVar257;
    fVar274 = local_860._12_4_;
    auVar26._12_4_ = fVar270 * fVar274;
    fVar291 = local_860._16_4_;
    auVar26._16_4_ = fVar289 * fVar291;
    fVar321 = local_860._20_4_;
    auVar26._20_4_ = fVar311 * fVar321;
    fVar15 = local_860._24_4_;
    auVar26._24_4_ = fVar13 * fVar15;
    auVar26._28_4_ = fStack_184;
    auVar139 = vsubps_avx(auVar26,auVar25);
    auVar104 = vperm2f128_avx(local_a00,local_a00,1);
    auVar104 = vshufps_avx(auVar104,local_a00,0x30);
    local_9e0 = vshufps_avx(local_a00,auVar104,0x29);
    fVar189 = local_9e0._0_4_;
    fVar235 = local_9e0._4_4_;
    auVar27._4_4_ = fVar255 * fVar235;
    auVar27._0_4_ = fVar231 * fVar189;
    fVar261 = local_9e0._8_4_;
    auVar27._8_4_ = fVar253 * fVar261;
    fVar278 = local_9e0._12_4_;
    auVar27._12_4_ = fVar270 * fVar278;
    fVar301 = local_9e0._16_4_;
    auVar27._16_4_ = fVar289 * fVar301;
    fVar322 = local_9e0._20_4_;
    auVar27._20_4_ = fVar311 * fVar322;
    fVar16 = local_9e0._24_4_;
    auVar27._24_4_ = fVar13 * fVar16;
    auVar27._28_4_ = auVar104._28_4_;
    auVar28._4_4_ = fVar361 * fVar260;
    auVar28._0_4_ = fVar356 * fVar188;
    auVar28._8_4_ = fVar363 * fVar256;
    auVar28._12_4_ = fVar365 * fVar273;
    auVar28._16_4_ = fVar367 * fVar290;
    auVar28._20_4_ = fVar369 * fVar313;
    uVar9 = local_880._28_4_;
    auVar28._24_4_ = fVar371 * fVar14;
    auVar28._28_4_ = uVar9;
    auVar104 = vsubps_avx(auVar28,auVar27);
    auVar22 = local_860;
    auVar29._4_4_ = fVar260 * fVar234;
    auVar29._0_4_ = fVar188 * fVar232;
    auVar29._8_4_ = fVar256 * fVar257;
    auVar29._12_4_ = fVar273 * fVar274;
    auVar29._16_4_ = fVar290 * fVar291;
    auVar29._20_4_ = fVar313 * fVar321;
    auVar29._24_4_ = fVar14 * fVar15;
    auVar29._28_4_ = uVar9;
    auVar30._4_4_ = fVar251 * fVar235;
    auVar30._0_4_ = fVar176 * fVar189;
    auVar30._8_4_ = fVar252 * fVar261;
    auVar30._12_4_ = fVar269 * fVar278;
    auVar30._16_4_ = fVar288 * fVar301;
    auVar30._20_4_ = fVar309 * fVar322;
    auVar30._24_4_ = fVar12 * fVar16;
    auVar30._28_4_ = uStack_1e4;
    auVar359 = vsubps_avx(auVar30,auVar29);
    fVar239 = auVar359._28_4_;
    fVar354 = auVar104._28_4_ + fVar239;
    auVar31._4_4_ =
         (auVar19._4_4_ * auVar19._4_4_ +
         auVar20._4_4_ * auVar20._4_4_ + auVar137._4_4_ * auVar137._4_4_) * fVar286;
    auVar31._0_4_ =
         (auVar19._0_4_ * auVar19._0_4_ +
         auVar20._0_4_ * auVar20._0_4_ + auVar137._0_4_ * auVar137._0_4_) * fVar285;
    auVar31._8_4_ =
         (auVar19._8_4_ * auVar19._8_4_ +
         auVar20._8_4_ * auVar20._8_4_ + auVar137._8_4_ * auVar137._8_4_) * fVar287;
    auVar31._12_4_ =
         (auVar19._12_4_ * auVar19._12_4_ +
         auVar20._12_4_ * auVar20._12_4_ + auVar137._12_4_ * auVar137._12_4_) * fVar303;
    auVar31._16_4_ =
         (auVar19._16_4_ * auVar19._16_4_ +
         auVar20._16_4_ * auVar20._16_4_ + auVar137._16_4_ * auVar137._16_4_) * fVar305;
    auVar31._20_4_ =
         (auVar19._20_4_ * auVar19._20_4_ +
         auVar20._20_4_ * auVar20._20_4_ + auVar137._20_4_ * auVar137._20_4_) * fVar307;
    auVar31._24_4_ =
         (auVar19._24_4_ * auVar19._24_4_ +
         auVar20._24_4_ * auVar20._24_4_ + auVar137._24_4_ * auVar137._24_4_) * fVar338;
    auVar31._28_4_ = auVar19._28_4_ + auVar20._28_4_ + fVar214;
    auVar32._4_4_ =
         (auVar139._4_4_ * auVar139._4_4_ +
         auVar104._4_4_ * auVar104._4_4_ + auVar359._4_4_ * auVar359._4_4_) * fVar286;
    auVar32._0_4_ =
         (auVar139._0_4_ * auVar139._0_4_ +
         auVar104._0_4_ * auVar104._0_4_ + auVar359._0_4_ * auVar359._0_4_) * fVar285;
    auVar32._8_4_ =
         (auVar139._8_4_ * auVar139._8_4_ +
         auVar104._8_4_ * auVar104._8_4_ + auVar359._8_4_ * auVar359._8_4_) * fVar287;
    auVar32._12_4_ =
         (auVar139._12_4_ * auVar139._12_4_ +
         auVar104._12_4_ * auVar104._12_4_ + auVar359._12_4_ * auVar359._12_4_) * fVar303;
    auVar32._16_4_ =
         (auVar139._16_4_ * auVar139._16_4_ +
         auVar104._16_4_ * auVar104._16_4_ + auVar359._16_4_ * auVar359._16_4_) * fVar305;
    auVar32._20_4_ =
         (auVar139._20_4_ * auVar139._20_4_ +
         auVar104._20_4_ * auVar104._20_4_ + auVar359._20_4_ * auVar359._20_4_) * fVar307;
    auVar32._24_4_ =
         (auVar139._24_4_ * auVar139._24_4_ +
         auVar104._24_4_ * auVar104._24_4_ + auVar359._24_4_ * auVar359._24_4_) * fVar338;
    auVar32._28_4_ = auVar21._28_4_ + auVar103._28_4_;
    auVar103 = vmaxps_avx(auVar31,auVar32);
    auVar104 = vperm2f128_avx(local_740,local_740,1);
    auVar104 = vshufps_avx(auVar104,local_740,0x30);
    local_660 = vshufps_avx(local_740,auVar104,0x29);
    local_780._0_4_ = (float)local_740._0_4_ + fVar190;
    local_780._4_4_ = local_740._4_4_ + fVar327;
    fStack_778 = local_740._8_4_ + fVar262;
    fStack_774 = local_740._12_4_ + fVar266;
    fStack_770 = local_740._16_4_ + fVar233;
    fStack_76c = local_740._20_4_ + fVar236;
    fStack_768 = local_740._24_4_ + fVar237;
    fStack_764 = local_740._28_4_ + fVar265;
    auVar104 = vmaxps_avx(local_740,_local_780);
    auVar19 = vmaxps_avx(local_760,local_660);
    _local_a60 = vmaxps_avx(auVar104,auVar19);
    auVar104 = vrsqrtps_avx(auVar136);
    fVar214 = auVar104._0_4_;
    fVar233 = auVar104._4_4_;
    fVar190 = auVar104._8_4_;
    fVar236 = auVar104._12_4_;
    fVar327 = auVar104._16_4_;
    fVar237 = auVar104._20_4_;
    fVar262 = auVar104._24_4_;
    auVar33._4_4_ = fVar233 * fVar233 * fVar233 * auVar136._4_4_ * 0.5;
    auVar33._0_4_ = fVar214 * fVar214 * fVar214 * auVar136._0_4_ * 0.5;
    auVar33._8_4_ = fVar190 * fVar190 * fVar190 * auVar136._8_4_ * 0.5;
    auVar33._12_4_ = fVar236 * fVar236 * fVar236 * auVar136._12_4_ * 0.5;
    auVar33._16_4_ = fVar327 * fVar327 * fVar327 * auVar136._16_4_ * 0.5;
    auVar33._20_4_ = fVar237 * fVar237 * fVar237 * auVar136._20_4_ * 0.5;
    auVar33._24_4_ = fVar262 * fVar262 * fVar262 * auVar136._24_4_ * 0.5;
    auVar33._28_4_ = auVar136._28_4_;
    auVar34._4_4_ = fVar233 * 1.5;
    auVar34._0_4_ = fVar214 * 1.5;
    auVar34._8_4_ = fVar190 * 1.5;
    auVar34._12_4_ = fVar236 * 1.5;
    auVar34._16_4_ = fVar327 * 1.5;
    auVar34._20_4_ = fVar237 * 1.5;
    auVar34._24_4_ = fVar262 * 1.5;
    auVar34._28_4_ = auVar104._28_4_;
    local_5c0 = vsubps_avx(auVar34,auVar33);
    auVar74._4_4_ = fStack_abc;
    auVar74._0_4_ = local_ac0;
    auVar74._8_4_ = fStack_ab8;
    auVar74._12_4_ = fStack_ab4;
    auVar74._16_4_ = fStack_ab0;
    auVar74._20_4_ = fStack_aac;
    auVar74._24_4_ = fStack_aa8;
    auVar74._28_4_ = fStack_aa4;
    auVar104 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_8a0 = vsubps_avx(auVar104,auVar74);
    auVar76._4_4_ = fStack_a9c;
    auVar76._0_4_ = local_aa0;
    auVar76._8_4_ = fStack_a98;
    auVar76._12_4_ = fStack_a94;
    auVar76._16_4_ = fStack_a90;
    auVar76._20_4_ = fStack_a8c;
    auVar76._24_4_ = fStack_a88;
    auVar76._28_4_ = fStack_a84;
    auVar104 = vsubps_avx(auVar104,auVar76);
    fVar233 = auVar104._0_4_;
    fVar236 = auVar104._4_4_;
    fVar262 = auVar104._8_4_;
    fVar285 = auVar104._12_4_;
    fVar303 = auVar104._16_4_;
    fVar338 = auVar104._20_4_;
    fVar17 = auVar104._24_4_;
    fVar190 = local_8a0._0_4_;
    fVar327 = local_8a0._4_4_;
    fVar265 = local_8a0._8_4_;
    fVar286 = local_8a0._12_4_;
    fVar305 = local_8a0._16_4_;
    fVar11 = local_8a0._20_4_;
    fVar18 = local_8a0._24_4_;
    auVar137 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar19 = vsubps_avx(auVar137,auVar77);
    auVar331 = ZEXT3264(auVar19);
    fVar328 = auVar19._0_4_;
    fVar332 = auVar19._4_4_;
    fVar333 = auVar19._8_4_;
    fVar334 = auVar19._12_4_;
    fVar335 = auVar19._16_4_;
    fVar336 = auVar19._20_4_;
    fVar337 = auVar19._24_4_;
    auVar325._0_4_ = fVar328 * local_500 + local_520 * fVar190 + local_640 * fVar233;
    auVar325._4_4_ = fVar332 * fStack_4fc + fStack_51c * fVar327 + fStack_63c * fVar236;
    auVar325._8_4_ = fVar333 * fStack_4f8 + fStack_518 * fVar265 + fStack_638 * fVar262;
    auVar325._12_4_ = fVar334 * fStack_4f4 + fStack_514 * fVar286 + fStack_634 * fVar285;
    auVar325._16_4_ = fVar335 * fStack_4f0 + fStack_510 * fVar305 + fStack_630 * fVar303;
    auVar325._20_4_ = fVar336 * fStack_4ec + fStack_50c * fVar11 + fStack_62c * fVar338;
    auVar325._24_4_ = fVar337 * fStack_4e8 + fStack_508 * fVar18 + fStack_628 * fVar17;
    auVar325._28_4_ = fVar354 + fVar354 + auVar139._28_4_ + fVar354;
    auVar326 = ZEXT3264(auVar325);
    auVar343._0_4_ = fVar328 * fVar328 + fVar190 * fVar190 + fVar233 * fVar233;
    auVar343._4_4_ = fVar332 * fVar332 + fVar327 * fVar327 + fVar236 * fVar236;
    auVar343._8_4_ = fVar333 * fVar333 + fVar265 * fVar265 + fVar262 * fVar262;
    auVar343._12_4_ = fVar334 * fVar334 + fVar286 * fVar286 + fVar285 * fVar285;
    auVar343._16_4_ = fVar335 * fVar335 + fVar305 * fVar305 + fVar303 * fVar303;
    auVar343._20_4_ = fVar336 * fVar336 + fVar11 * fVar11 + fVar338 * fVar338;
    auVar343._24_4_ = fVar337 * fVar337 + fVar18 * fVar18 + fVar17 * fVar17;
    auVar343._28_4_ = fVar239 + fVar239 + fVar354;
    fVar239 = local_5c0._0_4_;
    fVar237 = local_5c0._4_4_;
    fVar266 = local_5c0._8_4_;
    fVar287 = local_5c0._12_4_;
    fVar307 = local_5c0._16_4_;
    fVar354 = local_5c0._20_4_;
    fVar238 = local_5c0._24_4_;
    fVar292 = local_500 * fVar188 * fVar239 +
              fVar176 * fVar239 * local_520 + fVar231 * fVar239 * local_640;
    fVar302 = fStack_4fc * fVar260 * fVar237 +
              fVar251 * fVar237 * fStack_51c + fVar255 * fVar237 * fStack_63c;
    fVar304 = fStack_4f8 * fVar256 * fVar266 +
              fVar252 * fVar266 * fStack_518 + fVar253 * fVar266 * fStack_638;
    fVar306 = fStack_4f4 * fVar273 * fVar287 +
              fVar269 * fVar287 * fStack_514 + fVar270 * fVar287 * fStack_634;
    fVar308 = fStack_4f0 * fVar290 * fVar307 +
              fVar288 * fVar307 * fStack_510 + fVar289 * fVar307 * fStack_630;
    fVar310 = fStack_4ec * fVar313 * fVar354 +
              fVar309 * fVar354 * fStack_50c + fVar311 * fVar354 * fStack_62c;
    fVar312 = fStack_4e8 * fVar14 * fVar238 +
              fVar12 * fVar238 * fStack_508 + fVar13 * fVar238 * fStack_628;
    fVar314 = fStack_4e4 + fStack_504 + fStack_624;
    fVar214 = fStack_4e4 + fStack_504 + fStack_624;
    local_6e0._0_4_ =
         fVar328 * fVar188 * fVar239 + fVar176 * fVar239 * fVar190 + fVar231 * fVar239 * fVar233;
    local_6e0._4_4_ =
         fVar332 * fVar260 * fVar237 + fVar251 * fVar237 * fVar327 + fVar255 * fVar237 * fVar236;
    local_6e0._8_4_ =
         fVar333 * fVar256 * fVar266 + fVar252 * fVar266 * fVar265 + fVar253 * fVar266 * fVar262;
    local_6e0._12_4_ =
         fVar334 * fVar273 * fVar287 + fVar269 * fVar287 * fVar286 + fVar270 * fVar287 * fVar285;
    local_6e0._16_4_ =
         fVar335 * fVar290 * fVar307 + fVar288 * fVar307 * fVar305 + fVar289 * fVar307 * fVar303;
    local_6e0._20_4_ =
         fVar336 * fVar313 * fVar354 + fVar309 * fVar354 * fVar11 + fVar311 * fVar354 * fVar338;
    local_6e0._24_4_ =
         fVar337 * fVar14 * fVar238 + fVar12 * fVar238 * fVar18 + fVar13 * fVar238 * fVar17;
    local_6e0._28_4_ = fStack_504 + fVar214;
    auVar35._4_4_ = fVar302 * local_6e0._4_4_;
    auVar35._0_4_ = fVar292 * local_6e0._0_4_;
    auVar35._8_4_ = fVar304 * local_6e0._8_4_;
    auVar35._12_4_ = fVar306 * local_6e0._12_4_;
    auVar35._16_4_ = fVar308 * local_6e0._16_4_;
    auVar35._20_4_ = fVar310 * local_6e0._20_4_;
    auVar35._24_4_ = fVar312 * local_6e0._24_4_;
    auVar35._28_4_ = fVar214;
    auVar19 = vsubps_avx(auVar325,auVar35);
    auVar36._4_4_ = local_6e0._4_4_ * local_6e0._4_4_;
    auVar36._0_4_ = local_6e0._0_4_ * local_6e0._0_4_;
    auVar36._8_4_ = local_6e0._8_4_ * local_6e0._8_4_;
    auVar36._12_4_ = local_6e0._12_4_ * local_6e0._12_4_;
    auVar36._16_4_ = local_6e0._16_4_ * local_6e0._16_4_;
    auVar36._20_4_ = local_6e0._20_4_ * local_6e0._20_4_;
    auVar36._24_4_ = local_6e0._24_4_ * local_6e0._24_4_;
    auVar36._28_4_ = fStack_504;
    _local_7a0 = vsubps_avx(auVar343,auVar36);
    _local_540 = vsqrtps_avx(auVar103);
    fVar214 = (local_540._0_4_ + (float)local_a60._0_4_) * 1.0000002;
    fVar113 = (local_540._4_4_ + (float)local_a60._4_4_) * 1.0000002;
    fVar115 = (local_540._8_4_ + fStack_a58) * 1.0000002;
    fVar117 = (local_540._12_4_ + fStack_a54) * 1.0000002;
    fVar118 = (local_540._16_4_ + fStack_a50) * 1.0000002;
    fVar119 = (local_540._20_4_ + fStack_a4c) * 1.0000002;
    fVar120 = (local_540._24_4_ + fStack_a48) * 1.0000002;
    auVar37._4_4_ = fVar113 * fVar113;
    auVar37._0_4_ = fVar214 * fVar214;
    auVar37._8_4_ = fVar115 * fVar115;
    auVar37._12_4_ = fVar117 * fVar117;
    auVar37._16_4_ = fVar118 * fVar118;
    auVar37._20_4_ = fVar119 * fVar119;
    auVar37._24_4_ = fVar120 * fVar120;
    auVar37._28_4_ = local_540._28_4_ + fStack_a44;
    fVar340 = auVar19._0_4_ + auVar19._0_4_;
    fVar348 = auVar19._4_4_ + auVar19._4_4_;
    local_580._0_8_ = CONCAT44(fVar348,fVar340);
    local_580._8_4_ = auVar19._8_4_ + auVar19._8_4_;
    local_580._12_4_ = auVar19._12_4_ + auVar19._12_4_;
    local_580._16_4_ = auVar19._16_4_ + auVar19._16_4_;
    local_580._20_4_ = auVar19._20_4_ + auVar19._20_4_;
    local_580._24_4_ = auVar19._24_4_ + auVar19._24_4_;
    local_580._28_4_ = auVar19._28_4_ + auVar19._28_4_;
    auVar19 = vsubps_avx(_local_7a0,auVar37);
    local_5e0._4_4_ = fVar302 * fVar302;
    local_5e0._0_4_ = fVar292 * fVar292;
    local_5e0._8_4_ = fVar304 * fVar304;
    local_5e0._12_4_ = fVar306 * fVar306;
    local_5e0._16_4_ = fVar308 * fVar308;
    local_5e0._20_4_ = fVar310 * fVar310;
    local_5e0._24_4_ = fVar312 * fVar312;
    local_5e0._28_4_ = local_560._28_4_;
    _local_6c0 = vsubps_avx(local_260,local_5e0);
    auVar319 = ZEXT3264(_local_6c0);
    local_7c0._4_4_ = fVar348 * fVar348;
    local_7c0._0_4_ = fVar340 * fVar340;
    local_7c0._8_4_ = local_580._8_4_ * local_580._8_4_;
    local_7c0._12_4_ = local_580._12_4_ * local_580._12_4_;
    local_7c0._16_4_ = local_580._16_4_ * local_580._16_4_;
    local_7c0._20_4_ = local_580._20_4_ * local_580._20_4_;
    local_7c0._24_4_ = local_580._24_4_ * local_580._24_4_;
    local_7c0._28_4_ = 0x3f800002;
    fVar113 = local_6c0._0_4_;
    local_7e0._0_4_ = fVar113 * 4.0;
    fVar115 = local_6c0._4_4_;
    local_7e0._4_4_ = fVar115 * 4.0;
    fVar117 = local_6c0._8_4_;
    fStack_7d8 = fVar117 * 4.0;
    fVar118 = local_6c0._12_4_;
    fStack_7d4 = fVar118 * 4.0;
    fVar119 = local_6c0._16_4_;
    fStack_7d0 = fVar119 * 4.0;
    fVar120 = local_6c0._20_4_;
    fStack_7cc = fVar120 * 4.0;
    fVar320 = local_6c0._24_4_;
    fStack_7c8 = fVar320 * 4.0;
    uStack_7c4 = 0x40800000;
    auVar38._4_4_ = auVar19._4_4_ * (float)local_7e0._4_4_;
    auVar38._0_4_ = auVar19._0_4_ * (float)local_7e0._0_4_;
    auVar38._8_4_ = auVar19._8_4_ * fStack_7d8;
    auVar38._12_4_ = auVar19._12_4_ * fStack_7d4;
    auVar38._16_4_ = auVar19._16_4_ * fStack_7d0;
    auVar38._20_4_ = auVar19._20_4_ * fStack_7cc;
    auVar38._24_4_ = auVar19._24_4_ * fStack_7c8;
    auVar38._28_4_ = 0x40800000;
    auVar20 = vsubps_avx(local_7c0,auVar38);
    auVar103 = vcmpps_avx(auVar20,auVar137,5);
    fVar214 = local_6c0._28_4_;
    if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar103 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar103 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar103 >> 0x7f,0) == '\0') &&
          (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar103 >> 0xbf,0) == '\0') &&
        (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar103[0x1f])
    {
      auVar203._8_4_ = 0x7f800000;
      auVar203._0_8_ = 0x7f8000007f800000;
      auVar203._12_4_ = 0x7f800000;
      auVar203._16_4_ = 0x7f800000;
      auVar203._20_4_ = 0x7f800000;
      auVar203._24_4_ = 0x7f800000;
      auVar203._28_4_ = 0x7f800000;
      auVar344._8_4_ = 0xff800000;
      auVar344._0_8_ = 0xff800000ff800000;
      auVar344._12_4_ = 0xff800000;
      auVar344._16_4_ = 0xff800000;
      auVar344._20_4_ = 0xff800000;
      auVar344._24_4_ = 0xff800000;
      auVar344._28_4_ = 0xff800000;
      fVar340 = 0.0;
    }
    else {
      auVar139 = vsqrtps_avx(auVar20);
      auVar245._0_4_ = fVar113 + fVar113;
      auVar245._4_4_ = fVar115 + fVar115;
      auVar245._8_4_ = fVar117 + fVar117;
      auVar245._12_4_ = fVar118 + fVar118;
      auVar245._16_4_ = fVar119 + fVar119;
      auVar245._20_4_ = fVar120 + fVar120;
      auVar245._24_4_ = fVar320 + fVar320;
      auVar245._28_4_ = fVar214 + fVar214;
      auVar21 = vrcpps_avx(auVar245);
      auVar137 = vcmpps_avx(auVar20,auVar137,5);
      fVar191 = auVar21._0_4_;
      fVar208 = auVar21._4_4_;
      auVar39._4_4_ = auVar245._4_4_ * fVar208;
      auVar39._0_4_ = auVar245._0_4_ * fVar191;
      fVar209 = auVar21._8_4_;
      auVar39._8_4_ = auVar245._8_4_ * fVar209;
      fVar210 = auVar21._12_4_;
      auVar39._12_4_ = auVar245._12_4_ * fVar210;
      fVar211 = auVar21._16_4_;
      auVar39._16_4_ = auVar245._16_4_ * fVar211;
      fVar212 = auVar21._20_4_;
      auVar39._20_4_ = auVar245._20_4_ * fVar212;
      fVar213 = auVar21._24_4_;
      auVar39._24_4_ = auVar245._24_4_ * fVar213;
      auVar39._28_4_ = auVar20._28_4_;
      auVar138._8_4_ = 0x3f800000;
      auVar138._0_8_ = &DAT_3f8000003f800000;
      auVar138._12_4_ = 0x3f800000;
      auVar138._16_4_ = 0x3f800000;
      auVar138._20_4_ = 0x3f800000;
      auVar138._24_4_ = 0x3f800000;
      auVar138._28_4_ = 0x3f800000;
      auVar20 = vsubps_avx(auVar138,auVar39);
      fVar191 = fVar191 + fVar191 * auVar20._0_4_;
      fVar208 = fVar208 + fVar208 * auVar20._4_4_;
      fVar209 = fVar209 + fVar209 * auVar20._8_4_;
      fVar210 = fVar210 + fVar210 * auVar20._12_4_;
      fVar211 = fVar211 + fVar211 * auVar20._16_4_;
      fVar212 = fVar212 + fVar212 * auVar20._20_4_;
      fVar213 = fVar213 + fVar213 * auVar20._24_4_;
      auVar246._0_8_ = CONCAT44(fVar348,fVar340) ^ 0x8000000080000000;
      auVar246._8_4_ = -local_580._8_4_;
      auVar246._12_4_ = -local_580._12_4_;
      auVar246._16_4_ = -local_580._16_4_;
      auVar246._20_4_ = -local_580._20_4_;
      auVar246._24_4_ = -local_580._24_4_;
      auVar246._28_4_ = -local_580._28_4_;
      auVar359 = vsubps_avx(auVar246,auVar139);
      fVar340 = auVar359._0_4_ * fVar191;
      fVar348 = auVar359._4_4_ * fVar208;
      auVar40._4_4_ = fVar348;
      auVar40._0_4_ = fVar340;
      fVar259 = auVar359._8_4_ * fVar209;
      auVar40._8_4_ = fVar259;
      fVar264 = auVar359._12_4_ * fVar210;
      auVar40._12_4_ = fVar264;
      fVar268 = auVar359._16_4_ * fVar211;
      auVar40._16_4_ = fVar268;
      fVar272 = auVar359._20_4_ * fVar212;
      auVar40._20_4_ = fVar272;
      fVar276 = auVar359._24_4_ * fVar213;
      auVar40._24_4_ = fVar276;
      auVar40._28_4_ = auVar359._28_4_;
      auVar139 = vsubps_avx(auVar139,local_580);
      fVar191 = auVar139._0_4_ * fVar191;
      fVar208 = auVar139._4_4_ * fVar208;
      auVar41._4_4_ = fVar208;
      auVar41._0_4_ = fVar191;
      fVar209 = auVar139._8_4_ * fVar209;
      auVar41._8_4_ = fVar209;
      fVar210 = auVar139._12_4_ * fVar210;
      auVar41._12_4_ = fVar210;
      fVar211 = auVar139._16_4_ * fVar211;
      auVar41._16_4_ = fVar211;
      fVar212 = auVar139._20_4_ * fVar212;
      auVar41._20_4_ = fVar212;
      fVar213 = auVar139._24_4_ * fVar213;
      auVar41._24_4_ = fVar213;
      auVar41._28_4_ = auVar139._28_4_;
      fStack_4a4 = local_6e0._28_4_ + auVar21._28_4_ + auVar20._28_4_;
      local_4c0[0] = fVar239 * (local_6e0._0_4_ + fVar292 * fVar340);
      local_4c0[1] = fVar237 * (local_6e0._4_4_ + fVar302 * fVar348);
      local_4c0[2] = fVar266 * (local_6e0._8_4_ + fVar304 * fVar259);
      local_4c0[3] = fVar287 * (local_6e0._12_4_ + fVar306 * fVar264);
      fStack_4b0 = fVar307 * (local_6e0._16_4_ + fVar308 * fVar268);
      fStack_4ac = fVar354 * (local_6e0._20_4_ + fVar310 * fVar272);
      fStack_4a8 = fVar238 * (local_6e0._24_4_ + fVar312 * fVar276);
      local_a60._4_4_ = fVar302;
      local_a60._0_4_ = fVar292;
      fStack_a58 = fVar304;
      fStack_a54 = fVar306;
      fStack_a50 = fVar308;
      fStack_a4c = fVar310;
      fStack_a48 = fVar312;
      fStack_a44 = fVar314;
      local_4e0[0] = fVar239 * (local_6e0._0_4_ + fVar292 * fVar191);
      local_4e0[1] = fVar237 * (local_6e0._4_4_ + fVar302 * fVar208);
      local_4e0[2] = fVar266 * (local_6e0._8_4_ + fVar304 * fVar209);
      local_4e0[3] = fVar287 * (local_6e0._12_4_ + fVar306 * fVar210);
      fStack_4d0 = fVar307 * (local_6e0._16_4_ + fVar308 * fVar211);
      fStack_4cc = fVar354 * (local_6e0._20_4_ + fVar310 * fVar212);
      fStack_4c8 = fVar238 * (local_6e0._24_4_ + fVar312 * fVar213);
      fStack_4c4 = local_6e0._28_4_ + fStack_4a4;
      auVar204._8_4_ = 0x7f800000;
      auVar204._0_8_ = 0x7f8000007f800000;
      auVar204._12_4_ = 0x7f800000;
      auVar204._16_4_ = 0x7f800000;
      auVar204._20_4_ = 0x7f800000;
      auVar204._24_4_ = 0x7f800000;
      auVar204._28_4_ = 0x7f800000;
      auVar203 = vblendvps_avx(auVar204,auVar40,auVar137);
      auVar282._8_4_ = 0x7fffffff;
      auVar282._0_8_ = 0x7fffffff7fffffff;
      auVar282._12_4_ = 0x7fffffff;
      auVar282._16_4_ = 0x7fffffff;
      auVar282._20_4_ = 0x7fffffff;
      auVar282._24_4_ = 0x7fffffff;
      auVar282._28_4_ = 0x7fffffff;
      auVar20 = vandps_avx(local_5e0,auVar282);
      auVar20 = vmaxps_avx(local_3e0,auVar20);
      auVar42._4_4_ = auVar20._4_4_ * 1.9073486e-06;
      auVar42._0_4_ = auVar20._0_4_ * 1.9073486e-06;
      auVar42._8_4_ = auVar20._8_4_ * 1.9073486e-06;
      auVar42._12_4_ = auVar20._12_4_ * 1.9073486e-06;
      auVar42._16_4_ = auVar20._16_4_ * 1.9073486e-06;
      auVar42._20_4_ = auVar20._20_4_ * 1.9073486e-06;
      auVar42._24_4_ = auVar20._24_4_ * 1.9073486e-06;
      auVar42._28_4_ = auVar20._28_4_;
      auVar20 = vandps_avx(_local_6c0,auVar282);
      auVar20 = vcmpps_avx(auVar20,auVar42,1);
      auVar326 = ZEXT3264(auVar20);
      auVar247._8_4_ = 0xff800000;
      auVar247._0_8_ = 0xff800000ff800000;
      auVar247._12_4_ = 0xff800000;
      auVar247._16_4_ = 0xff800000;
      auVar247._20_4_ = 0xff800000;
      auVar247._24_4_ = 0xff800000;
      auVar247._28_4_ = 0xff800000;
      auVar344 = vblendvps_avx(auVar247,auVar41,auVar137);
      auVar21 = auVar137 & auVar20;
      fVar340 = local_6e0._28_4_;
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar21 >> 0x7f,0) != '\0') ||
            (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar21 >> 0xbf,0) != '\0') ||
          (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar21[0x1f] < '\0') {
        auVar103 = vandps_avx(auVar20,auVar137);
        auVar129 = vpackssdw_avx(auVar103._0_16_,auVar103._16_16_);
        auVar20 = vcmpps_avx(auVar19,ZEXT832(0) << 0x20,2);
        auVar372._8_4_ = 0xff800000;
        auVar372._0_8_ = 0xff800000ff800000;
        auVar372._12_4_ = 0xff800000;
        auVar372._16_4_ = 0xff800000;
        auVar372._20_4_ = 0xff800000;
        auVar372._24_4_ = 0xff800000;
        auVar372._28_4_ = 0xff800000;
        auVar299._8_4_ = 0x7f800000;
        auVar299._0_8_ = 0x7f8000007f800000;
        auVar299._12_4_ = 0x7f800000;
        auVar299._16_4_ = 0x7f800000;
        auVar299._20_4_ = 0x7f800000;
        auVar299._24_4_ = 0x7f800000;
        auVar299._28_4_ = 0x7f800000;
        auVar19 = vblendvps_avx(auVar299,auVar372,auVar20);
        auVar94 = vpmovsxwd_avx(auVar129);
        auVar326 = ZEXT1664(auVar94);
        auVar129 = vpunpckhwd_avx(auVar129,auVar129);
        auVar229._16_16_ = auVar129;
        auVar229._0_16_ = auVar94;
        auVar203 = vblendvps_avx(auVar203,auVar19,auVar229);
        auVar19 = vblendvps_avx(auVar372,auVar299,auVar20);
        auVar344 = vblendvps_avx(auVar344,auVar19,auVar229);
        auVar19 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar110._0_4_ = auVar103._0_4_ ^ auVar19._0_4_;
        auVar110._4_4_ = auVar103._4_4_ ^ auVar19._4_4_;
        auVar110._8_4_ = auVar103._8_4_ ^ auVar19._8_4_;
        auVar110._12_4_ = auVar103._12_4_ ^ auVar19._12_4_;
        auVar110._16_4_ = auVar103._16_4_ ^ auVar19._16_4_;
        auVar110._20_4_ = auVar103._20_4_ ^ auVar19._20_4_;
        auVar110._24_4_ = auVar103._24_4_ ^ auVar19._24_4_;
        auVar110._28_4_ = auVar103._28_4_ ^ auVar19._28_4_;
        auVar103 = vorps_avx(auVar20,auVar110);
        auVar103 = vandps_avx(auVar137,auVar103);
      }
    }
    auVar346 = ZEXT3264(auVar344);
    auVar230 = ZEXT3264(local_3c0);
    auVar19 = local_3c0 & auVar103;
    auVar250 = ZEXT3264(_local_820);
    auVar284 = ZEXT1664(local_930);
    if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0x7f,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar19 >> 0xbf,0) != '\0') ||
        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar19[0x1f] < '\0')
    {
      local_a60._4_4_ = fVar302;
      local_a60._0_4_ = fVar292;
      fStack_a58 = fVar304;
      fStack_a54 = fVar306;
      fStack_a50 = fVar308;
      fStack_a4c = fVar310;
      fStack_a48 = fVar312;
      fStack_a44 = fVar314;
      auVar129 = ZEXT416((uint)((ray->super_RayK<1>).org.field_0.m128[3] - (float)local_800._0_4_));
      auVar129 = vshufps_avx(auVar129,auVar129,0);
      auVar221._16_16_ = auVar129;
      auVar221._0_16_ = auVar129;
      auVar20 = vmaxps_avx(auVar221,auVar203);
      auVar129 = ZEXT416((uint)((ray->super_RayK<1>).tfar - (float)local_800._0_4_));
      auVar129 = vshufps_avx(auVar129,auVar129,0);
      auVar222._16_16_ = auVar129;
      auVar222._0_16_ = auVar129;
      auVar137 = vminps_avx(auVar222,auVar344);
      fVar211 = auVar104._28_4_;
      auVar171._0_4_ = local_500 * fVar240 + local_520 * fVar339 + fVar355 * local_640;
      auVar171._4_4_ = fStack_4fc * fVar254 + fStack_51c * fVar347 + fVar360 * fStack_63c;
      auVar171._8_4_ = fStack_4f8 * fVar258 + fStack_518 * fVar349 + fVar362 * fStack_638;
      auVar171._12_4_ = fStack_4f4 * fVar263 + fStack_514 * fVar350 + fVar364 * fStack_634;
      auVar171._16_4_ = fStack_4f0 * fVar267 + fStack_510 * fVar351 + fVar366 * fStack_630;
      auVar171._20_4_ = fStack_4ec * fVar271 + fStack_50c * fVar352 + fVar368 * fStack_62c;
      auVar171._24_4_ = fStack_4e8 * fVar275 + fStack_508 * fVar353 + fVar370 * fStack_628;
      auVar171._28_4_ = fVar277 + fStack_184 + fVar211;
      auVar104 = vrcpps_avx(auVar171);
      fVar277 = auVar104._0_4_;
      fVar314 = auVar104._4_4_;
      auVar43._4_4_ = auVar171._4_4_ * fVar314;
      auVar43._0_4_ = auVar171._0_4_ * fVar277;
      fVar348 = auVar104._8_4_;
      auVar43._8_4_ = auVar171._8_4_ * fVar348;
      fVar191 = auVar104._12_4_;
      auVar43._12_4_ = auVar171._12_4_ * fVar191;
      fVar208 = auVar104._16_4_;
      auVar43._16_4_ = auVar171._16_4_ * fVar208;
      fVar209 = auVar104._20_4_;
      auVar43._20_4_ = auVar171._20_4_ * fVar209;
      fVar210 = auVar104._24_4_;
      auVar43._24_4_ = auVar171._24_4_ * fVar210;
      auVar43._28_4_ = fStack_184;
      auVar296._8_4_ = 0x3f800000;
      auVar296._0_8_ = &DAT_3f8000003f800000;
      auVar296._12_4_ = 0x3f800000;
      auVar296._16_4_ = 0x3f800000;
      auVar296._20_4_ = 0x3f800000;
      auVar296._24_4_ = 0x3f800000;
      auVar296._28_4_ = 0x3f800000;
      auVar19 = vsubps_avx(auVar296,auVar43);
      auVar283._8_4_ = 0x7fffffff;
      auVar283._0_8_ = 0x7fffffff7fffffff;
      auVar283._12_4_ = 0x7fffffff;
      auVar283._16_4_ = 0x7fffffff;
      auVar283._20_4_ = 0x7fffffff;
      auVar283._24_4_ = 0x7fffffff;
      auVar283._28_4_ = 0x7fffffff;
      auVar104 = vandps_avx(auVar171,auVar283);
      auVar358._8_4_ = 0x219392ef;
      auVar358._0_8_ = 0x219392ef219392ef;
      auVar358._12_4_ = 0x219392ef;
      auVar358._16_4_ = 0x219392ef;
      auVar358._20_4_ = 0x219392ef;
      auVar358._24_4_ = 0x219392ef;
      auVar358._28_4_ = 0x219392ef;
      auVar104 = vcmpps_avx(auVar104,auVar358,1);
      auVar326 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar44._4_4_ =
           (fVar314 + fVar314 * auVar19._4_4_) *
           -(fVar332 * fVar254 + fVar347 * fVar327 + fVar360 * fVar236);
      auVar44._0_4_ =
           (fVar277 + fVar277 * auVar19._0_4_) *
           -(fVar328 * fVar240 + fVar339 * fVar190 + fVar355 * fVar233);
      auVar44._8_4_ =
           (fVar348 + fVar348 * auVar19._8_4_) *
           -(fVar333 * fVar258 + fVar349 * fVar265 + fVar362 * fVar262);
      auVar44._12_4_ =
           (fVar191 + fVar191 * auVar19._12_4_) *
           -(fVar334 * fVar263 + fVar350 * fVar286 + fVar364 * fVar285);
      auVar44._16_4_ =
           (fVar208 + fVar208 * auVar19._16_4_) *
           -(fVar335 * fVar267 + fVar351 * fVar305 + fVar366 * fVar303);
      auVar44._20_4_ =
           (fVar209 + fVar209 * auVar19._20_4_) *
           -(fVar336 * fVar271 + fVar352 * fVar11 + fVar368 * fVar338);
      auVar44._24_4_ =
           (fVar210 + fVar210 * auVar19._24_4_) *
           -(fVar337 * fVar275 + fVar353 * fVar18 + fVar370 * fVar17);
      auVar44._28_4_ = -(fVar211 + fVar340 + fVar211);
      auVar319 = ZEXT864(0) << 0x20;
      auVar19 = vcmpps_avx(auVar171,ZEXT832(0) << 0x20,1);
      auVar21 = vorps_avx(auVar104,auVar19);
      auVar19 = vcmpps_avx(auVar171,ZEXT832(0) << 0x20,6);
      auVar19 = vorps_avx(auVar104,auVar19);
      auVar330._8_4_ = 0xff800000;
      auVar330._0_8_ = 0xff800000ff800000;
      auVar330._12_4_ = 0xff800000;
      auVar330._16_4_ = 0xff800000;
      auVar330._20_4_ = 0xff800000;
      auVar330._24_4_ = 0xff800000;
      auVar330._28_4_ = 0xff800000;
      auVar331 = ZEXT3264(auVar330);
      auVar104 = vblendvps_avx(auVar44,auVar330,auVar21);
      auVar345._8_4_ = 0x7f800000;
      auVar345._0_8_ = 0x7f8000007f800000;
      auVar345._12_4_ = 0x7f800000;
      auVar345._16_4_ = 0x7f800000;
      auVar345._20_4_ = 0x7f800000;
      auVar345._24_4_ = 0x7f800000;
      auVar345._28_4_ = 0x7f800000;
      auVar346 = ZEXT3264(auVar345);
      auVar19 = vblendvps_avx(auVar44,auVar345,auVar19);
      auVar20 = vmaxps_avx(auVar20,auVar104);
      auVar137 = vminps_avx(auVar137,auVar19);
      auVar318 = ZEXT832(0) << 0x20;
      auVar104 = vsubps_avx(auVar318,_local_8c0);
      auVar19 = vsubps_avx(auVar318,local_8e0);
      auVar45._4_4_ = auVar19._4_4_ * -fVar361;
      auVar45._0_4_ = auVar19._0_4_ * -fVar356;
      auVar45._8_4_ = auVar19._8_4_ * -fVar363;
      auVar45._12_4_ = auVar19._12_4_ * -fVar365;
      auVar45._16_4_ = auVar19._16_4_ * -fVar367;
      auVar45._20_4_ = auVar19._20_4_ * -fVar369;
      auVar45._24_4_ = auVar19._24_4_ * -fVar371;
      auVar45._28_4_ = auVar19._28_4_;
      auVar46._4_4_ = fVar234 * auVar104._4_4_;
      auVar46._0_4_ = fVar232 * auVar104._0_4_;
      auVar46._8_4_ = fVar257 * auVar104._8_4_;
      auVar46._12_4_ = fVar274 * auVar104._12_4_;
      auVar46._16_4_ = fVar291 * auVar104._16_4_;
      auVar46._20_4_ = fVar321 * auVar104._20_4_;
      auVar46._24_4_ = fVar15 * auVar104._24_4_;
      auVar46._28_4_ = auVar104._28_4_;
      auVar104 = vsubps_avx(auVar45,auVar46);
      auVar19 = vsubps_avx(auVar318,local_960);
      auVar47._4_4_ = fVar235 * auVar19._4_4_;
      auVar47._0_4_ = fVar189 * auVar19._0_4_;
      auVar47._8_4_ = fVar261 * auVar19._8_4_;
      auVar47._12_4_ = fVar278 * auVar19._12_4_;
      auVar47._16_4_ = fVar301 * auVar19._16_4_;
      auVar47._20_4_ = fVar322 * auVar19._20_4_;
      uVar1 = auVar19._28_4_;
      auVar47._24_4_ = fVar16 * auVar19._24_4_;
      auVar47._28_4_ = uVar1;
      auVar21 = vsubps_avx(auVar104,auVar47);
      auVar48._4_4_ = -fVar361 * fStack_63c;
      auVar48._0_4_ = -fVar356 * local_640;
      auVar48._8_4_ = -fVar363 * fStack_638;
      auVar48._12_4_ = -fVar365 * fStack_634;
      auVar48._16_4_ = -fVar367 * fStack_630;
      auVar48._20_4_ = -fVar369 * fStack_62c;
      auVar48._24_4_ = -fVar371 * fStack_628;
      auVar48._28_4_ = uVar9 ^ 0x80000000;
      auVar49._4_4_ = fStack_51c * fVar234;
      auVar49._0_4_ = local_520 * fVar232;
      auVar49._8_4_ = fStack_518 * fVar257;
      auVar49._12_4_ = fStack_514 * fVar274;
      auVar49._16_4_ = fStack_510 * fVar291;
      auVar49._20_4_ = fStack_50c * fVar321;
      auVar49._24_4_ = fStack_508 * fVar15;
      auVar49._28_4_ = uVar1;
      auVar104 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = fStack_4fc * fVar235;
      auVar50._0_4_ = local_500 * fVar189;
      auVar50._8_4_ = fStack_4f8 * fVar261;
      auVar50._12_4_ = fStack_4f4 * fVar278;
      auVar50._16_4_ = fStack_4f0 * fVar301;
      auVar50._20_4_ = fStack_4ec * fVar322;
      auVar50._24_4_ = fStack_4e8 * fVar16;
      auVar50._28_4_ = uVar1;
      auVar297._8_4_ = 0x3f800000;
      auVar297._0_8_ = &DAT_3f8000003f800000;
      auVar297._12_4_ = 0x3f800000;
      auVar297._16_4_ = 0x3f800000;
      auVar297._20_4_ = 0x3f800000;
      auVar297._24_4_ = 0x3f800000;
      auVar297._28_4_ = 0x3f800000;
      auVar139 = vsubps_avx(auVar104,auVar50);
      auVar104 = vrcpps_avx(auVar139);
      fVar232 = auVar104._0_4_;
      fVar189 = auVar104._4_4_;
      auVar51._4_4_ = auVar139._4_4_ * fVar189;
      auVar51._0_4_ = auVar139._0_4_ * fVar232;
      fVar233 = auVar104._8_4_;
      auVar51._8_4_ = auVar139._8_4_ * fVar233;
      fVar190 = auVar104._12_4_;
      auVar51._12_4_ = auVar139._12_4_ * fVar190;
      fVar234 = auVar104._16_4_;
      auVar51._16_4_ = auVar139._16_4_ * fVar234;
      fVar235 = auVar104._20_4_;
      auVar51._20_4_ = auVar139._20_4_ * fVar235;
      fVar236 = auVar104._24_4_;
      auVar51._24_4_ = auVar139._24_4_ * fVar236;
      auVar51._28_4_ = local_860._28_4_;
      auVar359 = vsubps_avx(auVar297,auVar51);
      auVar104 = vandps_avx(auVar139,auVar283);
      auVar19 = vcmpps_avx(auVar104,auVar358,1);
      auVar52._4_4_ = (fVar189 + fVar189 * auVar359._4_4_) * -auVar21._4_4_;
      auVar52._0_4_ = (fVar232 + fVar232 * auVar359._0_4_) * -auVar21._0_4_;
      auVar52._8_4_ = (fVar233 + fVar233 * auVar359._8_4_) * -auVar21._8_4_;
      auVar52._12_4_ = (fVar190 + fVar190 * auVar359._12_4_) * -auVar21._12_4_;
      auVar52._16_4_ = (fVar234 + fVar234 * auVar359._16_4_) * -auVar21._16_4_;
      auVar52._20_4_ = (fVar235 + fVar235 * auVar359._20_4_) * -auVar21._20_4_;
      auVar52._24_4_ = (fVar236 + fVar236 * auVar359._24_4_) * -auVar21._24_4_;
      auVar52._28_4_ = auVar21._28_4_ ^ 0x80000000;
      auVar104 = vcmpps_avx(auVar139,auVar318,1);
      auVar104 = vorps_avx(auVar19,auVar104);
      auVar104 = vblendvps_avx(auVar52,auVar330,auVar104);
      _local_5a0 = vmaxps_avx(auVar20,auVar104);
      auVar104 = vcmpps_avx(auVar139,ZEXT832(0) << 0x20,6);
      auVar104 = vorps_avx(auVar19,auVar104);
      auVar104 = vblendvps_avx(auVar52,auVar345,auVar104);
      auVar103 = vandps_avx(auVar103,local_3c0);
      local_460 = vminps_avx(auVar137,auVar104);
      auVar104 = vcmpps_avx(_local_5a0,local_460,2);
      auVar19 = auVar103 & auVar104;
      auVar20 = local_3c0;
      if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar19 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar19 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar19 >> 0x7f,0) == '\0') &&
            (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar19 >> 0xbf,0) == '\0') &&
          (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar19[0x1f])
      {
LAB_00eea455:
        auVar230 = ZEXT3264(auVar20);
        auVar250 = ZEXT3264(_local_820);
      }
      else {
        auVar137 = _local_5a0;
        auVar19 = vminps_avx(local_740,_local_780);
        auVar20 = vminps_avx(local_760,local_660);
        auVar19 = vminps_avx(auVar19,auVar20);
        auVar19 = vsubps_avx(auVar19,_local_540);
        auVar103 = vandps_avx(auVar104,auVar103);
        auVar79._4_4_ = local_4c0[1];
        auVar79._0_4_ = local_4c0[0];
        auVar79._8_4_ = local_4c0[2];
        auVar79._12_4_ = local_4c0[3];
        auVar79._16_4_ = fStack_4b0;
        auVar79._20_4_ = fStack_4ac;
        auVar79._24_4_ = fStack_4a8;
        auVar79._28_4_ = fStack_4a4;
        auVar104 = vminps_avx(auVar79,auVar297);
        auVar104 = vmaxps_avx(auVar104,ZEXT832(0) << 0x20);
        local_4c0[0] = fVar87 + fVar121 * (auVar104._0_4_ + 0.0) * 0.125;
        local_4c0[1] = fVar112 + fVar153 * (auVar104._4_4_ + 1.0) * 0.125;
        local_4c0[2] = fVar114 + fVar154 * (auVar104._8_4_ + 2.0) * 0.125;
        local_4c0[3] = fVar116 + fVar156 * (auVar104._12_4_ + 3.0) * 0.125;
        fStack_4b0 = fVar87 + fVar121 * (auVar104._16_4_ + 4.0) * 0.125;
        fStack_4ac = fVar112 + fVar153 * (auVar104._20_4_ + 5.0) * 0.125;
        fStack_4a8 = fVar114 + fVar154 * (auVar104._24_4_ + 6.0) * 0.125;
        fStack_4a4 = fVar116 + auVar104._28_4_ + 7.0;
        auVar78._4_4_ = local_4e0[1];
        auVar78._0_4_ = local_4e0[0];
        auVar78._8_4_ = local_4e0[2];
        auVar78._12_4_ = local_4e0[3];
        auVar78._16_4_ = fStack_4d0;
        auVar78._20_4_ = fStack_4cc;
        auVar78._24_4_ = fStack_4c8;
        auVar78._28_4_ = fStack_4c4;
        auVar104 = vminps_avx(auVar78,auVar297);
        auVar104 = vmaxps_avx(auVar104,ZEXT832(0) << 0x20);
        local_4e0[0] = fVar87 + fVar121 * (auVar104._0_4_ + 0.0) * 0.125;
        local_4e0[1] = fVar112 + fVar153 * (auVar104._4_4_ + 1.0) * 0.125;
        local_4e0[2] = fVar114 + fVar154 * (auVar104._8_4_ + 2.0) * 0.125;
        local_4e0[3] = fVar116 + fVar156 * (auVar104._12_4_ + 3.0) * 0.125;
        fStack_4d0 = fVar87 + fVar121 * (auVar104._16_4_ + 4.0) * 0.125;
        fStack_4cc = fVar112 + fVar153 * (auVar104._20_4_ + 5.0) * 0.125;
        fStack_4c8 = fVar114 + fVar154 * (auVar104._24_4_ + 6.0) * 0.125;
        fStack_4c4 = fVar116 + auVar104._28_4_ + 7.0;
        auVar53._4_4_ = auVar19._4_4_ * 0.99999976;
        auVar53._0_4_ = auVar19._0_4_ * 0.99999976;
        auVar53._8_4_ = auVar19._8_4_ * 0.99999976;
        auVar53._12_4_ = auVar19._12_4_ * 0.99999976;
        auVar53._16_4_ = auVar19._16_4_ * 0.99999976;
        auVar53._20_4_ = auVar19._20_4_ * 0.99999976;
        auVar53._24_4_ = auVar19._24_4_ * 0.99999976;
        auVar53._28_4_ = 0x3f7ffffc;
        auVar104 = vmaxps_avx(ZEXT832(0) << 0x20,auVar53);
        auVar54._4_4_ = auVar104._4_4_ * auVar104._4_4_;
        auVar54._0_4_ = auVar104._0_4_ * auVar104._0_4_;
        auVar54._8_4_ = auVar104._8_4_ * auVar104._8_4_;
        auVar54._12_4_ = auVar104._12_4_ * auVar104._12_4_;
        auVar54._16_4_ = auVar104._16_4_ * auVar104._16_4_;
        auVar54._20_4_ = auVar104._20_4_ * auVar104._20_4_;
        auVar54._24_4_ = auVar104._24_4_ * auVar104._24_4_;
        auVar54._28_4_ = auVar104._28_4_;
        auVar19 = vsubps_avx(_local_7a0,auVar54);
        auVar55._4_4_ = auVar19._4_4_ * (float)local_7e0._4_4_;
        auVar55._0_4_ = auVar19._0_4_ * (float)local_7e0._0_4_;
        auVar55._8_4_ = auVar19._8_4_ * fStack_7d8;
        auVar55._12_4_ = auVar19._12_4_ * fStack_7d4;
        auVar55._16_4_ = auVar19._16_4_ * fStack_7d0;
        auVar55._20_4_ = auVar19._20_4_ * fStack_7cc;
        auVar55._24_4_ = auVar19._24_4_ * fStack_7c8;
        auVar55._28_4_ = auVar104._28_4_;
        auVar20 = vsubps_avx(local_7c0,auVar55);
        _local_400 = ZEXT432(0) << 0x20;
        auVar104 = vcmpps_avx(auVar20,ZEXT832(0) << 0x20,5);
        if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar104 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar104 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar104 >> 0x7f,0) == '\0') &&
              (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar104 >> 0xbf,0) == '\0') &&
            (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar104[0x1f]) {
          auVar139 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_6a0 = ZEXT832(0) << 0x20;
          _local_680 = ZEXT832(0) << 0x20;
          auVar183 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar205._8_4_ = 0x7f800000;
          auVar205._0_8_ = 0x7f8000007f800000;
          auVar205._12_4_ = 0x7f800000;
          auVar205._16_4_ = 0x7f800000;
          auVar205._20_4_ = 0x7f800000;
          auVar205._24_4_ = 0x7f800000;
          auVar205._28_4_ = 0x7f800000;
          auVar223._8_4_ = 0xff800000;
          auVar223._0_8_ = 0xff800000ff800000;
          auVar223._12_4_ = 0xff800000;
          auVar223._16_4_ = 0xff800000;
          auVar223._20_4_ = 0xff800000;
          auVar223._24_4_ = 0xff800000;
          auVar223._28_4_ = 0xff800000;
        }
        else {
          local_960 = auVar19;
          local_9c0 = auVar104;
          _local_8c0 = auVar103;
          auVar139 = vsqrtps_avx(auVar20);
          auVar185._0_4_ = fVar113 + fVar113;
          auVar185._4_4_ = fVar115 + fVar115;
          auVar185._8_4_ = fVar117 + fVar117;
          auVar185._12_4_ = fVar118 + fVar118;
          auVar185._16_4_ = fVar119 + fVar119;
          auVar185._20_4_ = fVar120 + fVar120;
          auVar185._24_4_ = fVar320 + fVar320;
          auVar185._28_4_ = fVar214 + fVar214;
          auVar21 = vrcpps_avx(auVar185);
          fVar214 = auVar21._0_4_;
          fVar232 = auVar21._4_4_;
          auVar56._4_4_ = auVar185._4_4_ * fVar232;
          auVar56._0_4_ = auVar185._0_4_ * fVar214;
          fVar189 = auVar21._8_4_;
          auVar56._8_4_ = auVar185._8_4_ * fVar189;
          fVar233 = auVar21._12_4_;
          auVar56._12_4_ = auVar185._12_4_ * fVar233;
          fVar190 = auVar21._16_4_;
          auVar56._16_4_ = auVar185._16_4_ * fVar190;
          fVar234 = auVar21._20_4_;
          auVar56._20_4_ = auVar185._20_4_ * fVar234;
          fVar235 = auVar21._24_4_;
          auVar56._24_4_ = auVar185._24_4_ * fVar235;
          auVar56._28_4_ = auVar185._28_4_;
          auVar359 = vsubps_avx(auVar297,auVar56);
          fVar214 = fVar214 + fVar214 * auVar359._0_4_;
          fVar232 = fVar232 + fVar232 * auVar359._4_4_;
          fVar189 = fVar189 + fVar189 * auVar359._8_4_;
          fVar233 = fVar233 + fVar233 * auVar359._12_4_;
          fVar190 = fVar190 + fVar190 * auVar359._16_4_;
          fVar234 = fVar234 + fVar234 * auVar359._20_4_;
          fVar235 = fVar235 + fVar235 * auVar359._24_4_;
          fVar236 = auVar21._28_4_ + auVar359._28_4_;
          auVar224._0_8_ = local_580._0_8_ ^ 0x8000000080000000;
          auVar224._8_4_ = -local_580._8_4_;
          auVar224._12_4_ = -local_580._12_4_;
          auVar224._16_4_ = -local_580._16_4_;
          auVar224._20_4_ = -local_580._20_4_;
          auVar224._24_4_ = -local_580._24_4_;
          auVar224._28_4_ = -local_580._28_4_;
          auVar21 = vsubps_avx(auVar224,auVar139);
          fVar285 = auVar21._0_4_ * fVar214;
          fVar286 = auVar21._4_4_ * fVar232;
          auVar57._4_4_ = fVar286;
          auVar57._0_4_ = fVar285;
          fVar291 = auVar21._8_4_ * fVar189;
          auVar57._8_4_ = fVar291;
          fVar301 = auVar21._12_4_ * fVar233;
          auVar57._12_4_ = fVar301;
          fVar303 = auVar21._16_4_ * fVar190;
          auVar57._16_4_ = fVar303;
          fVar305 = auVar21._20_4_ * fVar234;
          auVar57._20_4_ = fVar305;
          fVar321 = auVar21._24_4_ * fVar235;
          auVar57._24_4_ = fVar321;
          auVar57._28_4_ = 0x219392ef;
          auVar139 = vsubps_avx(auVar139,local_580);
          fVar214 = auVar139._0_4_ * fVar214;
          fVar232 = auVar139._4_4_ * fVar232;
          auVar58._4_4_ = fVar232;
          auVar58._0_4_ = fVar214;
          fVar189 = auVar139._8_4_ * fVar189;
          auVar58._8_4_ = fVar189;
          fVar233 = auVar139._12_4_ * fVar233;
          auVar58._12_4_ = fVar233;
          fVar190 = auVar139._16_4_ * fVar190;
          auVar58._16_4_ = fVar190;
          fVar234 = auVar139._20_4_ * fVar234;
          auVar58._20_4_ = fVar234;
          fVar235 = auVar139._24_4_ * fVar235;
          auVar58._24_4_ = fVar235;
          auVar58._28_4_ = 0x7f800000;
          auVar346 = ZEXT3264(auVar58);
          fVar327 = fVar239 * (fVar285 * fVar292 + local_6e0._0_4_);
          fVar257 = fVar237 * (fVar286 * fVar302 + local_6e0._4_4_);
          fVar261 = fVar266 * (fVar291 * fVar304 + local_6e0._8_4_);
          fVar262 = fVar287 * (fVar301 * fVar306 + local_6e0._12_4_);
          fVar265 = fVar307 * (fVar303 * fVar308 + local_6e0._16_4_);
          fVar274 = fVar354 * (fVar305 * fVar310 + local_6e0._20_4_);
          fVar278 = fVar238 * (fVar321 * fVar312 + local_6e0._24_4_);
          auVar140._0_4_ = local_a80 + fVar188 * fVar327;
          auVar140._4_4_ = fStack_a7c + fVar260 * fVar257;
          auVar140._8_4_ = fStack_a78 + fVar256 * fVar261;
          auVar140._12_4_ = fStack_a74 + fVar273 * fVar262;
          auVar140._16_4_ = fStack_a70 + fVar290 * fVar265;
          auVar140._20_4_ = fStack_a6c + fVar313 * fVar274;
          auVar140._24_4_ = fStack_a68 + fVar14 * fVar278;
          auVar140._28_4_ = fStack_a64 + auVar139._28_4_ + local_6e0._28_4_;
          auVar59._4_4_ = fStack_4fc * fVar286;
          auVar59._0_4_ = local_500 * fVar285;
          auVar59._8_4_ = fStack_4f8 * fVar291;
          auVar59._12_4_ = fStack_4f4 * fVar301;
          auVar59._16_4_ = fStack_4f0 * fVar303;
          auVar59._20_4_ = fStack_4ec * fVar305;
          auVar59._24_4_ = fStack_4e8 * fVar321;
          auVar59._28_4_ = fVar236;
          auVar139 = vsubps_avx(auVar59,auVar140);
          local_8e0 = auVar139;
          auVar186._0_4_ = local_ac0 + fVar176 * fVar327;
          auVar186._4_4_ = fStack_abc + fVar251 * fVar257;
          auVar186._8_4_ = fStack_ab8 + fVar252 * fVar261;
          auVar186._12_4_ = fStack_ab4 + fVar269 * fVar262;
          auVar186._16_4_ = fStack_ab0 + fVar288 * fVar265;
          auVar186._20_4_ = fStack_aac + fVar309 * fVar274;
          auVar186._24_4_ = fStack_aa8 + fVar12 * fVar278;
          auVar186._28_4_ = fStack_aa4 + fVar236;
          auVar60._4_4_ = fStack_51c * fVar286;
          auVar60._0_4_ = local_520 * fVar285;
          auVar60._8_4_ = fStack_518 * fVar291;
          auVar60._12_4_ = fStack_514 * fVar301;
          auVar60._16_4_ = fStack_510 * fVar303;
          auVar60._20_4_ = fStack_50c * fVar305;
          auVar60._24_4_ = fStack_508 * fVar321;
          auVar60._28_4_ = fVar116;
          local_a00 = vsubps_avx(auVar60,auVar186);
          auVar225._0_4_ = local_aa0 + fVar231 * fVar327;
          auVar225._4_4_ = fStack_a9c + fVar255 * fVar257;
          auVar225._8_4_ = fStack_a98 + fVar253 * fVar261;
          auVar225._12_4_ = fStack_a94 + fVar270 * fVar262;
          auVar225._16_4_ = fStack_a90 + fVar289 * fVar265;
          auVar225._20_4_ = fStack_a8c + fVar311 * fVar274;
          auVar225._24_4_ = fStack_a88 + fVar13 * fVar278;
          auVar225._28_4_ = fStack_a84 + auVar21._28_4_;
          auVar61._4_4_ = fStack_63c * fVar286;
          auVar61._0_4_ = local_640 * fVar285;
          auVar61._8_4_ = fStack_638 * fVar291;
          auVar61._12_4_ = fStack_634 * fVar301;
          auVar61._16_4_ = fStack_630 * fVar303;
          auVar61._20_4_ = fStack_62c * fVar305;
          auVar61._24_4_ = fStack_628 * fVar321;
          auVar61._28_4_ = fVar116;
          local_840 = vsubps_avx(auVar61,auVar225);
          fVar239 = fVar239 * (fVar214 * fVar292 + local_6e0._0_4_);
          fVar237 = fVar237 * (fVar232 * fVar302 + local_6e0._4_4_);
          fVar266 = fVar266 * (fVar189 * fVar304 + local_6e0._8_4_);
          fVar287 = fVar287 * (fVar233 * fVar306 + local_6e0._12_4_);
          fVar307 = fVar307 * (fVar190 * fVar308 + local_6e0._16_4_);
          fVar354 = fVar354 * (fVar234 * fVar310 + local_6e0._20_4_);
          fVar238 = fVar238 * (fVar235 * fVar312 + local_6e0._24_4_);
          auVar248._0_4_ = local_a80 + fVar188 * fVar239;
          auVar248._4_4_ = fStack_a7c + fVar260 * fVar237;
          auVar248._8_4_ = fStack_a78 + fVar256 * fVar266;
          auVar248._12_4_ = fStack_a74 + fVar273 * fVar287;
          auVar248._16_4_ = fStack_a70 + fVar290 * fVar307;
          auVar248._20_4_ = fStack_a6c + fVar313 * fVar354;
          auVar248._24_4_ = fStack_a68 + fVar14 * fVar238;
          auVar248._28_4_ = fStack_a64 + fVar116;
          auVar62._4_4_ = fStack_4fc * fVar232;
          auVar62._0_4_ = local_500 * fVar214;
          auVar62._8_4_ = fStack_4f8 * fVar189;
          auVar62._12_4_ = fStack_4f4 * fVar233;
          auVar62._16_4_ = fStack_4f0 * fVar190;
          auVar62._20_4_ = fStack_4ec * fVar234;
          auVar62._24_4_ = fStack_4e8 * fVar235;
          auVar62._28_4_ = fStack_4e4;
          _local_400 = vsubps_avx(auVar62,auVar248);
          auVar249._0_4_ = local_ac0 + fVar176 * fVar239;
          auVar249._4_4_ = fStack_abc + fVar251 * fVar237;
          auVar249._8_4_ = fStack_ab8 + fVar252 * fVar266;
          auVar249._12_4_ = fStack_ab4 + fVar269 * fVar287;
          auVar249._16_4_ = fStack_ab0 + fVar288 * fVar307;
          auVar249._20_4_ = fStack_aac + fVar309 * fVar354;
          auVar249._24_4_ = fStack_aa8 + fVar12 * fVar238;
          auVar249._28_4_ = fStack_aa4 + local_400._28_4_;
          auVar63._4_4_ = fStack_51c * fVar232;
          auVar63._0_4_ = local_520 * fVar214;
          auVar63._8_4_ = fStack_518 * fVar189;
          auVar63._12_4_ = fStack_514 * fVar233;
          auVar63._16_4_ = fStack_510 * fVar190;
          auVar63._20_4_ = fStack_50c * fVar234;
          auVar63._24_4_ = fStack_508 * fVar235;
          auVar63._28_4_ = fStack_4e4;
          _local_6a0 = vsubps_avx(auVar63,auVar249);
          auVar226._0_4_ = local_aa0 + fVar231 * fVar239;
          auVar226._4_4_ = fStack_a9c + fVar255 * fVar237;
          auVar226._8_4_ = fStack_a98 + fVar253 * fVar266;
          auVar226._12_4_ = fStack_a94 + fVar270 * fVar287;
          auVar226._16_4_ = fStack_a90 + fVar289 * fVar307;
          auVar226._20_4_ = fStack_a8c + fVar311 * fVar354;
          auVar226._24_4_ = fStack_a88 + fVar13 * fVar238;
          auVar226._28_4_ = fStack_a84 + local_840._28_4_ + local_6e0._28_4_;
          auVar64._4_4_ = fStack_63c * fVar232;
          auVar64._0_4_ = local_640 * fVar214;
          auVar64._8_4_ = fStack_638 * fVar189;
          auVar64._12_4_ = fStack_634 * fVar233;
          auVar64._16_4_ = fStack_630 * fVar190;
          auVar64._20_4_ = fStack_62c * fVar234;
          auVar64._24_4_ = fStack_628 * fVar235;
          auVar64._28_4_ = local_6a0._28_4_;
          _local_680 = vsubps_avx(auVar64,auVar226);
          auVar21 = vcmpps_avx(auVar20,_DAT_02020f00,5);
          auVar206._8_4_ = 0x7f800000;
          auVar206._0_8_ = 0x7f8000007f800000;
          auVar206._12_4_ = 0x7f800000;
          auVar206._16_4_ = 0x7f800000;
          auVar206._20_4_ = 0x7f800000;
          auVar206._24_4_ = 0x7f800000;
          auVar206._28_4_ = 0x7f800000;
          auVar205 = vblendvps_avx(auVar206,auVar57,auVar21);
          auVar298._8_4_ = 0x7fffffff;
          auVar298._0_8_ = 0x7fffffff7fffffff;
          auVar298._12_4_ = 0x7fffffff;
          auVar298._16_4_ = 0x7fffffff;
          auVar298._20_4_ = 0x7fffffff;
          auVar298._24_4_ = 0x7fffffff;
          auVar298._28_4_ = 0x7fffffff;
          auVar20 = vandps_avx(auVar298,local_5e0);
          auVar20 = vmaxps_avx(local_3e0,auVar20);
          auVar65._4_4_ = auVar20._4_4_ * 1.9073486e-06;
          auVar65._0_4_ = auVar20._0_4_ * 1.9073486e-06;
          auVar65._8_4_ = auVar20._8_4_ * 1.9073486e-06;
          auVar65._12_4_ = auVar20._12_4_ * 1.9073486e-06;
          auVar65._16_4_ = auVar20._16_4_ * 1.9073486e-06;
          auVar65._20_4_ = auVar20._20_4_ * 1.9073486e-06;
          auVar65._24_4_ = auVar20._24_4_ * 1.9073486e-06;
          auVar65._28_4_ = auVar20._28_4_;
          auVar20 = vandps_avx(auVar298,_local_6c0);
          auVar20 = vcmpps_avx(auVar20,auVar65,1);
          auVar227._8_4_ = 0xff800000;
          auVar227._0_8_ = 0xff800000ff800000;
          auVar227._12_4_ = 0xff800000;
          auVar227._16_4_ = 0xff800000;
          auVar227._20_4_ = 0xff800000;
          auVar227._24_4_ = 0xff800000;
          auVar227._28_4_ = 0xff800000;
          auVar223 = vblendvps_avx(auVar227,auVar58,auVar21);
          auVar359 = auVar21 & auVar20;
          if ((((((((auVar359 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar359 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar359 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar359 >> 0x7f,0) != '\0') ||
                (auVar359 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar359 >> 0xbf,0) != '\0') ||
              (auVar359 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar359[0x1f] < '\0') {
            auVar104 = vandps_avx(auVar20,auVar21);
            auVar129 = vpackssdw_avx(auVar104._0_16_,auVar104._16_16_);
            auVar359 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar20 = vcmpps_avx(auVar19,auVar359,2);
            auVar373._8_4_ = 0xff800000;
            auVar373._0_8_ = 0xff800000ff800000;
            auVar373._12_4_ = 0xff800000;
            auVar373._16_4_ = 0xff800000;
            auVar373._20_4_ = 0xff800000;
            auVar373._24_4_ = 0xff800000;
            auVar373._28_4_ = 0xff800000;
            auVar374._8_4_ = 0x7f800000;
            auVar374._0_8_ = 0x7f8000007f800000;
            auVar374._12_4_ = 0x7f800000;
            auVar374._16_4_ = 0x7f800000;
            auVar374._20_4_ = 0x7f800000;
            auVar374._24_4_ = 0x7f800000;
            auVar374._28_4_ = 0x7f800000;
            auVar19 = vblendvps_avx(auVar374,auVar373,auVar20);
            auVar94 = vpmovsxwd_avx(auVar129);
            auVar346 = ZEXT1664(auVar94);
            auVar129 = vpunpckhwd_avx(auVar129,auVar129);
            auVar300._16_16_ = auVar129;
            auVar300._0_16_ = auVar94;
            auVar205 = vblendvps_avx(auVar205,auVar19,auVar300);
            auVar19 = vblendvps_avx(auVar373,auVar374,auVar20);
            auVar223 = vblendvps_avx(auVar223,auVar19,auVar300);
            auVar19 = vcmpps_avx(auVar359,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar111._0_4_ = auVar19._0_4_ ^ auVar104._0_4_;
            auVar111._4_4_ = auVar19._4_4_ ^ auVar104._4_4_;
            auVar111._8_4_ = auVar19._8_4_ ^ auVar104._8_4_;
            auVar111._12_4_ = auVar19._12_4_ ^ auVar104._12_4_;
            auVar111._16_4_ = auVar19._16_4_ ^ auVar104._16_4_;
            auVar111._20_4_ = auVar19._20_4_ ^ auVar104._20_4_;
            auVar111._24_4_ = auVar19._24_4_ ^ auVar104._24_4_;
            auVar111._28_4_ = auVar19._28_4_ ^ auVar104._28_4_;
            auVar104 = vorps_avx(auVar20,auVar111);
            auVar104 = vandps_avx(auVar21,auVar104);
          }
          auVar183 = local_a00._0_28_;
          auVar319 = ZEXT3264(local_840);
        }
        local_780._0_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
        fVar214 = (ray->super_RayK<1>).dir.field_0.m128[1];
        local_7c0._4_4_ = fVar214;
        local_7c0._0_4_ = fVar214;
        local_7c0._8_4_ = fVar214;
        local_7c0._12_4_ = fVar214;
        local_7c0._16_4_ = fVar214;
        local_7c0._20_4_ = fVar214;
        local_7c0._24_4_ = fVar214;
        local_7c0._28_4_ = fVar214;
        auVar326 = ZEXT3264(local_7c0);
        fVar176 = (ray->super_RayK<1>).dir.field_0.m128[2];
        local_6c0._4_4_ = fVar176;
        local_6c0._0_4_ = fVar176;
        fStack_6b8 = fVar176;
        fStack_6b4 = fVar176;
        fStack_6b0 = fVar176;
        fStack_6ac = fVar176;
        fStack_6a8 = fVar176;
        fStack_6a4 = fVar176;
        auVar331 = ZEXT3264(_local_6c0);
        local_440 = _local_5a0;
        local_420 = vminps_avx(local_460,auVar205);
        _local_7a0 = vmaxps_avx(_local_5a0,auVar223);
        _local_480 = _local_7a0;
        auVar19 = vcmpps_avx(_local_5a0,local_420,2);
        local_560 = vandps_avx(auVar19,auVar103);
        local_600 = local_560;
        auVar19 = vcmpps_avx(_local_7a0,local_460,2);
        _local_7e0 = vandps_avx(auVar19,auVar103);
        local_620 = _local_7e0;
        auVar103 = vorps_avx(_local_7e0,local_560);
        auVar20 = _local_7a0;
        if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar103 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar103 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar103 >> 0x7f,0) == '\0') &&
              (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar103 >> 0xbf,0) == '\0') &&
            (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar103[0x1f]) goto LAB_00eea455;
        auVar103 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
        local_5c0._0_4_ = auVar104._0_4_ ^ auVar103._0_4_;
        local_5c0._4_4_ = auVar104._4_4_ ^ auVar103._4_4_;
        local_5c0._8_4_ = auVar104._8_4_ ^ auVar103._8_4_;
        local_5c0._12_4_ = auVar104._12_4_ ^ auVar103._12_4_;
        local_5c0._16_4_ = auVar104._16_4_ ^ auVar103._16_4_;
        local_5c0._20_4_ = auVar104._20_4_ ^ auVar103._20_4_;
        local_5c0._24_4_ = auVar104._24_4_ ^ auVar103._24_4_;
        local_5c0._28_4_ = (uint)auVar104._28_4_ ^ (uint)auVar103._28_4_;
        auVar346 = ZEXT3264(local_5c0);
        auVar106._0_4_ =
             (float)local_780._0_4_ * auVar139._0_4_ +
             fVar214 * auVar183._0_4_ + auVar319._0_4_ * fVar176;
        auVar106._4_4_ =
             (float)local_780._0_4_ * auVar139._4_4_ +
             fVar214 * auVar183._4_4_ + auVar319._4_4_ * fVar176;
        auVar106._8_4_ =
             (float)local_780._0_4_ * auVar139._8_4_ +
             fVar214 * auVar183._8_4_ + auVar319._8_4_ * fVar176;
        auVar106._12_4_ =
             (float)local_780._0_4_ * auVar139._12_4_ +
             fVar214 * auVar183._12_4_ + auVar319._12_4_ * fVar176;
        auVar106._16_4_ =
             (float)local_780._0_4_ * auVar139._16_4_ +
             fVar214 * auVar183._16_4_ + auVar319._16_4_ * fVar176;
        auVar106._20_4_ =
             (float)local_780._0_4_ * auVar139._20_4_ +
             fVar214 * auVar183._20_4_ + auVar319._20_4_ * fVar176;
        auVar106._24_4_ =
             (float)local_780._0_4_ * auVar139._24_4_ +
             fVar214 * auVar183._24_4_ + auVar319._24_4_ * fVar176;
        auVar106._28_4_ = auVar104._28_4_ + auVar139._28_4_ + auVar103._28_4_;
        auVar142._8_4_ = 0x7fffffff;
        auVar142._0_8_ = 0x7fffffff7fffffff;
        auVar142._12_4_ = 0x7fffffff;
        auVar142._16_4_ = 0x7fffffff;
        auVar142._20_4_ = 0x7fffffff;
        auVar142._24_4_ = 0x7fffffff;
        auVar142._28_4_ = 0x7fffffff;
        auVar103 = vandps_avx(auVar106,auVar142);
        auVar143._8_4_ = 0x3e99999a;
        auVar143._0_8_ = 0x3e99999a3e99999a;
        auVar143._12_4_ = 0x3e99999a;
        auVar143._16_4_ = 0x3e99999a;
        auVar143._20_4_ = 0x3e99999a;
        auVar143._24_4_ = 0x3e99999a;
        auVar143._28_4_ = 0x3e99999a;
        auVar103 = vcmpps_avx(auVar103,auVar143,1);
        auVar103 = vorps_avx(local_5c0,auVar103);
        auVar144._8_4_ = 3;
        auVar144._0_8_ = 0x300000003;
        auVar144._12_4_ = 3;
        auVar144._16_4_ = 3;
        auVar144._20_4_ = 3;
        auVar144._24_4_ = 3;
        auVar144._28_4_ = 3;
        auVar172._8_4_ = 2;
        auVar172._0_8_ = 0x200000002;
        auVar172._12_4_ = 2;
        auVar172._16_4_ = 2;
        auVar172._20_4_ = 2;
        auVar172._24_4_ = 2;
        auVar172._28_4_ = 2;
        auVar103 = vblendvps_avx(auVar172,auVar144,auVar103);
        local_6e0 = ZEXT432((uint)uVar83);
        auVar94 = vpshufd_avx(ZEXT416((uint)uVar83),0);
        auVar129 = vpcmpgtd_avx(auVar103._16_16_,auVar94);
        local_5e0._0_16_ = auVar94;
        auVar94 = vpcmpgtd_avx(auVar103._0_16_,auVar94);
        auVar145._16_16_ = auVar129;
        auVar145._0_16_ = auVar94;
        auVar103 = vblendps_avx(ZEXT1632(auVar94),auVar145,0xf0);
        local_600 = vandnps_avx(auVar103,local_560);
        local_580 = auVar103;
        auVar104 = local_560 & ~auVar103;
        auVar230 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
        local_660._0_8_ = uVar83;
        local_780._4_4_ = local_780._0_4_;
        fStack_778 = (float)local_780._0_4_;
        fStack_774 = (float)local_780._0_4_;
        fStack_770 = (float)local_780._0_4_;
        fStack_76c = (float)local_780._0_4_;
        fStack_768 = (float)local_780._0_4_;
        local_860 = auVar22;
        if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar104 >> 0x7f,0) != '\0') ||
              (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar104 >> 0xbf,0) != '\0') ||
            (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar104[0x1f] < '\0') {
          local_540._4_4_ = (float)local_5a0._4_4_ + (float)local_820._4_4_;
          local_540._0_4_ = (float)local_5a0._0_4_ + (float)local_820._0_4_;
          fStack_538 = fStack_598 + fStack_818;
          fStack_534 = fStack_594 + fStack_814;
          fStack_530 = fStack_590 + fStack_810;
          fStack_52c = fStack_58c + fStack_80c;
          fStack_528 = fStack_588 + fStack_808;
          fStack_524 = fStack_584 + fStack_804;
          fStack_764 = (float)local_780._0_4_;
          _local_5a0 = auVar137;
          do {
            auVar194 = auVar230._0_16_;
            auVar146._8_4_ = 0x7f800000;
            auVar146._0_8_ = 0x7f8000007f800000;
            auVar146._12_4_ = 0x7f800000;
            auVar146._16_4_ = 0x7f800000;
            auVar146._20_4_ = 0x7f800000;
            auVar146._24_4_ = 0x7f800000;
            auVar146._28_4_ = 0x7f800000;
            auVar103 = vblendvps_avx(auVar146,_local_5a0,local_600);
            auVar104 = vshufps_avx(auVar103,auVar103,0xb1);
            auVar104 = vminps_avx(auVar103,auVar104);
            auVar19 = vshufpd_avx(auVar104,auVar104,5);
            auVar104 = vminps_avx(auVar104,auVar19);
            auVar19 = vperm2f128_avx(auVar104,auVar104,1);
            auVar104 = vminps_avx(auVar104,auVar19);
            auVar104 = vcmpps_avx(auVar103,auVar104,0);
            auVar19 = local_600 & auVar104;
            auVar103 = local_600;
            if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar19 >> 0x7f,0) != '\0') ||
                  (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar19 >> 0xbf,0) != '\0') ||
                (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar19[0x1f] < '\0') {
              auVar103 = vandps_avx(auVar104,local_600);
            }
            uVar84 = vmovmskps_avx(auVar103);
            uVar9 = 0;
            if (uVar84 != 0) {
              for (; (uVar84 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
              }
            }
            uVar83 = (ulong)uVar9;
            *(undefined4 *)(local_600 + uVar83 * 4) = 0;
            aVar5 = (ray->super_RayK<1>).dir.field_0;
            _local_8c0 = (undefined1  [16])aVar5;
            auVar129 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
            local_aa0 = local_4c0[uVar83];
            auVar326 = ZEXT464((uint)local_aa0);
            local_ac0 = *(float *)(local_440 + uVar83 * 4);
            auVar346 = ZEXT464((uint)local_ac0);
            if (auVar129._0_4_ < 0.0) {
              fStack_a9c = 0.0;
              fStack_a98 = 0.0;
              fStack_a94 = 0.0;
              fStack_abc = 0.0;
              fStack_ab8 = 0.0;
              fStack_ab4 = 0.0;
              fVar214 = sqrtf(auVar129._0_4_);
              auVar346 = ZEXT1664(CONCAT412(fStack_ab4,
                                            CONCAT48(fStack_ab8,CONCAT44(fStack_abc,local_ac0))));
              auVar326 = ZEXT1664(CONCAT412(fStack_a94,
                                            CONCAT48(fStack_a98,CONCAT44(fStack_a9c,local_aa0))));
              auVar194._8_4_ = 0x7fffffff;
              auVar194._0_8_ = 0x7fffffff7fffffff;
              auVar194._12_4_ = 0x7fffffff;
            }
            else {
              auVar129 = vsqrtss_avx(auVar129,auVar129);
              fVar214 = auVar129._0_4_;
            }
            auVar94 = vminps_avx(_local_970,_local_990);
            auVar129 = vmaxps_avx(_local_970,_local_990);
            auVar161 = vminps_avx(_local_980,_local_9a0);
            auVar125 = vminps_avx(auVar94,auVar161);
            auVar94 = vmaxps_avx(_local_980,_local_9a0);
            auVar161 = vmaxps_avx(auVar129,auVar94);
            auVar129 = vandps_avx(auVar125,auVar194);
            auVar94 = vandps_avx(auVar161,auVar194);
            auVar129 = vmaxps_avx(auVar129,auVar94);
            auVar94 = vmovshdup_avx(auVar129);
            auVar94 = vmaxss_avx(auVar94,auVar129);
            auVar129 = vshufpd_avx(auVar129,auVar129,1);
            auVar129 = vmaxss_avx(auVar129,auVar94);
            local_8e0._0_4_ = auVar129._0_4_ * 1.9073486e-06;
            local_860._0_4_ = fVar214 * 1.9073486e-06;
            local_760._0_16_ = vshufps_avx(auVar161,auVar161,0xff);
            lVar80 = 4;
            do {
              local_aa0 = auVar326._0_4_;
              fVar189 = 1.0 - local_aa0;
              fVar214 = fVar189 * fVar189;
              fVar176 = fVar189 * fVar214;
              fVar231 = local_aa0 * local_aa0;
              fVar188 = local_aa0 * fVar231;
              fVar232 = local_aa0 * fVar189;
              local_a00._0_4_ = fVar232;
              auVar129 = vshufps_avx(ZEXT416((uint)(fVar188 * 0.16666667)),
                                     ZEXT416((uint)(fVar188 * 0.16666667)),0);
              auVar94 = ZEXT416((uint)((fVar188 * 4.0 + fVar176 +
                                       local_aa0 * fVar232 * 12.0 + fVar189 * fVar232 * 6.0) *
                                      0.16666667));
              auVar94 = vshufps_avx(auVar94,auVar94,0);
              auVar161 = ZEXT416((uint)((fVar176 * 4.0 + fVar188 +
                                        fVar189 * fVar232 * 12.0 + local_aa0 * fVar232 * 6.0) *
                                       0.16666667));
              auVar161 = vshufps_avx(auVar161,auVar161,0);
              auVar342 = auVar346._0_16_;
              auVar125 = vshufps_avx(auVar342,auVar342,0);
              auVar162._0_4_ = auVar125._0_4_ * (float)local_8c0._0_4_ + 0.0;
              auVar162._4_4_ = auVar125._4_4_ * (float)local_8c0._4_4_ + 0.0;
              auVar162._8_4_ = auVar125._8_4_ * fStack_8b8 + 0.0;
              auVar162._12_4_ = auVar125._12_4_ * fStack_8b4 + 0.0;
              auVar125 = vshufps_avx(ZEXT416((uint)(fVar176 * 0.16666667)),
                                     ZEXT416((uint)(fVar176 * 0.16666667)),0);
              auVar92._0_4_ =
                   auVar125._0_4_ * (float)local_970._0_4_ +
                   auVar161._0_4_ * (float)local_990._0_4_ +
                   auVar129._0_4_ * (float)local_9a0._0_4_ + auVar94._0_4_ * (float)local_980._0_4_;
              auVar92._4_4_ =
                   auVar125._4_4_ * (float)local_970._4_4_ +
                   auVar161._4_4_ * (float)local_990._4_4_ +
                   auVar129._4_4_ * (float)local_9a0._4_4_ + auVar94._4_4_ * (float)local_980._4_4_;
              auVar92._8_4_ =
                   auVar125._8_4_ * fStack_968 +
                   auVar161._8_4_ * fStack_988 +
                   auVar129._8_4_ * fStack_998 + auVar94._8_4_ * fStack_978;
              auVar92._12_4_ =
                   auVar125._12_4_ * fStack_964 +
                   auVar161._12_4_ * fStack_984 +
                   auVar129._12_4_ * fStack_994 + auVar94._12_4_ * fStack_974;
              local_840._0_16_ = auVar92;
              auVar129 = vsubps_avx(auVar162,auVar92);
              _local_a60 = auVar129;
              auVar129 = vdpps_avx(auVar129,auVar129,0x7f);
              local_a80 = auVar129._0_4_;
              auVar323 = auVar326._0_16_;
              fStack_a9c = auVar326._4_4_;
              fStack_a98 = auVar326._8_4_;
              fStack_a94 = auVar326._12_4_;
              local_ac0 = auVar346._0_4_;
              fStack_abc = auVar346._4_4_;
              fStack_ab8 = auVar346._8_4_;
              fStack_ab4 = auVar346._12_4_;
              fStack_a7c = auVar129._4_4_;
              fStack_a78 = auVar129._8_4_;
              fStack_a74 = auVar129._12_4_;
              if (local_a80 < 0.0) {
                local_9c0._0_16_ = ZEXT416((uint)fVar189);
                local_960._0_4_ = fVar231;
                local_9e0._0_4_ = fVar214;
                fVar176 = sqrtf(local_a80);
                auVar342._4_4_ = fStack_abc;
                auVar342._0_4_ = local_ac0;
                auVar342._8_4_ = fStack_ab8;
                auVar342._12_4_ = fStack_ab4;
                auVar323._4_4_ = fStack_a9c;
                auVar323._0_4_ = local_aa0;
                auVar323._8_4_ = fStack_a98;
                auVar323._12_4_ = fStack_a94;
                fVar214 = (float)local_9e0._0_4_;
                fVar231 = (float)local_960._0_4_;
                auVar129 = local_9c0._0_16_;
              }
              else {
                auVar129 = vsqrtss_avx(auVar129,auVar129);
                fVar176 = auVar129._0_4_;
                auVar129 = ZEXT416((uint)fVar189);
              }
              fVar232 = auVar129._0_4_;
              fVar188 = auVar323._0_4_;
              auVar94 = vshufps_avx(ZEXT416((uint)(fVar231 * 0.5)),ZEXT416((uint)(fVar231 * 0.5)),0)
              ;
              auVar161 = ZEXT416((uint)((fVar214 + (float)local_a00._0_4_ * 4.0) * 0.5));
              auVar161 = vshufps_avx(auVar161,auVar161,0);
              auVar125 = ZEXT416((uint)((fVar188 * -fVar188 - (float)local_a00._0_4_ * 4.0) * 0.5));
              auVar125 = vshufps_avx(auVar125,auVar125,0);
              auVar93 = ZEXT416((uint)(fVar232 * -fVar232 * 0.5));
              auVar93 = vshufps_avx(auVar93,auVar93,0);
              auVar316._0_4_ =
                   (float)local_970._0_4_ * auVar93._0_4_ +
                   (float)local_990._0_4_ * auVar125._0_4_ +
                   (float)local_9a0._0_4_ * auVar94._0_4_ + (float)local_980._0_4_ * auVar161._0_4_;
              auVar316._4_4_ =
                   (float)local_970._4_4_ * auVar93._4_4_ +
                   (float)local_990._4_4_ * auVar125._4_4_ +
                   (float)local_9a0._4_4_ * auVar94._4_4_ + (float)local_980._4_4_ * auVar161._4_4_;
              auVar316._8_4_ =
                   fStack_968 * auVar93._8_4_ +
                   fStack_988 * auVar125._8_4_ +
                   fStack_998 * auVar94._8_4_ + fStack_978 * auVar161._8_4_;
              auVar316._12_4_ =
                   fStack_964 * auVar93._12_4_ +
                   fStack_984 * auVar125._12_4_ +
                   fStack_994 * auVar94._12_4_ + fStack_974 * auVar161._12_4_;
              auVar161 = vshufps_avx(auVar323,auVar323,0);
              auVar94 = ZEXT416((uint)(fVar232 - (fVar188 + fVar188)));
              auVar125 = vshufps_avx(auVar94,auVar94,0);
              auVar94 = ZEXT416((uint)(fVar188 - (fVar232 + fVar232)));
              auVar93 = vshufps_avx(auVar94,auVar94,0);
              auVar129 = vshufps_avx(auVar129,auVar129,0);
              auVar94 = vdpps_avx(auVar316,auVar316,0x7f);
              auVar126._0_4_ =
                   (float)local_970._0_4_ * auVar129._0_4_ +
                   (float)local_990._0_4_ * auVar93._0_4_ +
                   (float)local_9a0._0_4_ * auVar161._0_4_ + (float)local_980._0_4_ * auVar125._0_4_
              ;
              auVar126._4_4_ =
                   (float)local_970._4_4_ * auVar129._4_4_ +
                   (float)local_990._4_4_ * auVar93._4_4_ +
                   (float)local_9a0._4_4_ * auVar161._4_4_ + (float)local_980._4_4_ * auVar125._4_4_
              ;
              auVar126._8_4_ =
                   fStack_968 * auVar129._8_4_ +
                   fStack_988 * auVar93._8_4_ +
                   fStack_998 * auVar161._8_4_ + fStack_978 * auVar125._8_4_;
              auVar126._12_4_ =
                   fStack_964 * auVar129._12_4_ +
                   fStack_984 * auVar93._12_4_ +
                   fStack_994 * auVar161._12_4_ + fStack_974 * auVar125._12_4_;
              auVar129 = vblendps_avx(auVar94,_DAT_01feba10,0xe);
              auVar161 = vrsqrtss_avx(auVar129,auVar129);
              fVar231 = auVar161._0_4_;
              fVar214 = auVar94._0_4_;
              auVar161 = vdpps_avx(auVar316,auVar126,0x7f);
              auVar125 = vshufps_avx(auVar94,auVar94,0);
              auVar127._0_4_ = auVar126._0_4_ * auVar125._0_4_;
              auVar127._4_4_ = auVar126._4_4_ * auVar125._4_4_;
              auVar127._8_4_ = auVar126._8_4_ * auVar125._8_4_;
              auVar127._12_4_ = auVar126._12_4_ * auVar125._12_4_;
              auVar161 = vshufps_avx(auVar161,auVar161,0);
              auVar195._0_4_ = auVar316._0_4_ * auVar161._0_4_;
              auVar195._4_4_ = auVar316._4_4_ * auVar161._4_4_;
              auVar195._8_4_ = auVar316._8_4_ * auVar161._8_4_;
              auVar195._12_4_ = auVar316._12_4_ * auVar161._12_4_;
              auVar93 = vsubps_avx(auVar127,auVar195);
              auVar161 = vrcpss_avx(auVar129,auVar129);
              auVar129 = vmaxss_avx(ZEXT416((uint)local_8e0._0_4_),
                                    ZEXT416((uint)(auVar342._0_4_ * (float)local_860._0_4_)));
              auVar161 = ZEXT416((uint)(auVar161._0_4_ * (2.0 - fVar214 * auVar161._0_4_)));
              auVar161 = vshufps_avx(auVar161,auVar161,0);
              uVar83 = CONCAT44(auVar316._4_4_,auVar316._0_4_);
              auVar217._0_8_ = uVar83 ^ 0x8000000080000000;
              auVar217._8_4_ = -auVar316._8_4_;
              auVar217._12_4_ = -auVar316._12_4_;
              auVar125 = ZEXT416((uint)(fVar231 * 1.5 + fVar214 * -0.5 * fVar231 * fVar231 * fVar231
                                       ));
              auVar125 = vshufps_avx(auVar125,auVar125,0);
              auVar179._0_4_ = auVar125._0_4_ * auVar93._0_4_ * auVar161._0_4_;
              auVar179._4_4_ = auVar125._4_4_ * auVar93._4_4_ * auVar161._4_4_;
              auVar179._8_4_ = auVar125._8_4_ * auVar93._8_4_ * auVar161._8_4_;
              auVar179._12_4_ = auVar125._12_4_ * auVar93._12_4_ * auVar161._12_4_;
              auVar243._0_4_ = auVar316._0_4_ * auVar125._0_4_;
              auVar243._4_4_ = auVar316._4_4_ * auVar125._4_4_;
              auVar243._8_4_ = auVar316._8_4_ * auVar125._8_4_;
              auVar243._12_4_ = auVar316._12_4_ * auVar125._12_4_;
              local_a00._0_16_ = auVar316;
              local_9c0._0_4_ = auVar129._0_4_;
              if (fVar214 < 0.0) {
                local_960._0_4_ = fVar176;
                local_9e0._0_16_ = auVar217;
                local_880._0_16_ = auVar243;
                local_8a0._0_16_ = auVar179;
                fVar231 = sqrtf(fVar214);
                auVar179 = local_8a0._0_16_;
                auVar217 = local_9e0._0_16_;
                auVar243 = local_880._0_16_;
                fVar214 = (float)local_9c0._0_4_;
              }
              else {
                auVar94 = vsqrtss_avx(auVar94,auVar94);
                fVar231 = auVar94._0_4_;
                local_960._0_4_ = fVar176;
                fVar214 = auVar129._0_4_;
              }
              auVar294._4_4_ = fStack_a7c;
              auVar294._0_4_ = local_a80;
              auVar294._8_4_ = fStack_a78;
              auVar294._12_4_ = fStack_a74;
              auVar129 = vdpps_avx(_local_a60,auVar243,0x7f);
              fVar176 = ((float)local_8e0._0_4_ / fVar231) * ((float)local_960._0_4_ + 1.0) +
                        fVar214 + (float)local_960._0_4_ * (float)local_8e0._0_4_;
              auVar94 = vdpps_avx(auVar217,auVar243,0x7f);
              auVar161 = vdpps_avx(_local_a60,auVar179,0x7f);
              auVar125 = vdpps_avx(_local_8c0,auVar243,0x7f);
              auVar93 = vdpps_avx(_local_a60,auVar217,0x7f);
              fVar231 = auVar94._0_4_ + auVar161._0_4_;
              fVar188 = auVar129._0_4_;
              auVar95._0_4_ = fVar188 * fVar188;
              auVar95._4_4_ = auVar129._4_4_ * auVar129._4_4_;
              auVar95._8_4_ = auVar129._8_4_ * auVar129._8_4_;
              auVar95._12_4_ = auVar129._12_4_ * auVar129._12_4_;
              auVar161 = vsubps_avx(auVar294,auVar95);
              local_960._0_16_ = ZEXT416((uint)fVar231);
              auVar94 = vdpps_avx(_local_a60,_local_8c0,0x7f);
              fVar232 = auVar93._0_4_ - fVar188 * fVar231;
              fVar188 = auVar94._0_4_ - fVar188 * auVar125._0_4_;
              auVar94 = vrsqrtss_avx(auVar161,auVar161);
              fVar189 = auVar161._0_4_;
              fVar231 = auVar94._0_4_;
              fVar231 = fVar231 * 1.5 + fVar189 * -0.5 * fVar231 * fVar231 * fVar231;
              if (fVar189 < 0.0) {
                local_9e0._0_16_ = auVar129;
                local_880._0_4_ = fVar176;
                local_8a0._0_16_ = auVar125;
                local_700._0_4_ = fVar232;
                local_720._0_4_ = fVar188;
                local_740._0_4_ = fVar231;
                fVar189 = sqrtf(fVar189);
                auVar294._4_4_ = fStack_a7c;
                auVar294._0_4_ = local_a80;
                auVar294._8_4_ = fStack_a78;
                auVar294._12_4_ = fStack_a74;
                fVar176 = (float)local_880._0_4_;
                fVar231 = (float)local_740._0_4_;
                fVar232 = (float)local_700._0_4_;
                fVar188 = (float)local_720._0_4_;
                auVar125 = local_8a0._0_16_;
                auVar129 = local_9e0._0_16_;
                fVar214 = (float)local_9c0._0_4_;
              }
              else {
                auVar94 = vsqrtss_avx(auVar161,auVar161);
                fVar189 = auVar94._0_4_;
              }
              auVar319 = ZEXT1664(local_a00._0_16_);
              auVar161 = vpermilps_avx(local_840._0_16_,0xff);
              auVar93 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xff);
              fVar232 = fVar232 * fVar231 - auVar93._0_4_;
              auVar196._0_8_ = auVar125._0_8_ ^ 0x8000000080000000;
              auVar196._8_4_ = auVar125._8_4_ ^ 0x80000000;
              auVar196._12_4_ = auVar125._12_4_ ^ 0x80000000;
              auVar218._0_4_ = -fVar232;
              auVar218._4_4_ = 0x80000000;
              auVar218._8_4_ = 0x80000000;
              auVar218._12_4_ = 0x80000000;
              auVar331 = ZEXT1664(local_960._0_16_);
              auVar94 = vinsertps_avx(ZEXT416((uint)(fVar188 * fVar231)),auVar196,0x10);
              auVar125 = vmovsldup_avx(ZEXT416((uint)(local_960._0_4_ * fVar188 * fVar231 -
                                                     auVar125._0_4_ * fVar232)));
              auVar94 = vdivps_avx(auVar94,auVar125);
              auVar128 = ZEXT416((uint)(fVar189 - auVar161._0_4_));
              auVar161 = vinsertps_avx(auVar129,auVar128,0x10);
              auVar180._0_4_ = auVar161._0_4_ * auVar94._0_4_;
              auVar180._4_4_ = auVar161._4_4_ * auVar94._4_4_;
              auVar180._8_4_ = auVar161._8_4_ * auVar94._8_4_;
              auVar180._12_4_ = auVar161._12_4_ * auVar94._12_4_;
              auVar94 = vinsertps_avx(auVar218,local_960._0_16_,0x1c);
              auVar94 = vdivps_avx(auVar94,auVar125);
              auVar163._0_4_ = auVar161._0_4_ * auVar94._0_4_;
              auVar163._4_4_ = auVar161._4_4_ * auVar94._4_4_;
              auVar163._8_4_ = auVar161._8_4_ * auVar94._8_4_;
              auVar163._12_4_ = auVar161._12_4_ * auVar94._12_4_;
              auVar94 = vhaddps_avx(auVar180,auVar180);
              auVar161 = vhaddps_avx(auVar163,auVar163);
              local_aa0 = local_aa0 - auVar94._0_4_;
              auVar326 = ZEXT464((uint)local_aa0);
              local_ac0 = local_ac0 - auVar161._0_4_;
              auVar346 = ZEXT464((uint)local_ac0);
              auVar197._8_4_ = 0x7fffffff;
              auVar197._0_8_ = 0x7fffffff7fffffff;
              auVar197._12_4_ = 0x7fffffff;
              auVar230 = ZEXT1664(auVar197);
              auVar129 = vandps_avx(auVar129,auVar197);
              if (fVar176 <= auVar129._0_4_) {
LAB_00eeaeb6:
                bVar66 = false;
              }
              else {
                auVar129 = vandps_avx(auVar128,auVar197);
                if ((float)local_760._0_4_ * 1.9073486e-06 + fVar214 + fVar176 <= auVar129._0_4_)
                goto LAB_00eeaeb6;
                local_ac0 = local_ac0 + (float)local_800._0_4_;
                auVar346 = ZEXT464((uint)local_ac0);
                bVar66 = true;
                if ((((ray->super_RayK<1>).org.field_0.m128[3] <= local_ac0) &&
                    (fVar214 = (ray->super_RayK<1>).tfar, local_ac0 <= fVar214)) &&
                   ((0.0 <= local_aa0 && (local_aa0 <= 1.0)))) {
                  auVar129 = vrsqrtss_avx(auVar294,auVar294);
                  fVar176 = auVar129._0_4_;
                  pGVar7 = (context->scene->geometries).items[local_ac8].ptr;
                  if ((pGVar7->mask & (ray->super_RayK<1>).mask) != 0) {
                    auVar129 = ZEXT416((uint)(fVar176 * 1.5 +
                                             auVar294._0_4_ * -0.5 * fVar176 * fVar176 * fVar176));
                    auVar129 = vshufps_avx(auVar129,auVar129,0);
                    auVar130._0_4_ = auVar129._0_4_ * (float)local_a60._0_4_;
                    auVar130._4_4_ = auVar129._4_4_ * (float)local_a60._4_4_;
                    auVar130._8_4_ = auVar129._8_4_ * fStack_a58;
                    auVar130._12_4_ = auVar129._12_4_ * fStack_a54;
                    auVar96._0_4_ = local_a00._0_4_ + auVar93._0_4_ * auVar130._0_4_;
                    auVar96._4_4_ = local_a00._4_4_ + auVar93._4_4_ * auVar130._4_4_;
                    auVar96._8_4_ = local_a00._8_4_ + auVar93._8_4_ * auVar130._8_4_;
                    auVar96._12_4_ = local_a00._12_4_ + auVar93._12_4_ * auVar130._12_4_;
                    auVar129 = vshufps_avx(auVar130,auVar130,0xc9);
                    auVar94 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xc9);
                    auVar131._0_4_ = auVar94._0_4_ * auVar130._0_4_;
                    auVar131._4_4_ = auVar94._4_4_ * auVar130._4_4_;
                    auVar131._8_4_ = auVar94._8_4_ * auVar130._8_4_;
                    auVar131._12_4_ = auVar94._12_4_ * auVar130._12_4_;
                    auVar164._0_4_ = local_a00._0_4_ * auVar129._0_4_;
                    auVar164._4_4_ = local_a00._4_4_ * auVar129._4_4_;
                    auVar164._8_4_ = local_a00._8_4_ * auVar129._8_4_;
                    auVar164._12_4_ = local_a00._12_4_ * auVar129._12_4_;
                    auVar161 = vsubps_avx(auVar164,auVar131);
                    auVar129 = vshufps_avx(auVar161,auVar161,0xc9);
                    auVar94 = vshufps_avx(auVar96,auVar96,0xc9);
                    auVar165._0_4_ = auVar94._0_4_ * auVar129._0_4_;
                    auVar165._4_4_ = auVar94._4_4_ * auVar129._4_4_;
                    auVar165._8_4_ = auVar94._8_4_ * auVar129._8_4_;
                    auVar165._12_4_ = auVar94._12_4_ * auVar129._12_4_;
                    auVar129 = vshufps_avx(auVar161,auVar161,0xd2);
                    auVar97._0_4_ = auVar96._0_4_ * auVar129._0_4_;
                    auVar97._4_4_ = auVar96._4_4_ * auVar129._4_4_;
                    auVar97._8_4_ = auVar96._8_4_ * auVar129._8_4_;
                    auVar97._12_4_ = auVar96._12_4_ * auVar129._12_4_;
                    auVar129 = vsubps_avx(auVar165,auVar97);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      (ray->super_RayK<1>).tfar = local_ac0;
                      auVar94 = vshufps_avx(auVar129,auVar129,0xe9);
                      uVar2 = vmovlps_avx(auVar94);
                      *(undefined8 *)&(ray->Ng).field_0 = uVar2;
                      (ray->Ng).field_0.field_0.z = auVar129._0_4_;
                      ray->u = local_aa0;
                      ray->v = 0.0;
                      ray->primID = uVar82;
                      ray->geomID = (uint)local_ac8;
                      ray->instID[0] = context->user->instID[0];
                      ray->instPrimID[0] = context->user->instPrimID[0];
                    }
                    else {
                      auVar94 = vshufps_avx(auVar129,auVar129,0xe9);
                      local_920 = vmovlps_avx(auVar94);
                      local_918 = auVar129._0_4_;
                      local_914 = local_aa0;
                      local_910 = 0;
                      local_90c = uVar82;
                      local_908 = (uint)local_ac8;
                      local_904 = context->user->instID[0];
                      local_900 = context->user->instPrimID[0];
                      (ray->super_RayK<1>).tfar = local_ac0;
                      local_acc = -1;
                      local_a30.valid = &local_acc;
                      local_a30.geometryUserPtr = pGVar7->userPtr;
                      local_a30.context = context->user;
                      local_a30.ray = (RTCRayN *)ray;
                      local_a30.hit = (RTCHitN *)&local_920;
                      local_a30.N = 1;
                      fStack_a9c = 0.0;
                      fStack_a98 = 0.0;
                      fStack_a94 = 0.0;
                      fStack_abc = 0.0;
                      fStack_ab8 = 0.0;
                      fStack_ab4 = 0.0;
                      local_a80 = fVar214;
                      if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00eeafe9:
                        p_Var8 = context->args->filter;
                        if (p_Var8 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                            auVar319 = ZEXT1664(auVar319._0_16_);
                            auVar331 = ZEXT1664(auVar331._0_16_);
                            (*p_Var8)(&local_a30);
                            auVar346 = ZEXT1664(CONCAT412(fStack_ab4,
                                                          CONCAT48(fStack_ab8,
                                                                   CONCAT44(fStack_abc,local_ac0))))
                            ;
                            auVar326 = ZEXT1664(CONCAT412(fStack_a94,
                                                          CONCAT48(fStack_a98,
                                                                   CONCAT44(fStack_a9c,local_aa0))))
                            ;
                            auVar230 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          if (*local_a30.valid == 0) goto LAB_00eeb09c;
                        }
                        (((Vec3f *)((long)local_a30.ray + 0x30))->field_0).components[0] =
                             *(float *)local_a30.hit;
                        (((Vec3f *)((long)local_a30.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_a30.hit + 4);
                        (((Vec3f *)((long)local_a30.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_a30.hit + 8);
                        *(float *)((long)local_a30.ray + 0x3c) = *(float *)(local_a30.hit + 0xc);
                        *(float *)((long)local_a30.ray + 0x40) = *(float *)(local_a30.hit + 0x10);
                        *(float *)((long)local_a30.ray + 0x44) = *(float *)(local_a30.hit + 0x14);
                        *(float *)((long)local_a30.ray + 0x48) = *(float *)(local_a30.hit + 0x18);
                        *(float *)((long)local_a30.ray + 0x4c) = *(float *)(local_a30.hit + 0x1c);
                        *(float *)((long)local_a30.ray + 0x50) = *(float *)(local_a30.hit + 0x20);
                      }
                      else {
                        auVar319 = ZEXT1664(local_a00._0_16_);
                        auVar331 = ZEXT1664(local_960._0_16_);
                        (*pGVar7->intersectionFilterN)(&local_a30);
                        auVar346 = ZEXT1664(CONCAT412(fStack_ab4,
                                                      CONCAT48(fStack_ab8,
                                                               CONCAT44(fStack_abc,local_ac0))));
                        auVar326 = ZEXT1664(CONCAT412(fStack_a94,
                                                      CONCAT48(fStack_a98,
                                                               CONCAT44(fStack_a9c,local_aa0))));
                        auVar230 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        if (*local_a30.valid != 0) goto LAB_00eeafe9;
LAB_00eeb09c:
                        (ray->super_RayK<1>).tfar = local_a80;
                      }
                    }
                  }
                }
              }
              auVar104 = local_600;
              bVar86 = lVar80 != 0;
              lVar80 = lVar80 + -1;
            } while ((!bVar66) && (bVar86));
            fVar214 = (ray->super_RayK<1>).tfar;
            auVar107._4_4_ = fVar214;
            auVar107._0_4_ = fVar214;
            auVar107._8_4_ = fVar214;
            auVar107._12_4_ = fVar214;
            auVar107._16_4_ = fVar214;
            auVar107._20_4_ = fVar214;
            auVar107._24_4_ = fVar214;
            auVar107._28_4_ = fVar214;
            auVar103 = vcmpps_avx(_local_540,auVar107,2);
            local_600 = vandps_avx(auVar103,local_600);
            auVar104 = auVar104 & auVar103;
            auVar326 = ZEXT3264(local_7c0);
            uVar83 = local_660._0_8_;
          } while ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar104 >> 0x7f,0) != '\0') ||
                     (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar104 >> 0xbf,0) != '\0') ||
                   (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar104[0x1f] < '\0');
        }
        auVar108._0_4_ =
             (float)local_780._0_4_ * (float)local_400._0_4_ +
             auVar326._0_4_ * (float)local_6a0._0_4_ +
             (float)local_6c0._0_4_ * (float)local_680._0_4_;
        auVar108._4_4_ =
             (float)local_780._4_4_ * (float)local_400._4_4_ +
             auVar326._4_4_ * (float)local_6a0._4_4_ +
             (float)local_6c0._4_4_ * (float)local_680._4_4_;
        auVar108._8_4_ =
             fStack_778 * fStack_3f8 + auVar326._8_4_ * fStack_698 + fStack_6b8 * fStack_678;
        auVar108._12_4_ =
             fStack_774 * fStack_3f4 + auVar326._12_4_ * fStack_694 + fStack_6b4 * fStack_674;
        auVar108._16_4_ =
             fStack_770 * fStack_3f0 + auVar326._16_4_ * fStack_690 + fStack_6b0 * fStack_670;
        auVar108._20_4_ =
             fStack_76c * fStack_3ec + auVar326._20_4_ * fStack_68c + fStack_6ac * fStack_66c;
        auVar108._24_4_ =
             fStack_768 * fStack_3e8 + auVar326._24_4_ * fStack_688 + fStack_6a8 * fStack_668;
        auVar108._28_4_ = auVar103._28_4_ + auVar103._28_4_ + fStack_6a4;
        auVar147._8_4_ = 0x7fffffff;
        auVar147._0_8_ = 0x7fffffff7fffffff;
        auVar147._12_4_ = 0x7fffffff;
        auVar147._16_4_ = 0x7fffffff;
        auVar147._20_4_ = 0x7fffffff;
        auVar147._24_4_ = 0x7fffffff;
        auVar147._28_4_ = 0x7fffffff;
        auVar103 = vandps_avx(auVar108,auVar147);
        auVar148._8_4_ = 0x3e99999a;
        auVar148._0_8_ = 0x3e99999a3e99999a;
        auVar148._12_4_ = 0x3e99999a;
        auVar148._16_4_ = 0x3e99999a;
        auVar148._20_4_ = 0x3e99999a;
        auVar148._24_4_ = 0x3e99999a;
        auVar148._28_4_ = 0x3e99999a;
        auVar103 = vcmpps_avx(auVar103,auVar148,1);
        auVar104 = vorps_avx(auVar103,local_5c0);
        auVar149._0_4_ = local_7a0._0_4_ + (float)local_820._0_4_;
        auVar149._4_4_ = local_7a0._4_4_ + (float)local_820._4_4_;
        auVar149._8_4_ = local_7a0._8_4_ + fStack_818;
        auVar149._12_4_ = local_7a0._12_4_ + fStack_814;
        auVar149._16_4_ = local_7a0._16_4_ + fStack_810;
        auVar149._20_4_ = local_7a0._20_4_ + fStack_80c;
        auVar149._24_4_ = local_7a0._24_4_ + fStack_808;
        auVar149._28_4_ = local_7a0._28_4_ + fStack_804;
        fVar214 = (ray->super_RayK<1>).tfar;
        auVar173._4_4_ = fVar214;
        auVar173._0_4_ = fVar214;
        auVar173._8_4_ = fVar214;
        auVar173._12_4_ = fVar214;
        auVar173._16_4_ = fVar214;
        auVar173._20_4_ = fVar214;
        auVar173._24_4_ = fVar214;
        auVar173._28_4_ = fVar214;
        auVar103 = vcmpps_avx(auVar149,auVar173,2);
        local_7c0 = vandps_avx(auVar103,_local_7e0);
        auVar150._8_4_ = 3;
        auVar150._0_8_ = 0x300000003;
        auVar150._12_4_ = 3;
        auVar150._16_4_ = 3;
        auVar150._20_4_ = 3;
        auVar150._24_4_ = 3;
        auVar150._28_4_ = 3;
        auVar174._8_4_ = 2;
        auVar174._0_8_ = 0x200000002;
        auVar174._12_4_ = 2;
        auVar174._16_4_ = 2;
        auVar174._20_4_ = 2;
        auVar174._24_4_ = 2;
        auVar174._28_4_ = 2;
        auVar103 = vblendvps_avx(auVar174,auVar150,auVar104);
        auVar129 = vpcmpgtd_avx(auVar103._16_16_,local_5e0._0_16_);
        auVar94 = vpshufd_avx(local_6e0._0_16_,0);
        auVar94 = vpcmpgtd_avx(auVar103._0_16_,auVar94);
        auVar151._16_16_ = auVar129;
        auVar151._0_16_ = auVar94;
        _local_7e0 = vblendps_avx(ZEXT1632(auVar94),auVar151,0xf0);
        local_620 = vandnps_avx(_local_7e0,local_7c0);
        auVar103 = local_7c0 & ~_local_7e0;
        if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar103 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar103 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar103 >> 0x7f,0) != '\0') ||
              (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar103 >> 0xbf,0) != '\0') ||
            (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar103[0x1f] < '\0') {
          _local_780 = _local_480;
          local_7a0._4_4_ = (float)local_480._4_4_ + (float)local_820._4_4_;
          local_7a0._0_4_ = (float)local_480._0_4_ + (float)local_820._0_4_;
          fStack_798 = fStack_478 + fStack_818;
          fStack_794 = fStack_474 + fStack_814;
          fStack_790 = fStack_470 + fStack_810;
          fStack_78c = fStack_46c + fStack_80c;
          fStack_788 = fStack_468 + fStack_808;
          fStack_784 = fStack_464 + fStack_804;
          do {
            auVar198 = auVar230._0_16_;
            auVar152._8_4_ = 0x7f800000;
            auVar152._0_8_ = 0x7f8000007f800000;
            auVar152._12_4_ = 0x7f800000;
            auVar152._16_4_ = 0x7f800000;
            auVar152._20_4_ = 0x7f800000;
            auVar152._24_4_ = 0x7f800000;
            auVar152._28_4_ = 0x7f800000;
            auVar103 = vblendvps_avx(auVar152,_local_780,local_620);
            auVar104 = vshufps_avx(auVar103,auVar103,0xb1);
            auVar104 = vminps_avx(auVar103,auVar104);
            auVar19 = vshufpd_avx(auVar104,auVar104,5);
            auVar104 = vminps_avx(auVar104,auVar19);
            auVar19 = vperm2f128_avx(auVar104,auVar104,1);
            auVar104 = vminps_avx(auVar104,auVar19);
            auVar104 = vcmpps_avx(auVar103,auVar104,0);
            auVar19 = local_620 & auVar104;
            auVar103 = local_620;
            if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar19 >> 0x7f,0) != '\0') ||
                  (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar19 >> 0xbf,0) != '\0') ||
                (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar19[0x1f] < '\0') {
              auVar103 = vandps_avx(auVar104,local_620);
            }
            uVar84 = vmovmskps_avx(auVar103);
            uVar9 = 0;
            if (uVar84 != 0) {
              for (; (uVar84 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
              }
            }
            uVar83 = (ulong)uVar9;
            *(undefined4 *)(local_620 + uVar83 * 4) = 0;
            aVar5 = (ray->super_RayK<1>).dir.field_0;
            _local_8c0 = (undefined1  [16])aVar5;
            auVar129 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
            local_aa0 = local_4e0[uVar83];
            auVar326 = ZEXT464((uint)local_aa0);
            local_ac0 = *(float *)(local_460 + uVar83 * 4);
            auVar331 = ZEXT464((uint)local_ac0);
            if (auVar129._0_4_ < 0.0) {
              fStack_a9c = 0.0;
              fStack_a98 = 0.0;
              fStack_a94 = 0.0;
              fStack_abc = 0.0;
              fStack_ab8 = 0.0;
              fStack_ab4 = 0.0;
              fVar214 = sqrtf(auVar129._0_4_);
              auVar331 = ZEXT1664(CONCAT412(fStack_ab4,
                                            CONCAT48(fStack_ab8,CONCAT44(fStack_abc,local_ac0))));
              auVar326 = ZEXT1664(CONCAT412(fStack_a94,
                                            CONCAT48(fStack_a98,CONCAT44(fStack_a9c,local_aa0))));
              auVar198._8_4_ = 0x7fffffff;
              auVar198._0_8_ = 0x7fffffff7fffffff;
              auVar198._12_4_ = 0x7fffffff;
            }
            else {
              auVar129 = vsqrtss_avx(auVar129,auVar129);
              fVar214 = auVar129._0_4_;
            }
            auVar94 = vminps_avx(_local_970,_local_990);
            auVar129 = vmaxps_avx(_local_970,_local_990);
            auVar161 = vminps_avx(_local_980,_local_9a0);
            auVar125 = vminps_avx(auVar94,auVar161);
            auVar94 = vmaxps_avx(_local_980,_local_9a0);
            auVar161 = vmaxps_avx(auVar129,auVar94);
            auVar129 = vandps_avx(auVar125,auVar198);
            auVar94 = vandps_avx(auVar161,auVar198);
            auVar129 = vmaxps_avx(auVar129,auVar94);
            auVar94 = vmovshdup_avx(auVar129);
            auVar94 = vmaxss_avx(auVar94,auVar129);
            auVar129 = vshufpd_avx(auVar129,auVar129,1);
            auVar129 = vmaxss_avx(auVar129,auVar94);
            local_8e0._0_4_ = auVar129._0_4_ * 1.9073486e-06;
            local_960._0_4_ = fVar214 * 1.9073486e-06;
            local_760._0_16_ = vshufps_avx(auVar161,auVar161,0xff);
            lVar80 = 4;
            do {
              local_aa0 = auVar326._0_4_;
              fVar189 = 1.0 - local_aa0;
              fVar214 = fVar189 * fVar189;
              fVar176 = fVar189 * fVar214;
              fVar231 = local_aa0 * local_aa0;
              fVar188 = local_aa0 * fVar231;
              fVar232 = local_aa0 * fVar189;
              local_a00._0_4_ = fVar232;
              auVar129 = vshufps_avx(ZEXT416((uint)(fVar188 * 0.16666667)),
                                     ZEXT416((uint)(fVar188 * 0.16666667)),0);
              auVar94 = ZEXT416((uint)((fVar188 * 4.0 + fVar176 +
                                       local_aa0 * fVar232 * 12.0 + fVar189 * fVar232 * 6.0) *
                                      0.16666667));
              auVar94 = vshufps_avx(auVar94,auVar94,0);
              auVar161 = ZEXT416((uint)((fVar176 * 4.0 + fVar188 +
                                        fVar189 * fVar232 * 12.0 + local_aa0 * fVar232 * 6.0) *
                                       0.16666667));
              auVar161 = vshufps_avx(auVar161,auVar161,0);
              auVar329 = auVar331._0_16_;
              auVar125 = vshufps_avx(auVar329,auVar329,0);
              auVar166._0_4_ = auVar125._0_4_ * (float)local_8c0._0_4_ + 0.0;
              auVar166._4_4_ = auVar125._4_4_ * (float)local_8c0._4_4_ + 0.0;
              auVar166._8_4_ = auVar125._8_4_ * fStack_8b8 + 0.0;
              auVar166._12_4_ = auVar125._12_4_ * fStack_8b4 + 0.0;
              auVar125 = vshufps_avx(ZEXT416((uint)(fVar176 * 0.16666667)),
                                     ZEXT416((uint)(fVar176 * 0.16666667)),0);
              auVar98._0_4_ =
                   auVar125._0_4_ * (float)local_970._0_4_ +
                   auVar161._0_4_ * (float)local_990._0_4_ +
                   auVar129._0_4_ * (float)local_9a0._0_4_ + auVar94._0_4_ * (float)local_980._0_4_;
              auVar98._4_4_ =
                   auVar125._4_4_ * (float)local_970._4_4_ +
                   auVar161._4_4_ * (float)local_990._4_4_ +
                   auVar129._4_4_ * (float)local_9a0._4_4_ + auVar94._4_4_ * (float)local_980._4_4_;
              auVar98._8_4_ =
                   auVar125._8_4_ * fStack_968 +
                   auVar161._8_4_ * fStack_988 +
                   auVar129._8_4_ * fStack_998 + auVar94._8_4_ * fStack_978;
              auVar98._12_4_ =
                   auVar125._12_4_ * fStack_964 +
                   auVar161._12_4_ * fStack_984 +
                   auVar129._12_4_ * fStack_994 + auVar94._12_4_ * fStack_974;
              local_840._0_16_ = auVar98;
              auVar129 = vsubps_avx(auVar166,auVar98);
              _local_a60 = auVar129;
              auVar129 = vdpps_avx(auVar129,auVar129,0x7f);
              local_a80 = auVar129._0_4_;
              auVar324 = auVar326._0_16_;
              fStack_a9c = auVar326._4_4_;
              fStack_a98 = auVar326._8_4_;
              fStack_a94 = auVar326._12_4_;
              local_ac0 = auVar331._0_4_;
              fStack_abc = auVar331._4_4_;
              fStack_ab8 = auVar331._8_4_;
              fStack_ab4 = auVar331._12_4_;
              fStack_a7c = auVar129._4_4_;
              fStack_a78 = auVar129._8_4_;
              fStack_a74 = auVar129._12_4_;
              if (local_a80 < 0.0) {
                local_9c0._0_16_ = ZEXT416((uint)fVar189);
                local_860._0_4_ = fVar231;
                local_9e0._0_4_ = fVar214;
                fVar176 = sqrtf(local_a80);
                auVar329._4_4_ = fStack_abc;
                auVar329._0_4_ = local_ac0;
                auVar329._8_4_ = fStack_ab8;
                auVar329._12_4_ = fStack_ab4;
                auVar324._4_4_ = fStack_a9c;
                auVar324._0_4_ = local_aa0;
                auVar324._8_4_ = fStack_a98;
                auVar324._12_4_ = fStack_a94;
                fVar214 = (float)local_9e0._0_4_;
                fVar231 = (float)local_860._0_4_;
                auVar129 = local_9c0._0_16_;
              }
              else {
                auVar129 = vsqrtss_avx(auVar129,auVar129);
                fVar176 = auVar129._0_4_;
                auVar129 = ZEXT416((uint)fVar189);
              }
              fVar232 = auVar129._0_4_;
              fVar188 = auVar324._0_4_;
              auVar94 = vshufps_avx(ZEXT416((uint)(fVar231 * 0.5)),ZEXT416((uint)(fVar231 * 0.5)),0)
              ;
              auVar161 = ZEXT416((uint)((fVar214 + (float)local_a00._0_4_ * 4.0) * 0.5));
              auVar161 = vshufps_avx(auVar161,auVar161,0);
              auVar125 = ZEXT416((uint)((fVar188 * -fVar188 - (float)local_a00._0_4_ * 4.0) * 0.5));
              auVar125 = vshufps_avx(auVar125,auVar125,0);
              auVar93 = ZEXT416((uint)(fVar232 * -fVar232 * 0.5));
              auVar93 = vshufps_avx(auVar93,auVar93,0);
              auVar317._0_4_ =
                   (float)local_970._0_4_ * auVar93._0_4_ +
                   (float)local_990._0_4_ * auVar125._0_4_ +
                   (float)local_9a0._0_4_ * auVar94._0_4_ + (float)local_980._0_4_ * auVar161._0_4_;
              auVar317._4_4_ =
                   (float)local_970._4_4_ * auVar93._4_4_ +
                   (float)local_990._4_4_ * auVar125._4_4_ +
                   (float)local_9a0._4_4_ * auVar94._4_4_ + (float)local_980._4_4_ * auVar161._4_4_;
              auVar317._8_4_ =
                   fStack_968 * auVar93._8_4_ +
                   fStack_988 * auVar125._8_4_ +
                   fStack_998 * auVar94._8_4_ + fStack_978 * auVar161._8_4_;
              auVar317._12_4_ =
                   fStack_964 * auVar93._12_4_ +
                   fStack_984 * auVar125._12_4_ +
                   fStack_994 * auVar94._12_4_ + fStack_974 * auVar161._12_4_;
              auVar161 = vshufps_avx(auVar324,auVar324,0);
              auVar94 = ZEXT416((uint)(fVar232 - (fVar188 + fVar188)));
              auVar125 = vshufps_avx(auVar94,auVar94,0);
              auVar94 = ZEXT416((uint)(fVar188 - (fVar232 + fVar232)));
              auVar93 = vshufps_avx(auVar94,auVar94,0);
              auVar129 = vshufps_avx(auVar129,auVar129,0);
              auVar94 = vdpps_avx(auVar317,auVar317,0x7f);
              auVar132._0_4_ =
                   (float)local_970._0_4_ * auVar129._0_4_ +
                   (float)local_990._0_4_ * auVar93._0_4_ +
                   (float)local_9a0._0_4_ * auVar161._0_4_ + (float)local_980._0_4_ * auVar125._0_4_
              ;
              auVar132._4_4_ =
                   (float)local_970._4_4_ * auVar129._4_4_ +
                   (float)local_990._4_4_ * auVar93._4_4_ +
                   (float)local_9a0._4_4_ * auVar161._4_4_ + (float)local_980._4_4_ * auVar125._4_4_
              ;
              auVar132._8_4_ =
                   fStack_968 * auVar129._8_4_ +
                   fStack_988 * auVar93._8_4_ +
                   fStack_998 * auVar161._8_4_ + fStack_978 * auVar125._8_4_;
              auVar132._12_4_ =
                   fStack_964 * auVar129._12_4_ +
                   fStack_984 * auVar93._12_4_ +
                   fStack_994 * auVar161._12_4_ + fStack_974 * auVar125._12_4_;
              auVar129 = vblendps_avx(auVar94,_DAT_01feba10,0xe);
              auVar161 = vrsqrtss_avx(auVar129,auVar129);
              fVar231 = auVar161._0_4_;
              fVar214 = auVar94._0_4_;
              auVar161 = vdpps_avx(auVar317,auVar132,0x7f);
              auVar125 = vshufps_avx(auVar94,auVar94,0);
              auVar133._0_4_ = auVar132._0_4_ * auVar125._0_4_;
              auVar133._4_4_ = auVar132._4_4_ * auVar125._4_4_;
              auVar133._8_4_ = auVar132._8_4_ * auVar125._8_4_;
              auVar133._12_4_ = auVar132._12_4_ * auVar125._12_4_;
              auVar161 = vshufps_avx(auVar161,auVar161,0);
              auVar199._0_4_ = auVar317._0_4_ * auVar161._0_4_;
              auVar199._4_4_ = auVar317._4_4_ * auVar161._4_4_;
              auVar199._8_4_ = auVar317._8_4_ * auVar161._8_4_;
              auVar199._12_4_ = auVar317._12_4_ * auVar161._12_4_;
              auVar93 = vsubps_avx(auVar133,auVar199);
              auVar161 = vrcpss_avx(auVar129,auVar129);
              auVar129 = vmaxss_avx(ZEXT416((uint)local_8e0._0_4_),
                                    ZEXT416((uint)(auVar329._0_4_ * (float)local_960._0_4_)));
              auVar346 = ZEXT1664(auVar129);
              auVar161 = ZEXT416((uint)(auVar161._0_4_ * (2.0 - fVar214 * auVar161._0_4_)));
              auVar161 = vshufps_avx(auVar161,auVar161,0);
              uVar83 = CONCAT44(auVar317._4_4_,auVar317._0_4_);
              auVar219._0_8_ = uVar83 ^ 0x8000000080000000;
              auVar219._8_4_ = -auVar317._8_4_;
              auVar219._12_4_ = -auVar317._12_4_;
              auVar125 = ZEXT416((uint)(fVar231 * 1.5 + fVar214 * -0.5 * fVar231 * fVar231 * fVar231
                                       ));
              auVar125 = vshufps_avx(auVar125,auVar125,0);
              auVar181._0_4_ = auVar125._0_4_ * auVar93._0_4_ * auVar161._0_4_;
              auVar181._4_4_ = auVar125._4_4_ * auVar93._4_4_ * auVar161._4_4_;
              auVar181._8_4_ = auVar125._8_4_ * auVar93._8_4_ * auVar161._8_4_;
              auVar181._12_4_ = auVar125._12_4_ * auVar93._12_4_ * auVar161._12_4_;
              auVar244._0_4_ = auVar317._0_4_ * auVar125._0_4_;
              auVar244._4_4_ = auVar317._4_4_ * auVar125._4_4_;
              auVar244._8_4_ = auVar317._8_4_ * auVar125._8_4_;
              auVar244._12_4_ = auVar317._12_4_ * auVar125._12_4_;
              local_a00._0_16_ = auVar317;
              local_9c0._0_4_ = auVar129._0_4_;
              if (fVar214 < 0.0) {
                local_860._0_4_ = fVar176;
                local_9e0._0_16_ = auVar219;
                local_880._0_16_ = auVar244;
                local_8a0._0_16_ = auVar181;
                fVar214 = sqrtf(fVar214);
                auVar346 = ZEXT464((uint)local_9c0._0_4_);
                auVar181 = local_8a0._0_16_;
                auVar219 = local_9e0._0_16_;
                auVar244 = local_880._0_16_;
                fVar176 = (float)local_860._0_4_;
              }
              else {
                auVar129 = vsqrtss_avx(auVar94,auVar94);
                fVar214 = auVar129._0_4_;
              }
              auVar295._4_4_ = fStack_a7c;
              auVar295._0_4_ = local_a80;
              auVar295._8_4_ = fStack_a78;
              auVar295._12_4_ = fStack_a74;
              auVar129 = vdpps_avx(_local_a60,auVar244,0x7f);
              fVar214 = ((float)local_8e0._0_4_ / fVar214) * (fVar176 + 1.0) +
                        auVar346._0_4_ + fVar176 * (float)local_8e0._0_4_;
              auVar94 = vdpps_avx(auVar219,auVar244,0x7f);
              auVar161 = vdpps_avx(_local_a60,auVar181,0x7f);
              auVar125 = vdpps_avx(_local_8c0,auVar244,0x7f);
              auVar93 = vdpps_avx(_local_a60,auVar219,0x7f);
              fVar176 = auVar94._0_4_ + auVar161._0_4_;
              fVar231 = auVar129._0_4_;
              auVar99._0_4_ = fVar231 * fVar231;
              auVar99._4_4_ = auVar129._4_4_ * auVar129._4_4_;
              auVar99._8_4_ = auVar129._8_4_ * auVar129._8_4_;
              auVar99._12_4_ = auVar129._12_4_ * auVar129._12_4_;
              auVar161 = vsubps_avx(auVar295,auVar99);
              auVar94 = vdpps_avx(_local_a60,_local_8c0,0x7f);
              fVar188 = auVar93._0_4_ - fVar231 * fVar176;
              fVar232 = auVar94._0_4_ - fVar231 * auVar125._0_4_;
              auVar94 = vrsqrtss_avx(auVar161,auVar161);
              fVar189 = auVar161._0_4_;
              fVar231 = auVar94._0_4_;
              fVar231 = fVar231 * 1.5 + fVar189 * -0.5 * fVar231 * fVar231 * fVar231;
              if (fVar189 < 0.0) {
                local_860._0_16_ = auVar129;
                local_9e0._0_4_ = fVar214;
                local_880._0_16_ = ZEXT416((uint)fVar176);
                local_8a0._0_16_ = auVar125;
                local_700._0_4_ = fVar188;
                local_720._0_4_ = fVar232;
                local_740._0_4_ = fVar231;
                fVar189 = sqrtf(fVar189);
                auVar346 = ZEXT464((uint)local_9c0._0_4_);
                auVar295._4_4_ = fStack_a7c;
                auVar295._0_4_ = local_a80;
                auVar295._8_4_ = fStack_a78;
                auVar295._12_4_ = fStack_a74;
                fVar231 = (float)local_740._0_4_;
                fVar188 = (float)local_700._0_4_;
                fVar232 = (float)local_720._0_4_;
                auVar125 = local_8a0._0_16_;
                fVar214 = (float)local_9e0._0_4_;
                auVar129 = local_860._0_16_;
                auVar94 = local_880._0_16_;
              }
              else {
                auVar94 = vsqrtss_avx(auVar161,auVar161);
                fVar189 = auVar94._0_4_;
                auVar94 = ZEXT416((uint)fVar176);
              }
              auVar319 = ZEXT1664(local_a00._0_16_);
              auVar89 = vpermilps_avx(local_840._0_16_,0xff);
              auVar128 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xff);
              fVar176 = fVar188 * fVar231 - auVar128._0_4_;
              auVar200._0_8_ = auVar125._0_8_ ^ 0x8000000080000000;
              auVar200._8_4_ = auVar125._8_4_ ^ 0x80000000;
              auVar200._12_4_ = auVar125._12_4_ ^ 0x80000000;
              auVar220._0_4_ = -fVar176;
              auVar220._4_4_ = 0x80000000;
              auVar220._8_4_ = 0x80000000;
              auVar220._12_4_ = 0x80000000;
              auVar161 = vinsertps_avx(ZEXT416((uint)(fVar232 * fVar231)),auVar200,0x10);
              auVar93 = vmovsldup_avx(ZEXT416((uint)(auVar94._0_4_ * fVar232 * fVar231 -
                                                    auVar125._0_4_ * fVar176)));
              auVar161 = vdivps_avx(auVar161,auVar93);
              auVar89 = ZEXT416((uint)(fVar189 - auVar89._0_4_));
              auVar125 = vinsertps_avx(auVar129,auVar89,0x10);
              auVar182._0_4_ = auVar125._0_4_ * auVar161._0_4_;
              auVar182._4_4_ = auVar125._4_4_ * auVar161._4_4_;
              auVar182._8_4_ = auVar125._8_4_ * auVar161._8_4_;
              auVar182._12_4_ = auVar125._12_4_ * auVar161._12_4_;
              auVar94 = vinsertps_avx(auVar220,auVar94,0x1c);
              auVar94 = vdivps_avx(auVar94,auVar93);
              auVar167._0_4_ = auVar125._0_4_ * auVar94._0_4_;
              auVar167._4_4_ = auVar125._4_4_ * auVar94._4_4_;
              auVar167._8_4_ = auVar125._8_4_ * auVar94._8_4_;
              auVar167._12_4_ = auVar125._12_4_ * auVar94._12_4_;
              auVar94 = vhaddps_avx(auVar182,auVar182);
              auVar161 = vhaddps_avx(auVar167,auVar167);
              local_aa0 = local_aa0 - auVar94._0_4_;
              auVar326 = ZEXT464((uint)local_aa0);
              local_ac0 = local_ac0 - auVar161._0_4_;
              auVar331 = ZEXT464((uint)local_ac0);
              auVar201._8_4_ = 0x7fffffff;
              auVar201._0_8_ = 0x7fffffff7fffffff;
              auVar201._12_4_ = 0x7fffffff;
              auVar230 = ZEXT1664(auVar201);
              auVar129 = vandps_avx(auVar129,auVar201);
              if (fVar214 <= auVar129._0_4_) {
LAB_00eeba10:
                bVar66 = false;
              }
              else {
                auVar129 = vandps_avx(auVar89,auVar201);
                if ((float)local_760._0_4_ * 1.9073486e-06 + auVar346._0_4_ + fVar214 <=
                    auVar129._0_4_) goto LAB_00eeba10;
                local_ac0 = local_ac0 + (float)local_800._0_4_;
                auVar331 = ZEXT464((uint)local_ac0);
                bVar66 = true;
                if (((((ray->super_RayK<1>).org.field_0.m128[3] <= local_ac0) &&
                     (fVar214 = (ray->super_RayK<1>).tfar, local_ac0 <= fVar214)) &&
                    (0.0 <= local_aa0)) && (local_aa0 <= 1.0)) {
                  auVar129 = vrsqrtss_avx(auVar295,auVar295);
                  fVar176 = auVar129._0_4_;
                  pGVar7 = (context->scene->geometries).items[local_ac8].ptr;
                  if ((pGVar7->mask & (ray->super_RayK<1>).mask) != 0) {
                    auVar129 = ZEXT416((uint)(fVar176 * 1.5 +
                                             auVar295._0_4_ * -0.5 * fVar176 * fVar176 * fVar176));
                    auVar129 = vshufps_avx(auVar129,auVar129,0);
                    auVar134._0_4_ = auVar129._0_4_ * (float)local_a60._0_4_;
                    auVar134._4_4_ = auVar129._4_4_ * (float)local_a60._4_4_;
                    auVar134._8_4_ = auVar129._8_4_ * fStack_a58;
                    auVar134._12_4_ = auVar129._12_4_ * fStack_a54;
                    auVar100._0_4_ = local_a00._0_4_ + auVar128._0_4_ * auVar134._0_4_;
                    auVar100._4_4_ = local_a00._4_4_ + auVar128._4_4_ * auVar134._4_4_;
                    auVar100._8_4_ = local_a00._8_4_ + auVar128._8_4_ * auVar134._8_4_;
                    auVar100._12_4_ = local_a00._12_4_ + auVar128._12_4_ * auVar134._12_4_;
                    auVar129 = vshufps_avx(auVar134,auVar134,0xc9);
                    auVar94 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xc9);
                    auVar135._0_4_ = auVar94._0_4_ * auVar134._0_4_;
                    auVar135._4_4_ = auVar94._4_4_ * auVar134._4_4_;
                    auVar135._8_4_ = auVar94._8_4_ * auVar134._8_4_;
                    auVar135._12_4_ = auVar94._12_4_ * auVar134._12_4_;
                    auVar168._0_4_ = local_a00._0_4_ * auVar129._0_4_;
                    auVar168._4_4_ = local_a00._4_4_ * auVar129._4_4_;
                    auVar168._8_4_ = local_a00._8_4_ * auVar129._8_4_;
                    auVar168._12_4_ = local_a00._12_4_ * auVar129._12_4_;
                    auVar161 = vsubps_avx(auVar168,auVar135);
                    auVar129 = vshufps_avx(auVar161,auVar161,0xc9);
                    auVar94 = vshufps_avx(auVar100,auVar100,0xc9);
                    auVar169._0_4_ = auVar94._0_4_ * auVar129._0_4_;
                    auVar169._4_4_ = auVar94._4_4_ * auVar129._4_4_;
                    auVar169._8_4_ = auVar94._8_4_ * auVar129._8_4_;
                    auVar169._12_4_ = auVar94._12_4_ * auVar129._12_4_;
                    auVar129 = vshufps_avx(auVar161,auVar161,0xd2);
                    auVar101._0_4_ = auVar100._0_4_ * auVar129._0_4_;
                    auVar101._4_4_ = auVar100._4_4_ * auVar129._4_4_;
                    auVar101._8_4_ = auVar100._8_4_ * auVar129._8_4_;
                    auVar101._12_4_ = auVar100._12_4_ * auVar129._12_4_;
                    auVar129 = vsubps_avx(auVar169,auVar101);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      (ray->super_RayK<1>).tfar = local_ac0;
                      auVar94 = vshufps_avx(auVar129,auVar129,0xe9);
                      uVar2 = vmovlps_avx(auVar94);
                      *(undefined8 *)&(ray->Ng).field_0 = uVar2;
                      (ray->Ng).field_0.field_0.z = auVar129._0_4_;
                      ray->u = local_aa0;
                      ray->v = 0.0;
                      ray->primID = uVar82;
                      ray->geomID = (uint)local_ac8;
                      ray->instID[0] = context->user->instID[0];
                      ray->instPrimID[0] = context->user->instPrimID[0];
                    }
                    else {
                      auVar94 = vshufps_avx(auVar129,auVar129,0xe9);
                      local_920 = vmovlps_avx(auVar94);
                      local_918 = auVar129._0_4_;
                      local_914 = local_aa0;
                      local_910 = 0;
                      local_90c = uVar82;
                      local_908 = (uint)local_ac8;
                      local_904 = context->user->instID[0];
                      local_900 = context->user->instPrimID[0];
                      (ray->super_RayK<1>).tfar = local_ac0;
                      local_acc = -1;
                      local_a30.valid = &local_acc;
                      local_a30.geometryUserPtr = pGVar7->userPtr;
                      local_a30.context = context->user;
                      local_a30.ray = (RTCRayN *)ray;
                      local_a30.hit = (RTCHitN *)&local_920;
                      local_a30.N = 1;
                      fStack_a9c = 0.0;
                      fStack_a98 = 0.0;
                      fStack_a94 = 0.0;
                      fStack_abc = 0.0;
                      fStack_ab8 = 0.0;
                      fStack_ab4 = 0.0;
                      local_a80 = fVar214;
                      if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00eebb43:
                        p_Var8 = context->args->filter;
                        if (p_Var8 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                            auVar319 = ZEXT1664(auVar319._0_16_);
                            auVar346 = ZEXT1664(auVar346._0_16_);
                            (*p_Var8)(&local_a30);
                            auVar331 = ZEXT1664(CONCAT412(fStack_ab4,
                                                          CONCAT48(fStack_ab8,
                                                                   CONCAT44(fStack_abc,local_ac0))))
                            ;
                            auVar326 = ZEXT1664(CONCAT412(fStack_a94,
                                                          CONCAT48(fStack_a98,
                                                                   CONCAT44(fStack_a9c,local_aa0))))
                            ;
                            auVar230 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          if (*local_a30.valid == 0) goto LAB_00eebbf6;
                        }
                        (((Vec3f *)((long)local_a30.ray + 0x30))->field_0).components[0] =
                             *(float *)local_a30.hit;
                        (((Vec3f *)((long)local_a30.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_a30.hit + 4);
                        (((Vec3f *)((long)local_a30.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_a30.hit + 8);
                        *(float *)((long)local_a30.ray + 0x3c) = *(float *)(local_a30.hit + 0xc);
                        *(float *)((long)local_a30.ray + 0x40) = *(float *)(local_a30.hit + 0x10);
                        *(float *)((long)local_a30.ray + 0x44) = *(float *)(local_a30.hit + 0x14);
                        *(float *)((long)local_a30.ray + 0x48) = *(float *)(local_a30.hit + 0x18);
                        *(float *)((long)local_a30.ray + 0x4c) = *(float *)(local_a30.hit + 0x1c);
                        *(float *)((long)local_a30.ray + 0x50) = *(float *)(local_a30.hit + 0x20);
                      }
                      else {
                        auVar319 = ZEXT1664(local_a00._0_16_);
                        auVar346 = ZEXT1664(auVar346._0_16_);
                        (*pGVar7->intersectionFilterN)(&local_a30);
                        auVar331 = ZEXT1664(CONCAT412(fStack_ab4,
                                                      CONCAT48(fStack_ab8,
                                                               CONCAT44(fStack_abc,local_ac0))));
                        auVar326 = ZEXT1664(CONCAT412(fStack_a94,
                                                      CONCAT48(fStack_a98,
                                                               CONCAT44(fStack_a9c,local_aa0))));
                        auVar230 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        if (*local_a30.valid != 0) goto LAB_00eebb43;
LAB_00eebbf6:
                        (ray->super_RayK<1>).tfar = local_a80;
                      }
                    }
                  }
                }
              }
              auVar103 = local_620;
              bVar86 = lVar80 != 0;
              lVar80 = lVar80 + -1;
            } while ((!bVar66) && (bVar86));
            fVar214 = (ray->super_RayK<1>).tfar;
            auVar109._4_4_ = fVar214;
            auVar109._0_4_ = fVar214;
            auVar109._8_4_ = fVar214;
            auVar109._12_4_ = fVar214;
            auVar109._16_4_ = fVar214;
            auVar109._20_4_ = fVar214;
            auVar109._24_4_ = fVar214;
            auVar109._28_4_ = fVar214;
            auVar104 = vcmpps_avx(_local_7a0,auVar109,2);
            local_620 = vandps_avx(auVar104,local_620);
            auVar103 = auVar103 & auVar104;
            uVar83 = local_660._0_8_;
          } while ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar103 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar103 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar103 >> 0x7f,0) != '\0') ||
                     (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar103 >> 0xbf,0) != '\0') ||
                   (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar103[0x1f] < '\0');
        }
        auVar103 = vandps_avx(local_580,local_560);
        auVar104 = vandps_avx(_local_7e0,local_7c0);
        auVar250 = ZEXT3264(_local_820);
        auVar175._0_4_ = local_820._0_4_ + local_440._0_4_;
        auVar175._4_4_ = local_820._4_4_ + local_440._4_4_;
        auVar175._8_4_ = local_820._8_4_ + local_440._8_4_;
        auVar175._12_4_ = local_820._12_4_ + local_440._12_4_;
        auVar175._16_4_ = local_820._16_4_ + local_440._16_4_;
        auVar175._20_4_ = local_820._20_4_ + local_440._20_4_;
        auVar175._24_4_ = local_820._24_4_ + local_440._24_4_;
        auVar175._28_4_ = local_820._28_4_ + local_440._28_4_;
        fVar214 = (ray->super_RayK<1>).tfar;
        auVar207._4_4_ = fVar214;
        auVar207._0_4_ = fVar214;
        auVar207._8_4_ = fVar214;
        auVar207._12_4_ = fVar214;
        auVar207._16_4_ = fVar214;
        auVar207._20_4_ = fVar214;
        auVar207._24_4_ = fVar214;
        auVar207._28_4_ = fVar214;
        auVar19 = vcmpps_avx(auVar175,auVar207,2);
        auVar103 = vandps_avx(auVar19,auVar103);
        auVar228._0_4_ = local_820._0_4_ + local_480._0_4_;
        auVar228._4_4_ = local_820._4_4_ + local_480._4_4_;
        auVar228._8_4_ = local_820._8_4_ + local_480._8_4_;
        auVar228._12_4_ = local_820._12_4_ + local_480._12_4_;
        auVar228._16_4_ = local_820._16_4_ + local_480._16_4_;
        auVar228._20_4_ = local_820._20_4_ + local_480._20_4_;
        auVar228._24_4_ = local_820._24_4_ + local_480._24_4_;
        auVar228._28_4_ = local_820._28_4_ + local_480._28_4_;
        auVar230 = ZEXT3264(auVar228);
        auVar19 = vcmpps_avx(auVar228,auVar207,2);
        auVar104 = vandps_avx(auVar19,auVar104);
        auVar104 = vorps_avx(auVar103,auVar104);
        if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar104 >> 0x7f,0) != '\0') ||
              (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar104 >> 0xbf,0) != '\0') ||
            (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar104[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar81 * 0x60) = auVar104;
          auVar103 = vblendvps_avx(_local_480,local_440,auVar103);
          *(undefined1 (*) [32])(auStack_160 + uVar81 * 0x60) = auVar103;
          auVar284 = ZEXT1664(local_930);
          uVar2 = vmovlps_avx(local_930);
          *(undefined8 *)(afStack_140 + uVar81 * 0x18) = uVar2;
          auStack_138[uVar81 * 0x18] = (int)uVar83 + 1;
          uVar81 = (ulong)((int)uVar81 + 1);
          goto LAB_00eea467;
        }
      }
      auVar284 = ZEXT1664(local_930);
    }
LAB_00eea467:
    fVar214 = (ray->super_RayK<1>).tfar;
    auVar105._4_4_ = fVar214;
    auVar105._0_4_ = fVar214;
    auVar105._8_4_ = fVar214;
    auVar105._12_4_ = fVar214;
    auVar105._16_4_ = fVar214;
    auVar105._20_4_ = fVar214;
    auVar105._24_4_ = fVar214;
    auVar105._28_4_ = fVar214;
    do {
      if ((int)uVar81 == 0) {
        fVar214 = (ray->super_RayK<1>).tfar;
        auVar102._4_4_ = fVar214;
        auVar102._0_4_ = fVar214;
        auVar102._8_4_ = fVar214;
        auVar102._12_4_ = fVar214;
        auVar129 = vcmpps_avx(local_490,auVar102,2);
        uVar82 = vmovmskps_avx(auVar129);
        uVar82 = (uint)local_7e8 & uVar82;
        if (uVar82 == 0) {
          return;
        }
        goto LAB_00ee93bb;
      }
      uVar85 = (ulong)((int)uVar81 - 1);
      lVar80 = uVar85 * 0x60;
      auVar103 = *(undefined1 (*) [32])(auStack_160 + lVar80);
      auVar141._0_4_ = auVar250._0_4_ + auVar103._0_4_;
      auVar141._4_4_ = auVar250._4_4_ + auVar103._4_4_;
      auVar141._8_4_ = auVar250._8_4_ + auVar103._8_4_;
      auVar141._12_4_ = auVar250._12_4_ + auVar103._12_4_;
      auVar141._16_4_ = auVar250._16_4_ + auVar103._16_4_;
      auVar141._20_4_ = auVar250._20_4_ + auVar103._20_4_;
      auVar141._24_4_ = auVar250._24_4_ + auVar103._24_4_;
      auVar141._28_4_ = auVar250._28_4_ + auVar103._28_4_;
      auVar19 = vcmpps_avx(auVar141,auVar105,2);
      auVar104 = vandps_avx(auVar19,*(undefined1 (*) [32])(auStack_180 + lVar80));
      local_440 = auVar104;
      auVar19 = *(undefined1 (*) [32])(auStack_180 + lVar80) & auVar19;
      bVar71 = (auVar19 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar72 = (auVar19 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar70 = (auVar19 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar69 = SUB321(auVar19 >> 0x7f,0) == '\0';
      bVar68 = (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar67 = SUB321(auVar19 >> 0xbf,0) == '\0';
      bVar86 = (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar66 = -1 < auVar19[0x1f];
      if (((((((!bVar71 || !bVar72) || !bVar70) || !bVar69) || !bVar68) || !bVar67) || !bVar86) ||
          !bVar66) {
        auVar187._8_4_ = 0x7f800000;
        auVar187._0_8_ = 0x7f8000007f800000;
        auVar187._12_4_ = 0x7f800000;
        auVar187._16_4_ = 0x7f800000;
        auVar187._20_4_ = 0x7f800000;
        auVar187._24_4_ = 0x7f800000;
        auVar187._28_4_ = 0x7f800000;
        auVar103 = vblendvps_avx(auVar187,auVar103,auVar104);
        auVar19 = vshufps_avx(auVar103,auVar103,0xb1);
        auVar19 = vminps_avx(auVar103,auVar19);
        auVar20 = vshufpd_avx(auVar19,auVar19,5);
        auVar19 = vminps_avx(auVar19,auVar20);
        auVar20 = vperm2f128_avx(auVar19,auVar19,1);
        auVar19 = vminps_avx(auVar19,auVar20);
        auVar103 = vcmpps_avx(auVar103,auVar19,0);
        auVar19 = auVar104 & auVar103;
        if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar19 >> 0x7f,0) != '\0') ||
              (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar19 >> 0xbf,0) != '\0') ||
            (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar19[0x1f] < '\0') {
          auVar104 = vandps_avx(auVar103,auVar104);
        }
        fVar214 = afStack_140[uVar85 * 0x18 + 1];
        uVar83 = (ulong)auStack_138[uVar85 * 0x18];
        uVar84 = vmovmskps_avx(auVar104);
        uVar9 = 0;
        if (uVar84 != 0) {
          for (; (uVar84 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        fVar176 = afStack_140[uVar85 * 0x18];
        *(undefined4 *)(local_440 + (ulong)uVar9 * 4) = 0;
        if ((((((((local_440 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_440 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_440 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_440 >> 0x7f,0) != '\0') ||
              (local_440 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_440 >> 0xbf,0) != '\0') ||
            (local_440 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_440[0x1f] < '\0') {
          uVar85 = uVar81;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar80) = local_440;
        auVar129 = vshufps_avx(ZEXT416((uint)(fVar214 - fVar176)),ZEXT416((uint)(fVar214 - fVar176))
                               ,0);
        local_480._4_4_ = fVar176 + auVar129._4_4_ * 0.14285715;
        local_480._0_4_ = fVar176 + auVar129._0_4_ * 0.0;
        fStack_478 = fVar176 + auVar129._8_4_ * 0.2857143;
        fStack_474 = fVar176 + auVar129._12_4_ * 0.42857146;
        fStack_470 = fVar176 + auVar129._0_4_ * 0.5714286;
        fStack_46c = fVar176 + auVar129._4_4_ * 0.71428573;
        fStack_468 = fVar176 + auVar129._8_4_ * 0.8571429;
        fStack_464 = fVar176 + auVar129._12_4_;
        auVar284 = ZEXT864(*(ulong *)(local_480 + (ulong)uVar9 * 4));
      }
      uVar81 = uVar85;
    } while (((((((bVar71 && bVar72) && bVar70) && bVar69) && bVar68) && bVar67) && bVar86) &&
             bVar66);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }